

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx512::CurveNvIntersectorK<8,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  int iVar9;
  undefined4 uVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  code *pcVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined8 uVar29;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  long lVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  byte bVar101;
  byte bVar102;
  ulong uVar103;
  uint uVar104;
  uint uVar105;
  ulong uVar106;
  ulong uVar107;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar113;
  undefined1 auVar121 [16];
  long lVar108;
  uint uVar109;
  ulong uVar110;
  byte bVar111;
  float fVar112;
  float fVar165;
  float fVar166;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar120 [16];
  float fVar167;
  float fVar169;
  float fVar170;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar168;
  float fVar171;
  float fVar172;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  float fVar173;
  undefined4 uVar174;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined8 uVar175;
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  undefined1 auVar188 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar193;
  float fVar194;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar200;
  undefined1 auVar199 [64];
  float fVar201;
  float fVar213;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar212;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [16];
  uint uVar224;
  undefined1 auVar225 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [16];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  vint<16> mask;
  RTCFilterFunctionNArguments local_940;
  long local_910;
  undefined1 (*local_908) [32];
  undefined1 local_900 [32];
  undefined1 local_8d0 [8];
  undefined8 uStack_8c8;
  undefined1 local_8c0 [16];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  float local_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined4 local_7f0;
  undefined4 uStack_7ec;
  undefined8 uStack_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  uint local_7c0;
  uint uStack_7bc;
  uint uStack_7b8;
  uint uStack_7b4;
  uint uStack_7b0;
  uint uStack_7ac;
  uint uStack_7a8;
  uint uStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined4 local_6c0;
  int local_6bc;
  undefined1 local_6b0 [16];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  byte local_670;
  float local_660 [4];
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [64];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined8 local_550;
  undefined8 uStack_548;
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar8 = prim[1];
  uVar107 = (ulong)(byte)PVar8;
  lVar82 = uVar107 * 0x19;
  fVar201 = *(float *)(prim + lVar82 + 0x12);
  auVar28 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar28 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar117 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar118 = vinsertps_avx(auVar117,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar119 = vsubps_avx(auVar28,*(undefined1 (*) [16])(prim + lVar82 + 6));
  fVar193 = fVar201 * auVar119._0_4_;
  fVar173 = fVar201 * auVar118._0_4_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar107 * 4 + 6);
  auVar127 = vpmovsxbd_avx2(auVar28);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar107 * 5 + 6);
  auVar125 = vpmovsxbd_avx2(auVar117);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)(prim + uVar107 * 6 + 6);
  auVar137 = vpmovsxbd_avx2(auVar116);
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar107 * 0xb + 6);
  auVar138 = vpmovsxbd_avx2(auVar114);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6);
  auVar134 = vpmovsxbd_avx2(auVar121);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar136 = vcvtdq2ps_avx(auVar134);
  auVar237._8_8_ = 0;
  auVar237._0_8_ = *(ulong *)(prim + (uint)(byte)PVar8 * 0xc + uVar107 + 6);
  auVar126 = vpmovsxbd_avx2(auVar237);
  auVar126 = vcvtdq2ps_avx(auVar126);
  uVar110 = (ulong)(uint)((int)(uVar107 * 9) * 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar110 + 6);
  auVar128 = vpmovsxbd_avx2(auVar6);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar110 + uVar107 + 6);
  auVar129 = vpmovsxbd_avx2(auVar7);
  auVar129 = vcvtdq2ps_avx(auVar129);
  uVar103 = (ulong)(uint)((int)(uVar107 * 5) << 2);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *(ulong *)(prim + uVar103 + 6);
  auVar124 = vpmovsxbd_avx2(auVar115);
  auVar135 = vcvtdq2ps_avx(auVar124);
  auVar229._4_4_ = fVar173;
  auVar229._0_4_ = fVar173;
  auVar229._8_4_ = fVar173;
  auVar229._12_4_ = fVar173;
  auVar229._16_4_ = fVar173;
  auVar229._20_4_ = fVar173;
  auVar229._24_4_ = fVar173;
  auVar229._28_4_ = fVar173;
  auVar231._8_4_ = 1;
  auVar231._0_8_ = 0x100000001;
  auVar231._12_4_ = 1;
  auVar231._16_4_ = 1;
  auVar231._20_4_ = 1;
  auVar231._24_4_ = 1;
  auVar231._28_4_ = 1;
  auVar122 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar131 = ZEXT1632(CONCAT412(fVar201 * auVar118._12_4_,
                                CONCAT48(fVar201 * auVar118._8_4_,
                                         CONCAT44(fVar201 * auVar118._4_4_,fVar173))));
  auVar130 = vpermps_avx2(auVar231,auVar131);
  auVar123 = vpermps_avx512vl(auVar122,auVar131);
  fVar173 = auVar123._0_4_;
  fVar212 = auVar123._4_4_;
  auVar131._4_4_ = fVar212 * auVar137._4_4_;
  auVar131._0_4_ = fVar173 * auVar137._0_4_;
  fVar213 = auVar123._8_4_;
  auVar131._8_4_ = fVar213 * auVar137._8_4_;
  fVar194 = auVar123._12_4_;
  auVar131._12_4_ = fVar194 * auVar137._12_4_;
  fVar200 = auVar123._16_4_;
  auVar131._16_4_ = fVar200 * auVar137._16_4_;
  fVar112 = auVar123._20_4_;
  auVar131._20_4_ = fVar112 * auVar137._20_4_;
  fVar113 = auVar123._24_4_;
  auVar131._24_4_ = fVar113 * auVar137._24_4_;
  auVar131._28_4_ = auVar134._28_4_;
  auVar134._4_4_ = auVar126._4_4_ * fVar212;
  auVar134._0_4_ = auVar126._0_4_ * fVar173;
  auVar134._8_4_ = auVar126._8_4_ * fVar213;
  auVar134._12_4_ = auVar126._12_4_ * fVar194;
  auVar134._16_4_ = auVar126._16_4_ * fVar200;
  auVar134._20_4_ = auVar126._20_4_ * fVar112;
  auVar134._24_4_ = auVar126._24_4_ * fVar113;
  auVar134._28_4_ = auVar124._28_4_;
  auVar124._4_4_ = auVar135._4_4_ * fVar212;
  auVar124._0_4_ = auVar135._0_4_ * fVar173;
  auVar124._8_4_ = auVar135._8_4_ * fVar213;
  auVar124._12_4_ = auVar135._12_4_ * fVar194;
  auVar124._16_4_ = auVar135._16_4_ * fVar200;
  auVar124._20_4_ = auVar135._20_4_ * fVar112;
  auVar124._24_4_ = auVar135._24_4_ * fVar113;
  auVar124._28_4_ = auVar123._28_4_;
  auVar28 = vfmadd231ps_fma(auVar131,auVar130,auVar125);
  auVar117 = vfmadd231ps_fma(auVar134,auVar130,auVar136);
  auVar116 = vfmadd231ps_fma(auVar124,auVar129,auVar130);
  auVar28 = vfmadd231ps_fma(ZEXT1632(auVar28),auVar229,auVar127);
  auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar229,auVar138);
  auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar128,auVar229);
  auVar230._4_4_ = fVar193;
  auVar230._0_4_ = fVar193;
  auVar230._8_4_ = fVar193;
  auVar230._12_4_ = fVar193;
  auVar230._16_4_ = fVar193;
  auVar230._20_4_ = fVar193;
  auVar230._24_4_ = fVar193;
  auVar230._28_4_ = fVar193;
  auVar124 = ZEXT1632(CONCAT412(fVar201 * auVar119._12_4_,
                                CONCAT48(fVar201 * auVar119._8_4_,
                                         CONCAT44(fVar201 * auVar119._4_4_,fVar193))));
  auVar134 = vpermps_avx2(auVar231,auVar124);
  auVar124 = vpermps_avx512vl(auVar122,auVar124);
  fVar201 = auVar124._0_4_;
  fVar173 = auVar124._4_4_;
  auVar130._4_4_ = fVar173 * auVar137._4_4_;
  auVar130._0_4_ = fVar201 * auVar137._0_4_;
  fVar212 = auVar124._8_4_;
  auVar130._8_4_ = fVar212 * auVar137._8_4_;
  fVar213 = auVar124._12_4_;
  auVar130._12_4_ = fVar213 * auVar137._12_4_;
  fVar194 = auVar124._16_4_;
  auVar130._16_4_ = fVar194 * auVar137._16_4_;
  fVar200 = auVar124._20_4_;
  auVar130._20_4_ = fVar200 * auVar137._20_4_;
  fVar112 = auVar124._24_4_;
  auVar130._24_4_ = fVar112 * auVar137._24_4_;
  auVar130._28_4_ = 1;
  auVar122._4_4_ = auVar126._4_4_ * fVar173;
  auVar122._0_4_ = auVar126._0_4_ * fVar201;
  auVar122._8_4_ = auVar126._8_4_ * fVar212;
  auVar122._12_4_ = auVar126._12_4_ * fVar213;
  auVar122._16_4_ = auVar126._16_4_ * fVar194;
  auVar122._20_4_ = auVar126._20_4_ * fVar200;
  auVar122._24_4_ = auVar126._24_4_ * fVar112;
  auVar122._28_4_ = auVar137._28_4_;
  auVar126._4_4_ = auVar135._4_4_ * fVar173;
  auVar126._0_4_ = auVar135._0_4_ * fVar201;
  auVar126._8_4_ = auVar135._8_4_ * fVar212;
  auVar126._12_4_ = auVar135._12_4_ * fVar213;
  auVar126._16_4_ = auVar135._16_4_ * fVar194;
  auVar126._20_4_ = auVar135._20_4_ * fVar200;
  auVar126._24_4_ = auVar135._24_4_ * fVar112;
  auVar126._28_4_ = auVar124._28_4_;
  auVar114 = vfmadd231ps_fma(auVar130,auVar134,auVar125);
  auVar121 = vfmadd231ps_fma(auVar122,auVar134,auVar136);
  auVar237 = vfmadd231ps_fma(auVar126,auVar134,auVar129);
  auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar230,auVar127);
  auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar230,auVar138);
  auVar221._8_4_ = 0x7fffffff;
  auVar221._0_8_ = 0x7fffffff7fffffff;
  auVar221._12_4_ = 0x7fffffff;
  auVar221._16_4_ = 0x7fffffff;
  auVar221._20_4_ = 0x7fffffff;
  auVar221._24_4_ = 0x7fffffff;
  auVar221._28_4_ = 0x7fffffff;
  auVar237 = vfmadd231ps_fma(ZEXT1632(auVar237),auVar230,auVar128);
  auVar127 = vandps_avx(ZEXT1632(auVar28),auVar221);
  auVar218._8_4_ = 0x219392ef;
  auVar218._0_8_ = 0x219392ef219392ef;
  auVar218._12_4_ = 0x219392ef;
  auVar218._16_4_ = 0x219392ef;
  auVar218._20_4_ = 0x219392ef;
  auVar218._24_4_ = 0x219392ef;
  auVar218._28_4_ = 0x219392ef;
  uVar110 = vcmpps_avx512vl(auVar127,auVar218,1);
  bVar14 = (bool)((byte)uVar110 & 1);
  auVar123._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar28._0_4_;
  bVar14 = (bool)((byte)(uVar110 >> 1) & 1);
  auVar123._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar28._4_4_;
  bVar14 = (bool)((byte)(uVar110 >> 2) & 1);
  auVar123._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar28._8_4_;
  bVar14 = (bool)((byte)(uVar110 >> 3) & 1);
  auVar123._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar28._12_4_;
  auVar123._16_4_ = (uint)((byte)(uVar110 >> 4) & 1) * 0x219392ef;
  auVar123._20_4_ = (uint)((byte)(uVar110 >> 5) & 1) * 0x219392ef;
  auVar123._24_4_ = (uint)((byte)(uVar110 >> 6) & 1) * 0x219392ef;
  auVar123._28_4_ = (uint)(byte)(uVar110 >> 7) * 0x219392ef;
  auVar127 = vandps_avx(ZEXT1632(auVar117),auVar221);
  uVar110 = vcmpps_avx512vl(auVar127,auVar218,1);
  bVar14 = (bool)((byte)uVar110 & 1);
  auVar132._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar117._0_4_;
  bVar14 = (bool)((byte)(uVar110 >> 1) & 1);
  auVar132._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar117._4_4_;
  bVar14 = (bool)((byte)(uVar110 >> 2) & 1);
  auVar132._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar117._8_4_;
  bVar14 = (bool)((byte)(uVar110 >> 3) & 1);
  auVar132._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar117._12_4_;
  auVar132._16_4_ = (uint)((byte)(uVar110 >> 4) & 1) * 0x219392ef;
  auVar132._20_4_ = (uint)((byte)(uVar110 >> 5) & 1) * 0x219392ef;
  auVar132._24_4_ = (uint)((byte)(uVar110 >> 6) & 1) * 0x219392ef;
  auVar132._28_4_ = (uint)(byte)(uVar110 >> 7) * 0x219392ef;
  auVar127 = vandps_avx(ZEXT1632(auVar116),auVar221);
  uVar110 = vcmpps_avx512vl(auVar127,auVar218,1);
  bVar14 = (bool)((byte)uVar110 & 1);
  auVar127._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar116._0_4_;
  bVar14 = (bool)((byte)(uVar110 >> 1) & 1);
  auVar127._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar116._4_4_;
  bVar14 = (bool)((byte)(uVar110 >> 2) & 1);
  auVar127._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar116._8_4_;
  bVar14 = (bool)((byte)(uVar110 >> 3) & 1);
  auVar127._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar116._12_4_;
  auVar127._16_4_ = (uint)((byte)(uVar110 >> 4) & 1) * 0x219392ef;
  auVar127._20_4_ = (uint)((byte)(uVar110 >> 5) & 1) * 0x219392ef;
  auVar127._24_4_ = (uint)((byte)(uVar110 >> 6) & 1) * 0x219392ef;
  auVar127._28_4_ = (uint)(byte)(uVar110 >> 7) * 0x219392ef;
  auVar125 = vrcp14ps_avx512vl(auVar123);
  auVar219._8_4_ = 0x3f800000;
  auVar219._0_8_ = &DAT_3f8000003f800000;
  auVar219._12_4_ = 0x3f800000;
  auVar219._16_4_ = 0x3f800000;
  auVar219._20_4_ = 0x3f800000;
  auVar219._24_4_ = 0x3f800000;
  auVar219._28_4_ = 0x3f800000;
  auVar28 = vfnmadd213ps_fma(auVar123,auVar125,auVar219);
  auVar28 = vfmadd132ps_fma(ZEXT1632(auVar28),auVar125,auVar125);
  auVar125 = vrcp14ps_avx512vl(auVar132);
  auVar117 = vfnmadd213ps_fma(auVar132,auVar125,auVar219);
  auVar117 = vfmadd132ps_fma(ZEXT1632(auVar117),auVar125,auVar125);
  auVar125 = vrcp14ps_avx512vl(auVar127);
  auVar116 = vfnmadd213ps_fma(auVar127,auVar125,auVar219);
  auVar116 = vfmadd132ps_fma(ZEXT1632(auVar116),auVar125,auVar125);
  auVar127 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar107 * 7 + 6));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,ZEXT1632(auVar114));
  auVar128._4_4_ = auVar28._4_4_ * auVar127._4_4_;
  auVar128._0_4_ = auVar28._0_4_ * auVar127._0_4_;
  auVar128._8_4_ = auVar28._8_4_ * auVar127._8_4_;
  auVar128._12_4_ = auVar28._12_4_ * auVar127._12_4_;
  auVar128._16_4_ = auVar127._16_4_ * 0.0;
  auVar128._20_4_ = auVar127._20_4_ * 0.0;
  auVar128._24_4_ = auVar127._24_4_ * 0.0;
  auVar128._28_4_ = auVar127._28_4_;
  auVar127 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar107 * 9 + 6));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,ZEXT1632(auVar114));
  auVar126 = vpbroadcastd_avx512vl();
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar8 * 0x10 + 6));
  auVar151._0_4_ = auVar28._0_4_ * auVar127._0_4_;
  auVar151._4_4_ = auVar28._4_4_ * auVar127._4_4_;
  auVar151._8_4_ = auVar28._8_4_ * auVar127._8_4_;
  auVar151._12_4_ = auVar28._12_4_ * auVar127._12_4_;
  auVar151._16_4_ = auVar127._16_4_ * 0.0;
  auVar151._20_4_ = auVar127._20_4_ * 0.0;
  auVar151._24_4_ = auVar127._24_4_ * 0.0;
  auVar151._28_4_ = 0;
  auVar127 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar8 * 0x10 + uVar107 * -2 + 6));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,ZEXT1632(auVar121));
  auVar129._4_4_ = auVar117._4_4_ * auVar127._4_4_;
  auVar129._0_4_ = auVar117._0_4_ * auVar127._0_4_;
  auVar129._8_4_ = auVar117._8_4_ * auVar127._8_4_;
  auVar129._12_4_ = auVar117._12_4_ * auVar127._12_4_;
  auVar129._16_4_ = auVar127._16_4_ * 0.0;
  auVar129._20_4_ = auVar127._20_4_ * 0.0;
  auVar129._24_4_ = auVar127._24_4_ * 0.0;
  auVar129._28_4_ = auVar127._28_4_;
  auVar220 = ZEXT3264(auVar129);
  auVar127 = vcvtdq2ps_avx(auVar125);
  auVar127 = vsubps_avx(auVar127,ZEXT1632(auVar121));
  auVar150._0_4_ = auVar117._0_4_ * auVar127._0_4_;
  auVar150._4_4_ = auVar117._4_4_ * auVar127._4_4_;
  auVar150._8_4_ = auVar117._8_4_ * auVar127._8_4_;
  auVar150._12_4_ = auVar117._12_4_ * auVar127._12_4_;
  auVar150._16_4_ = auVar127._16_4_ * 0.0;
  auVar150._20_4_ = auVar127._20_4_ * 0.0;
  auVar150._24_4_ = auVar127._24_4_ * 0.0;
  auVar150._28_4_ = 0;
  auVar127 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 + uVar107 + 6));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,ZEXT1632(auVar237));
  auVar135._4_4_ = auVar127._4_4_ * auVar116._4_4_;
  auVar135._0_4_ = auVar127._0_4_ * auVar116._0_4_;
  auVar135._8_4_ = auVar127._8_4_ * auVar116._8_4_;
  auVar135._12_4_ = auVar127._12_4_ * auVar116._12_4_;
  auVar135._16_4_ = auVar127._16_4_ * 0.0;
  auVar135._20_4_ = auVar127._20_4_ * 0.0;
  auVar135._24_4_ = auVar127._24_4_ * 0.0;
  auVar135._28_4_ = auVar127._28_4_;
  auVar127 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar107 * 0x17 + 6));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,ZEXT1632(auVar237));
  auVar133._0_4_ = auVar116._0_4_ * auVar127._0_4_;
  auVar133._4_4_ = auVar116._4_4_ * auVar127._4_4_;
  auVar133._8_4_ = auVar116._8_4_ * auVar127._8_4_;
  auVar133._12_4_ = auVar116._12_4_ * auVar127._12_4_;
  auVar133._16_4_ = auVar127._16_4_ * 0.0;
  auVar133._20_4_ = auVar127._20_4_ * 0.0;
  auVar133._24_4_ = auVar127._24_4_ * 0.0;
  auVar133._28_4_ = 0;
  auVar127 = vpminsd_avx2(auVar128,auVar151);
  auVar125 = vpminsd_avx2(auVar129,auVar150);
  auVar127 = vmaxps_avx(auVar127,auVar125);
  auVar125 = vpminsd_avx2(auVar135,auVar133);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar137._4_4_ = uVar3;
  auVar137._0_4_ = uVar3;
  auVar137._8_4_ = uVar3;
  auVar137._12_4_ = uVar3;
  auVar137._16_4_ = uVar3;
  auVar137._20_4_ = uVar3;
  auVar137._24_4_ = uVar3;
  auVar137._28_4_ = uVar3;
  auVar125 = vmaxps_avx512vl(auVar125,auVar137);
  auVar127 = vmaxps_avx(auVar127,auVar125);
  auVar125._8_4_ = 0x3f7ffffa;
  auVar125._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar125._12_4_ = 0x3f7ffffa;
  auVar125._16_4_ = 0x3f7ffffa;
  auVar125._20_4_ = 0x3f7ffffa;
  auVar125._24_4_ = 0x3f7ffffa;
  auVar125._28_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar127,auVar125);
  auVar199 = ZEXT3264(local_320);
  auVar127 = vpmaxsd_avx2(auVar128,auVar151);
  auVar125 = vpmaxsd_avx2(auVar129,auVar150);
  auVar127 = vminps_avx(auVar127,auVar125);
  auVar125 = vpmaxsd_avx2(auVar135,auVar133);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar138._4_4_ = uVar3;
  auVar138._0_4_ = uVar3;
  auVar138._8_4_ = uVar3;
  auVar138._12_4_ = uVar3;
  auVar138._16_4_ = uVar3;
  auVar138._20_4_ = uVar3;
  auVar138._24_4_ = uVar3;
  auVar138._28_4_ = uVar3;
  auVar125 = vminps_avx512vl(auVar125,auVar138);
  auVar127 = vminps_avx(auVar127,auVar125);
  auVar136._8_4_ = 0x3f800003;
  auVar136._0_8_ = 0x3f8000033f800003;
  auVar136._12_4_ = 0x3f800003;
  auVar136._16_4_ = 0x3f800003;
  auVar136._20_4_ = 0x3f800003;
  auVar136._24_4_ = 0x3f800003;
  auVar136._28_4_ = 0x3f800003;
  auVar127 = vmulps_avx512vl(auVar127,auVar136);
  uVar29 = vpcmpgtd_avx512vl(auVar126,_DAT_0205a920);
  uVar175 = vcmpps_avx512vl(local_320,auVar127,2);
  if ((byte)((byte)uVar175 & (byte)uVar29) != 0) {
    uVar110 = (ulong)(byte)((byte)uVar175 & (byte)uVar29);
    local_908 = (undefined1 (*) [32])local_100;
    auVar187 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar187);
    do {
      auVar125 = auVar220._0_32_;
      auVar127 = auVar199._0_32_;
      local_860 = in_ZMM21._0_32_;
      local_840 = in_ZMM20._0_32_;
      lVar30 = 0;
      for (uVar103 = uVar110; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      uVar110 = uVar110 - 1 & uVar110;
      uVar3 = *(undefined4 *)(prim + lVar30 * 4 + 6);
      uVar103 = (ulong)(uint)((int)lVar30 << 6);
      uVar109 = *(uint *)(prim + 2);
      pGVar11 = (context->scene->geometries).items[uVar109].ptr;
      auVar28 = *(undefined1 (*) [16])(prim + uVar103 + lVar82 + 0x16);
      if (uVar110 != 0) {
        uVar106 = uVar110 - 1 & uVar110;
        for (uVar107 = uVar110; (uVar107 & 1) == 0; uVar107 = uVar107 >> 1 | 0x8000000000000000) {
        }
        if (uVar106 != 0) {
          for (; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_8b0 = *(undefined1 (*) [16])(prim + uVar103 + lVar82 + 0x26);
      local_8c0 = *(undefined1 (*) [16])(prim + uVar103 + lVar82 + 0x36);
      _local_8d0 = *(undefined1 (*) [16])(prim + uVar103 + lVar82 + 0x46);
      local_7c0 = (uint)pGVar11;
      uStack_7bc = (uint)((ulong)pGVar11 >> 0x20);
      iVar9 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar117 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c);
      auVar117 = vinsertps_avx(auVar117,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar114 = vsubps_avx512vl(auVar28,auVar117);
      uVar174 = auVar114._0_4_;
      auVar118._4_4_ = uVar174;
      auVar118._0_4_ = uVar174;
      auVar118._8_4_ = uVar174;
      auVar118._12_4_ = uVar174;
      auVar116 = vshufps_avx(auVar114,auVar114,0x55);
      auVar114 = vshufps_avx(auVar114,auVar114,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar201 = pre->ray_space[k].vz.field_0.m128[0];
      fVar173 = pre->ray_space[k].vz.field_0.m128[1];
      fVar212 = pre->ray_space[k].vz.field_0.m128[2];
      fVar213 = pre->ray_space[k].vz.field_0.m128[3];
      auVar223._0_4_ = fVar201 * auVar114._0_4_;
      auVar223._4_4_ = fVar173 * auVar114._4_4_;
      auVar223._8_4_ = fVar212 * auVar114._8_4_;
      auVar223._12_4_ = fVar213 * auVar114._12_4_;
      auVar116 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar5,auVar116);
      auVar121 = vfmadd231ps_fma(auVar116,(undefined1  [16])aVar4,auVar118);
      auVar115 = vshufps_avx512vl(auVar28,auVar28,0xff);
      auVar114 = vsubps_avx(local_8b0,auVar117);
      uVar174 = auVar114._0_4_;
      auVar195._4_4_ = uVar174;
      auVar195._0_4_ = uVar174;
      auVar195._8_4_ = uVar174;
      auVar195._12_4_ = uVar174;
      auVar116 = vshufps_avx(auVar114,auVar114,0x55);
      auVar114 = vshufps_avx(auVar114,auVar114,0xaa);
      auVar120._0_4_ = fVar201 * auVar114._0_4_;
      auVar120._4_4_ = fVar173 * auVar114._4_4_;
      auVar120._8_4_ = fVar212 * auVar114._8_4_;
      auVar120._12_4_ = fVar213 * auVar114._12_4_;
      auVar116 = vfmadd231ps_fma(auVar120,(undefined1  [16])aVar5,auVar116);
      auVar237 = vfmadd231ps_fma(auVar116,(undefined1  [16])aVar4,auVar195);
      auVar114 = vsubps_avx512vl(local_8c0,auVar117);
      uVar174 = auVar114._0_4_;
      auVar196._4_4_ = uVar174;
      auVar196._0_4_ = uVar174;
      auVar196._8_4_ = uVar174;
      auVar196._12_4_ = uVar174;
      auVar116 = vshufps_avx(auVar114,auVar114,0x55);
      auVar114 = vshufps_avx(auVar114,auVar114,0xaa);
      auVar226._0_4_ = fVar201 * auVar114._0_4_;
      auVar226._4_4_ = fVar173 * auVar114._4_4_;
      auVar226._8_4_ = fVar212 * auVar114._8_4_;
      auVar226._12_4_ = fVar213 * auVar114._12_4_;
      auVar116 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar5,auVar116);
      auVar114 = vfmadd231ps_fma(auVar116,(undefined1  [16])aVar4,auVar196);
      auVar116 = vsubps_avx512vl(_local_8d0,auVar117);
      uVar174 = auVar116._0_4_;
      auVar119._4_4_ = uVar174;
      auVar119._0_4_ = uVar174;
      auVar119._8_4_ = uVar174;
      auVar119._12_4_ = uVar174;
      auVar117 = vshufps_avx(auVar116,auVar116,0x55);
      auVar116 = vshufps_avx(auVar116,auVar116,0xaa);
      auVar227._0_4_ = fVar201 * auVar116._0_4_;
      auVar227._4_4_ = fVar173 * auVar116._4_4_;
      auVar227._8_4_ = fVar212 * auVar116._8_4_;
      auVar227._12_4_ = fVar213 * auVar116._12_4_;
      auVar117 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar5,auVar117);
      auVar6 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar4,auVar119);
      lVar30 = (long)iVar9 * 0x44;
      auVar137 = *(undefined1 (*) [32])(bspline_basis0 + lVar30);
      uVar174 = auVar121._0_4_;
      local_760._4_4_ = uVar174;
      local_760._0_4_ = uVar174;
      local_760._8_4_ = uVar174;
      local_760._12_4_ = uVar174;
      local_760._16_4_ = uVar174;
      local_760._20_4_ = uVar174;
      local_760._24_4_ = uVar174;
      local_760._28_4_ = uVar174;
      auVar188._8_4_ = 1;
      auVar188._0_8_ = 0x100000001;
      auVar188._12_4_ = 1;
      auVar188._16_4_ = 1;
      auVar188._20_4_ = 1;
      auVar188._24_4_ = 1;
      auVar188._28_4_ = 1;
      local_780 = vpermps_avx512vl(auVar188,ZEXT1632(auVar121));
      auVar138 = *(undefined1 (*) [32])(bspline_basis0 + lVar30 + 0x484);
      local_900 = vbroadcastss_avx512vl(auVar237);
      local_580 = vpermps_avx2(auVar188,ZEXT1632(auVar237));
      auVar136 = *(undefined1 (*) [32])(bspline_basis0 + lVar30 + 0x908);
      local_340 = vbroadcastss_avx512vl(auVar114);
      local_360 = vpermps_avx512vl(auVar188,ZEXT1632(auVar114));
      auVar126 = *(undefined1 (*) [32])(bspline_basis0 + lVar30 + 0xd8c);
      local_880 = vbroadcastss_avx512vl(auVar6);
      auVar187 = ZEXT3264(local_880);
      local_8a0 = vpermps_avx512vl(auVar188,ZEXT1632(auVar6));
      auVar239 = ZEXT3264(local_8a0);
      auVar128 = vmulps_avx512vl(local_880,auVar126);
      auVar129 = vmulps_avx512vl(local_8a0,auVar126);
      auVar128 = vfmadd231ps_avx512vl(auVar128,auVar136,local_340);
      auVar129 = vfmadd231ps_avx512vl(auVar129,auVar136,local_360);
      auVar128 = vfmadd231ps_avx512vl(auVar128,auVar138,local_900);
      auVar117 = vfmadd231ps_fma(auVar129,auVar138,local_580);
      auVar124 = vfmadd231ps_avx512vl(auVar128,auVar137,local_760);
      auVar130 = vfmadd231ps_avx512vl(ZEXT1632(auVar117),auVar137,local_780);
      auVar128 = *(undefined1 (*) [32])(bspline_basis1 + lVar30);
      auVar129 = *(undefined1 (*) [32])(bspline_basis1 + lVar30 + 0x484);
      auVar135 = *(undefined1 (*) [32])(bspline_basis1 + lVar30 + 0x908);
      auVar134 = *(undefined1 (*) [32])(bspline_basis1 + lVar30 + 0xd8c);
      auVar131 = vmulps_avx512vl(local_880,auVar134);
      auVar122 = vmulps_avx512vl(local_8a0,auVar134);
      auVar131 = vfmadd231ps_avx512vl(auVar131,auVar135,local_340);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar135,local_360);
      auVar131 = vfmadd231ps_avx512vl(auVar131,auVar129,local_900);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar129,local_580);
      auVar7 = vfmadd231ps_fma(auVar131,auVar128,local_760);
      auVar131 = vfmadd231ps_avx512vl(auVar122,auVar128,local_780);
      local_740 = vsubps_avx512vl(ZEXT1632(auVar7),auVar124);
      local_7a0 = vsubps_avx(auVar131,auVar130);
      auVar122 = vmulps_avx512vl(auVar130,local_740);
      auVar123 = vmulps_avx512vl(auVar124,local_7a0);
      auVar122 = vsubps_avx512vl(auVar122,auVar123);
      auVar117 = vshufps_avx(local_8b0,local_8b0,0xff);
      uVar175 = auVar115._0_8_;
      local_380._8_8_ = uVar175;
      local_380._0_8_ = uVar175;
      local_380._16_8_ = uVar175;
      local_380._24_8_ = uVar175;
      local_3a0 = vbroadcastsd_avx512vl(auVar117);
      auVar117 = vshufps_avx512vl(local_8c0,local_8c0,0xff);
      local_3c0 = vbroadcastsd_avx512vl(auVar117);
      auVar117 = vshufps_avx512vl(_local_8d0,_local_8d0,0xff);
      uVar175 = auVar117._0_8_;
      register0x00001248 = uVar175;
      local_3e0 = uVar175;
      register0x00001250 = uVar175;
      register0x00001258 = uVar175;
      auVar123 = vmulps_avx512vl(_local_3e0,auVar126);
      auVar123 = vfmadd231ps_avx512vl(auVar123,auVar136,local_3c0);
      auVar123 = vfmadd231ps_avx512vl(auVar123,auVar138,local_3a0);
      auVar123 = vfmadd231ps_avx512vl(auVar123,auVar137,local_380);
      auVar132 = vmulps_avx512vl(_local_3e0,auVar134);
      auVar132 = vfmadd231ps_avx512vl(auVar132,auVar135,local_3c0);
      auVar132 = vfmadd231ps_avx512vl(auVar132,auVar129,local_3a0);
      auVar115 = vfmadd231ps_fma(auVar132,auVar128,local_380);
      auVar132 = vmulps_avx512vl(local_7a0,local_7a0);
      auVar132 = vfmadd231ps_avx512vl(auVar132,local_740,local_740);
      auVar133 = vmaxps_avx512vl(auVar123,ZEXT1632(auVar115));
      auVar133 = vmulps_avx512vl(auVar133,auVar133);
      auVar132 = vmulps_avx512vl(auVar133,auVar132);
      auVar122 = vmulps_avx512vl(auVar122,auVar122);
      uVar175 = vcmpps_avx512vl(auVar122,auVar132,2);
      auVar117 = vblendps_avx(auVar121,auVar28,8);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar116 = vandps_avx512vl(auVar117,auVar118);
      auVar117 = vblendps_avx(auVar237,local_8b0,8);
      auVar117 = vandps_avx512vl(auVar117,auVar118);
      auVar116 = vmaxps_avx(auVar116,auVar117);
      auVar117 = vblendps_avx(auVar114,local_8c0,8);
      auVar119 = vandps_avx512vl(auVar117,auVar118);
      auVar117 = vblendps_avx(auVar6,_local_8d0,8);
      auVar117 = vandps_avx512vl(auVar117,auVar118);
      auVar117 = vmaxps_avx(auVar119,auVar117);
      auVar117 = vmaxps_avx(auVar116,auVar117);
      auVar116 = vmovshdup_avx(auVar117);
      auVar116 = vmaxss_avx(auVar116,auVar117);
      auVar117 = vshufpd_avx(auVar117,auVar117,1);
      auVar117 = vmaxss_avx(auVar117,auVar116);
      auVar116 = vcvtsi2ss_avx512f(_local_8d0,iVar9);
      local_540._0_16_ = auVar116;
      auVar228._0_4_ = auVar116._0_4_;
      auVar228._4_4_ = auVar228._0_4_;
      auVar228._8_4_ = auVar228._0_4_;
      auVar228._12_4_ = auVar228._0_4_;
      auVar228._16_4_ = auVar228._0_4_;
      auVar228._20_4_ = auVar228._0_4_;
      auVar228._24_4_ = auVar228._0_4_;
      auVar228._28_4_ = auVar228._0_4_;
      uVar29 = vcmpps_avx512vl(auVar228,_DAT_02020f40,0xe);
      bVar111 = (byte)uVar175 & (byte)uVar29;
      auVar117 = vmulss_avx512f(auVar117,ZEXT416(0x35000000));
      auVar197._8_4_ = 2;
      auVar197._0_8_ = 0x200000002;
      auVar197._12_4_ = 2;
      auVar197._16_4_ = 2;
      auVar197._20_4_ = 2;
      auVar197._24_4_ = 2;
      auVar197._28_4_ = 2;
      local_400 = vpermps_avx512vl(auVar197,ZEXT1632(auVar121));
      local_420 = vpermps_avx512vl(auVar197,ZEXT1632(auVar237));
      local_440 = vpermps_avx512vl(auVar197,ZEXT1632(auVar114));
      local_460 = vpermps_avx2(auVar197,ZEXT1632(auVar6));
      uVar224 = *(uint *)(ray + k * 4 + 0xc0);
      auVar116 = local_740._0_16_;
      if (bVar111 == 0) {
        auVar116 = vxorps_avx512vl(auVar116,auVar116);
        auVar238 = ZEXT1664(auVar116);
        auVar220 = ZEXT3264(auVar125);
        in_ZMM20 = ZEXT3264(local_840);
        auVar199 = ZEXT3264(auVar127);
        in_ZMM21 = ZEXT3264(local_860);
        auVar236 = ZEXT3264(local_760);
        auVar235 = ZEXT3264(local_780);
        auVar234 = ZEXT3264(local_900);
      }
      else {
        _local_7e0 = ZEXT416(uVar224);
        auVar134 = vmulps_avx512vl(local_460,auVar134);
        auVar135 = vfmadd213ps_avx512vl(auVar135,local_440,auVar134);
        auVar129 = vfmadd213ps_avx512vl(auVar129,local_420,auVar135);
        auVar129 = vfmadd213ps_avx512vl(auVar128,local_400,auVar129);
        auVar126 = vmulps_avx512vl(local_460,auVar126);
        auVar136 = vfmadd213ps_avx512vl(auVar136,local_440,auVar126);
        auVar135 = vfmadd213ps_avx512vl(auVar138,local_420,auVar136);
        auVar138 = *(undefined1 (*) [32])(bspline_basis0 + lVar30 + 0x1210);
        auVar136 = *(undefined1 (*) [32])(bspline_basis0 + lVar30 + 0x1694);
        auVar126 = *(undefined1 (*) [32])(bspline_basis0 + lVar30 + 0x1b18);
        auVar128 = *(undefined1 (*) [32])(bspline_basis0 + lVar30 + 0x1f9c);
        auVar135 = vfmadd213ps_avx512vl(auVar137,local_400,auVar135);
        auVar137 = vmulps_avx512vl(local_880,auVar128);
        auVar134 = vmulps_avx512vl(local_8a0,auVar128);
        auVar128 = vmulps_avx512vl(local_460,auVar128);
        auVar137 = vfmadd231ps_avx512vl(auVar137,auVar126,local_340);
        auVar134 = vfmadd231ps_avx512vl(auVar134,auVar126,local_360);
        auVar126 = vfmadd231ps_avx512vl(auVar128,local_440,auVar126);
        auVar137 = vfmadd231ps_avx512vl(auVar137,auVar136,local_900);
        auVar114 = vfmadd231ps_fma(auVar134,auVar136,local_580);
        auVar128 = vfmadd231ps_avx512vl(auVar126,local_420,auVar136);
        auVar134 = vfmadd231ps_avx512vl(auVar137,auVar138,local_760);
        auVar235 = ZEXT3264(local_780);
        auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar114),auVar138,local_780);
        auVar137 = *(undefined1 (*) [32])(bspline_basis1 + lVar30 + 0x1210);
        auVar136 = *(undefined1 (*) [32])(bspline_basis1 + lVar30 + 0x1b18);
        auVar126 = *(undefined1 (*) [32])(bspline_basis1 + lVar30 + 0x1f9c);
        auVar128 = vfmadd231ps_avx512vl(auVar128,local_400,auVar138);
        auVar138 = vmulps_avx512vl(local_880,auVar126);
        auVar132 = vmulps_avx512vl(local_8a0,auVar126);
        auVar126 = vmulps_avx512vl(local_460,auVar126);
        auVar133 = vfmadd231ps_avx512vl(auVar138,auVar136,local_340);
        auVar132 = vfmadd231ps_avx512vl(auVar132,auVar136,local_360);
        auVar136 = vfmadd231ps_avx512vl(auVar126,local_440,auVar136);
        auVar138 = *(undefined1 (*) [32])(bspline_basis1 + lVar30 + 0x1694);
        auVar126 = vfmadd231ps_avx512vl(auVar133,auVar138,local_900);
        auVar114 = vfmadd231ps_fma(auVar132,auVar138,local_580);
        auVar138 = vfmadd231ps_avx512vl(auVar136,local_420,auVar138);
        auVar136 = vfmadd231ps_avx512vl(auVar126,auVar137,local_760);
        auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar114),auVar137,local_780);
        auVar132 = vfmadd231ps_avx512vl(auVar138,local_400,auVar137);
        auVar232._8_4_ = 0x7fffffff;
        auVar232._0_8_ = 0x7fffffff7fffffff;
        auVar232._12_4_ = 0x7fffffff;
        auVar232._16_4_ = 0x7fffffff;
        auVar232._20_4_ = 0x7fffffff;
        auVar232._24_4_ = 0x7fffffff;
        auVar232._28_4_ = 0x7fffffff;
        auVar137 = vandps_avx(auVar134,auVar232);
        auVar138 = vandps_avx(auVar122,auVar232);
        auVar138 = vmaxps_avx(auVar137,auVar138);
        auVar137 = vandps_avx(auVar128,auVar232);
        auVar137 = vmaxps_avx(auVar138,auVar137);
        auVar128 = vbroadcastss_avx512vl(auVar117);
        uVar103 = vcmpps_avx512vl(auVar137,auVar128,1);
        bVar14 = (bool)((byte)uVar103 & 1);
        auVar139._0_4_ = (float)((uint)bVar14 * local_740._0_4_ | (uint)!bVar14 * auVar134._0_4_);
        bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
        auVar139._4_4_ = (float)((uint)bVar14 * local_740._4_4_ | (uint)!bVar14 * auVar134._4_4_);
        bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
        auVar139._8_4_ = (float)((uint)bVar14 * local_740._8_4_ | (uint)!bVar14 * auVar134._8_4_);
        bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
        auVar139._12_4_ = (float)((uint)bVar14 * local_740._12_4_ | (uint)!bVar14 * auVar134._12_4_)
        ;
        bVar14 = (bool)((byte)(uVar103 >> 4) & 1);
        auVar139._16_4_ = (float)((uint)bVar14 * local_740._16_4_ | (uint)!bVar14 * auVar134._16_4_)
        ;
        bVar14 = (bool)((byte)(uVar103 >> 5) & 1);
        auVar139._20_4_ = (float)((uint)bVar14 * local_740._20_4_ | (uint)!bVar14 * auVar134._20_4_)
        ;
        bVar14 = (bool)((byte)(uVar103 >> 6) & 1);
        auVar139._24_4_ = (float)((uint)bVar14 * local_740._24_4_ | (uint)!bVar14 * auVar134._24_4_)
        ;
        bVar14 = SUB81(uVar103 >> 7,0);
        auVar139._28_4_ = (uint)bVar14 * local_740._28_4_ | (uint)!bVar14 * auVar134._28_4_;
        bVar14 = (bool)((byte)uVar103 & 1);
        auVar140._0_4_ = (float)((uint)bVar14 * local_7a0._0_4_ | (uint)!bVar14 * auVar122._0_4_);
        bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
        auVar140._4_4_ = (float)((uint)bVar14 * local_7a0._4_4_ | (uint)!bVar14 * auVar122._4_4_);
        bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
        auVar140._8_4_ = (float)((uint)bVar14 * local_7a0._8_4_ | (uint)!bVar14 * auVar122._8_4_);
        bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
        auVar140._12_4_ = (float)((uint)bVar14 * local_7a0._12_4_ | (uint)!bVar14 * auVar122._12_4_)
        ;
        bVar14 = (bool)((byte)(uVar103 >> 4) & 1);
        auVar140._16_4_ = (float)((uint)bVar14 * local_7a0._16_4_ | (uint)!bVar14 * auVar122._16_4_)
        ;
        bVar14 = (bool)((byte)(uVar103 >> 5) & 1);
        auVar140._20_4_ = (float)((uint)bVar14 * local_7a0._20_4_ | (uint)!bVar14 * auVar122._20_4_)
        ;
        bVar14 = (bool)((byte)(uVar103 >> 6) & 1);
        auVar140._24_4_ = (float)((uint)bVar14 * local_7a0._24_4_ | (uint)!bVar14 * auVar122._24_4_)
        ;
        bVar14 = SUB81(uVar103 >> 7,0);
        auVar140._28_4_ = (uint)bVar14 * local_7a0._28_4_ | (uint)!bVar14 * auVar122._28_4_;
        auVar137 = vandps_avx(auVar232,auVar136);
        auVar138 = vandps_avx(auVar126,auVar232);
        auVar138 = vmaxps_avx(auVar137,auVar138);
        auVar137 = vandps_avx(auVar132,auVar232);
        auVar137 = vmaxps_avx(auVar138,auVar137);
        uVar103 = vcmpps_avx512vl(auVar137,auVar128,1);
        bVar14 = (bool)((byte)uVar103 & 1);
        auVar141._0_4_ = (float)((uint)bVar14 * local_740._0_4_ | (uint)!bVar14 * auVar136._0_4_);
        bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
        auVar141._4_4_ = (float)((uint)bVar14 * local_740._4_4_ | (uint)!bVar14 * auVar136._4_4_);
        bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
        auVar141._8_4_ = (float)((uint)bVar14 * local_740._8_4_ | (uint)!bVar14 * auVar136._8_4_);
        bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
        auVar141._12_4_ = (float)((uint)bVar14 * local_740._12_4_ | (uint)!bVar14 * auVar136._12_4_)
        ;
        bVar14 = (bool)((byte)(uVar103 >> 4) & 1);
        auVar141._16_4_ = (float)((uint)bVar14 * local_740._16_4_ | (uint)!bVar14 * auVar136._16_4_)
        ;
        bVar14 = (bool)((byte)(uVar103 >> 5) & 1);
        auVar141._20_4_ = (float)((uint)bVar14 * local_740._20_4_ | (uint)!bVar14 * auVar136._20_4_)
        ;
        bVar14 = (bool)((byte)(uVar103 >> 6) & 1);
        auVar141._24_4_ = (float)((uint)bVar14 * local_740._24_4_ | (uint)!bVar14 * auVar136._24_4_)
        ;
        bVar14 = SUB81(uVar103 >> 7,0);
        auVar141._28_4_ = (uint)bVar14 * local_740._28_4_ | (uint)!bVar14 * auVar136._28_4_;
        bVar14 = (bool)((byte)uVar103 & 1);
        auVar142._0_4_ = (float)((uint)bVar14 * local_7a0._0_4_ | (uint)!bVar14 * auVar126._0_4_);
        bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
        auVar142._4_4_ = (float)((uint)bVar14 * local_7a0._4_4_ | (uint)!bVar14 * auVar126._4_4_);
        bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
        auVar142._8_4_ = (float)((uint)bVar14 * local_7a0._8_4_ | (uint)!bVar14 * auVar126._8_4_);
        bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
        auVar142._12_4_ = (float)((uint)bVar14 * local_7a0._12_4_ | (uint)!bVar14 * auVar126._12_4_)
        ;
        bVar14 = (bool)((byte)(uVar103 >> 4) & 1);
        auVar142._16_4_ = (float)((uint)bVar14 * local_7a0._16_4_ | (uint)!bVar14 * auVar126._16_4_)
        ;
        bVar14 = (bool)((byte)(uVar103 >> 5) & 1);
        auVar142._20_4_ = (float)((uint)bVar14 * local_7a0._20_4_ | (uint)!bVar14 * auVar126._20_4_)
        ;
        bVar14 = (bool)((byte)(uVar103 >> 6) & 1);
        auVar142._24_4_ = (float)((uint)bVar14 * local_7a0._24_4_ | (uint)!bVar14 * auVar126._24_4_)
        ;
        bVar14 = SUB81(uVar103 >> 7,0);
        auVar142._28_4_ = (uint)bVar14 * local_7a0._28_4_ | (uint)!bVar14 * auVar126._28_4_;
        auVar120 = vxorps_avx512vl(auVar116,auVar116);
        auVar238 = ZEXT1664(auVar120);
        auVar137 = vfmadd213ps_avx512vl(auVar139,auVar139,ZEXT1632(auVar120));
        auVar116 = vfmadd231ps_fma(auVar137,auVar140,auVar140);
        auVar137 = vrsqrt14ps_avx512vl(ZEXT1632(auVar116));
        fVar201 = auVar137._0_4_;
        fVar173 = auVar137._4_4_;
        fVar212 = auVar137._8_4_;
        fVar213 = auVar137._12_4_;
        fVar194 = auVar137._16_4_;
        fVar200 = auVar137._20_4_;
        fVar112 = auVar137._24_4_;
        auVar46._4_4_ = fVar173 * fVar173 * fVar173 * auVar116._4_4_ * -0.5;
        auVar46._0_4_ = fVar201 * fVar201 * fVar201 * auVar116._0_4_ * -0.5;
        auVar46._8_4_ = fVar212 * fVar212 * fVar212 * auVar116._8_4_ * -0.5;
        auVar46._12_4_ = fVar213 * fVar213 * fVar213 * auVar116._12_4_ * -0.5;
        auVar46._16_4_ = fVar194 * fVar194 * fVar194 * -0.0;
        auVar46._20_4_ = fVar200 * fVar200 * fVar200 * -0.0;
        auVar46._24_4_ = fVar112 * fVar112 * fVar112 * -0.0;
        auVar46._28_4_ = 0;
        auVar138 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar136 = vfmadd231ps_avx512vl(auVar46,auVar138,auVar137);
        auVar47._4_4_ = auVar140._4_4_ * auVar136._4_4_;
        auVar47._0_4_ = auVar140._0_4_ * auVar136._0_4_;
        auVar47._8_4_ = auVar140._8_4_ * auVar136._8_4_;
        auVar47._12_4_ = auVar140._12_4_ * auVar136._12_4_;
        auVar47._16_4_ = auVar140._16_4_ * auVar136._16_4_;
        auVar47._20_4_ = auVar140._20_4_ * auVar136._20_4_;
        auVar47._24_4_ = auVar140._24_4_ * auVar136._24_4_;
        auVar47._28_4_ = auVar137._28_4_;
        auVar48._4_4_ = auVar136._4_4_ * -auVar139._4_4_;
        auVar48._0_4_ = auVar136._0_4_ * -auVar139._0_4_;
        auVar48._8_4_ = auVar136._8_4_ * -auVar139._8_4_;
        auVar48._12_4_ = auVar136._12_4_ * -auVar139._12_4_;
        auVar48._16_4_ = auVar136._16_4_ * -auVar139._16_4_;
        auVar48._20_4_ = auVar136._20_4_ * -auVar139._20_4_;
        auVar48._24_4_ = auVar136._24_4_ * -auVar139._24_4_;
        auVar48._28_4_ = auVar139._28_4_ ^ 0x80000000;
        auVar137 = vmulps_avx512vl(auVar136,ZEXT1632(auVar120));
        auVar122 = ZEXT1632(auVar120);
        auVar126 = vfmadd213ps_avx512vl(auVar141,auVar141,auVar122);
        auVar116 = vfmadd231ps_fma(auVar126,auVar142,auVar142);
        auVar126 = vrsqrt14ps_avx512vl(ZEXT1632(auVar116));
        fVar201 = auVar126._0_4_;
        fVar173 = auVar126._4_4_;
        fVar212 = auVar126._8_4_;
        fVar213 = auVar126._12_4_;
        fVar194 = auVar126._16_4_;
        fVar200 = auVar126._20_4_;
        fVar112 = auVar126._24_4_;
        auVar49._4_4_ = fVar173 * fVar173 * fVar173 * auVar116._4_4_ * -0.5;
        auVar49._0_4_ = fVar201 * fVar201 * fVar201 * auVar116._0_4_ * -0.5;
        auVar49._8_4_ = fVar212 * fVar212 * fVar212 * auVar116._8_4_ * -0.5;
        auVar49._12_4_ = fVar213 * fVar213 * fVar213 * auVar116._12_4_ * -0.5;
        auVar49._16_4_ = fVar194 * fVar194 * fVar194 * -0.0;
        auVar49._20_4_ = fVar200 * fVar200 * fVar200 * -0.0;
        auVar49._24_4_ = fVar112 * fVar112 * fVar112 * -0.0;
        auVar49._28_4_ = 0;
        auVar138 = vfmadd231ps_avx512vl(auVar49,auVar138,auVar126);
        auVar50._4_4_ = auVar142._4_4_ * auVar138._4_4_;
        auVar50._0_4_ = auVar142._0_4_ * auVar138._0_4_;
        auVar50._8_4_ = auVar142._8_4_ * auVar138._8_4_;
        auVar50._12_4_ = auVar142._12_4_ * auVar138._12_4_;
        auVar50._16_4_ = auVar142._16_4_ * auVar138._16_4_;
        auVar50._20_4_ = auVar142._20_4_ * auVar138._20_4_;
        auVar50._24_4_ = auVar142._24_4_ * auVar138._24_4_;
        auVar50._28_4_ = auVar126._28_4_;
        auVar51._4_4_ = -auVar141._4_4_ * auVar138._4_4_;
        auVar51._0_4_ = -auVar141._0_4_ * auVar138._0_4_;
        auVar51._8_4_ = -auVar141._8_4_ * auVar138._8_4_;
        auVar51._12_4_ = -auVar141._12_4_ * auVar138._12_4_;
        auVar51._16_4_ = -auVar141._16_4_ * auVar138._16_4_;
        auVar51._20_4_ = -auVar141._20_4_ * auVar138._20_4_;
        auVar51._24_4_ = -auVar141._24_4_ * auVar138._24_4_;
        auVar51._28_4_ = auVar136._28_4_;
        auVar138 = vmulps_avx512vl(auVar138,auVar122);
        auVar116 = vfmadd213ps_fma(auVar47,auVar123,auVar124);
        auVar114 = vfmadd213ps_fma(auVar48,auVar123,auVar130);
        auVar136 = vfmadd213ps_avx512vl(auVar137,auVar123,auVar135);
        auVar126 = vfmadd213ps_avx512vl(auVar50,ZEXT1632(auVar115),ZEXT1632(auVar7));
        auVar118 = vfnmadd213ps_fma(auVar47,auVar123,auVar124);
        auVar134 = ZEXT1632(auVar115);
        auVar121 = vfmadd213ps_fma(auVar51,auVar134,auVar131);
        auVar119 = vfnmadd213ps_fma(auVar48,auVar123,auVar130);
        auVar237 = vfmadd213ps_fma(auVar138,auVar134,auVar129);
        auVar128 = vfnmadd231ps_avx512vl(auVar135,auVar123,auVar137);
        auVar195 = vfnmadd213ps_fma(auVar50,auVar134,ZEXT1632(auVar7));
        auVar196 = vfnmadd213ps_fma(auVar51,auVar134,auVar131);
        auVar223 = vfnmadd231ps_fma(auVar129,ZEXT1632(auVar115),auVar138);
        auVar138 = vsubps_avx512vl(auVar126,ZEXT1632(auVar118));
        auVar137 = vsubps_avx(ZEXT1632(auVar121),ZEXT1632(auVar119));
        auVar129 = vsubps_avx512vl(ZEXT1632(auVar237),auVar128);
        auVar135 = vmulps_avx512vl(auVar137,auVar128);
        auVar6 = vfmsub231ps_fma(auVar135,ZEXT1632(auVar119),auVar129);
        auVar52._4_4_ = auVar118._4_4_ * auVar129._4_4_;
        auVar52._0_4_ = auVar118._0_4_ * auVar129._0_4_;
        auVar52._8_4_ = auVar118._8_4_ * auVar129._8_4_;
        auVar52._12_4_ = auVar118._12_4_ * auVar129._12_4_;
        auVar52._16_4_ = auVar129._16_4_ * 0.0;
        auVar52._20_4_ = auVar129._20_4_ * 0.0;
        auVar52._24_4_ = auVar129._24_4_ * 0.0;
        auVar52._28_4_ = auVar129._28_4_;
        auVar129 = vfmsub231ps_avx512vl(auVar52,auVar128,auVar138);
        auVar53._4_4_ = auVar119._4_4_ * auVar138._4_4_;
        auVar53._0_4_ = auVar119._0_4_ * auVar138._0_4_;
        auVar53._8_4_ = auVar119._8_4_ * auVar138._8_4_;
        auVar53._12_4_ = auVar119._12_4_ * auVar138._12_4_;
        auVar53._16_4_ = auVar138._16_4_ * 0.0;
        auVar53._20_4_ = auVar138._20_4_ * 0.0;
        auVar53._24_4_ = auVar138._24_4_ * 0.0;
        auVar53._28_4_ = auVar138._28_4_;
        auVar7 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar118),auVar137);
        auVar137 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar122,auVar129);
        auVar137 = vfmadd231ps_avx512vl(auVar137,auVar122,ZEXT1632(auVar6));
        auVar122 = ZEXT1632(auVar120);
        uVar103 = vcmpps_avx512vl(auVar137,auVar122,2);
        bVar102 = (byte)uVar103;
        fVar112 = (float)((uint)(bVar102 & 1) * auVar116._0_4_ |
                         (uint)!(bool)(bVar102 & 1) * auVar195._0_4_);
        bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
        fVar193 = (float)((uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * auVar195._4_4_);
        bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
        fVar166 = (float)((uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * auVar195._8_4_);
        bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
        fVar169 = (float)((uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * auVar195._12_4_);
        auVar135 = ZEXT1632(CONCAT412(fVar169,CONCAT48(fVar166,CONCAT44(fVar193,fVar112))));
        fVar113 = (float)((uint)(bVar102 & 1) * auVar114._0_4_ |
                         (uint)!(bool)(bVar102 & 1) * auVar196._0_4_);
        bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
        fVar165 = (float)((uint)bVar14 * auVar114._4_4_ | (uint)!bVar14 * auVar196._4_4_);
        bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
        fVar167 = (float)((uint)bVar14 * auVar114._8_4_ | (uint)!bVar14 * auVar196._8_4_);
        bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
        fVar170 = (float)((uint)bVar14 * auVar114._12_4_ | (uint)!bVar14 * auVar196._12_4_);
        auVar134 = ZEXT1632(CONCAT412(fVar170,CONCAT48(fVar167,CONCAT44(fVar165,fVar113))));
        auVar143._0_4_ =
             (float)((uint)(bVar102 & 1) * auVar136._0_4_ |
                    (uint)!(bool)(bVar102 & 1) * auVar223._0_4_);
        bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
        auVar143._4_4_ = (float)((uint)bVar14 * auVar136._4_4_ | (uint)!bVar14 * auVar223._4_4_);
        bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
        auVar143._8_4_ = (float)((uint)bVar14 * auVar136._8_4_ | (uint)!bVar14 * auVar223._8_4_);
        bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
        auVar143._12_4_ = (float)((uint)bVar14 * auVar136._12_4_ | (uint)!bVar14 * auVar223._12_4_);
        fVar201 = (float)((uint)((byte)(uVar103 >> 4) & 1) * auVar136._16_4_);
        auVar143._16_4_ = fVar201;
        fVar212 = (float)((uint)((byte)(uVar103 >> 5) & 1) * auVar136._20_4_);
        auVar143._20_4_ = fVar212;
        fVar173 = (float)((uint)((byte)(uVar103 >> 6) & 1) * auVar136._24_4_);
        auVar143._24_4_ = fVar173;
        iVar1 = (uint)(byte)(uVar103 >> 7) * auVar136._28_4_;
        auVar143._28_4_ = iVar1;
        auVar138 = vblendmps_avx512vl(ZEXT1632(auVar118),auVar126);
        auVar144._0_4_ =
             (uint)(bVar102 & 1) * auVar138._0_4_ | (uint)!(bool)(bVar102 & 1) * auVar6._0_4_;
        bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
        auVar144._4_4_ = (uint)bVar14 * auVar138._4_4_ | (uint)!bVar14 * auVar6._4_4_;
        bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
        auVar144._8_4_ = (uint)bVar14 * auVar138._8_4_ | (uint)!bVar14 * auVar6._8_4_;
        bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
        auVar144._12_4_ = (uint)bVar14 * auVar138._12_4_ | (uint)!bVar14 * auVar6._12_4_;
        auVar144._16_4_ = (uint)((byte)(uVar103 >> 4) & 1) * auVar138._16_4_;
        auVar144._20_4_ = (uint)((byte)(uVar103 >> 5) & 1) * auVar138._20_4_;
        auVar144._24_4_ = (uint)((byte)(uVar103 >> 6) & 1) * auVar138._24_4_;
        auVar144._28_4_ = (uint)(byte)(uVar103 >> 7) * auVar138._28_4_;
        auVar138 = vblendmps_avx512vl(ZEXT1632(auVar119),ZEXT1632(auVar121));
        auVar145._0_4_ =
             (float)((uint)(bVar102 & 1) * auVar138._0_4_ |
                    (uint)!(bool)(bVar102 & 1) * auVar114._0_4_);
        bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
        auVar145._4_4_ = (float)((uint)bVar14 * auVar138._4_4_ | (uint)!bVar14 * auVar114._4_4_);
        bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
        auVar145._8_4_ = (float)((uint)bVar14 * auVar138._8_4_ | (uint)!bVar14 * auVar114._8_4_);
        bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
        auVar145._12_4_ = (float)((uint)bVar14 * auVar138._12_4_ | (uint)!bVar14 * auVar114._12_4_);
        fVar200 = (float)((uint)((byte)(uVar103 >> 4) & 1) * auVar138._16_4_);
        auVar145._16_4_ = fVar200;
        fVar194 = (float)((uint)((byte)(uVar103 >> 5) & 1) * auVar138._20_4_);
        auVar145._20_4_ = fVar194;
        fVar213 = (float)((uint)((byte)(uVar103 >> 6) & 1) * auVar138._24_4_);
        auVar145._24_4_ = fVar213;
        auVar145._28_4_ = (uint)(byte)(uVar103 >> 7) * auVar138._28_4_;
        auVar138 = vblendmps_avx512vl(auVar128,ZEXT1632(auVar237));
        auVar146._0_4_ =
             (float)((uint)(bVar102 & 1) * auVar138._0_4_ |
                    (uint)!(bool)(bVar102 & 1) * auVar136._0_4_);
        bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
        auVar146._4_4_ = (float)((uint)bVar14 * auVar138._4_4_ | (uint)!bVar14 * auVar136._4_4_);
        bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
        auVar146._8_4_ = (float)((uint)bVar14 * auVar138._8_4_ | (uint)!bVar14 * auVar136._8_4_);
        bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
        auVar146._12_4_ = (float)((uint)bVar14 * auVar138._12_4_ | (uint)!bVar14 * auVar136._12_4_);
        bVar14 = (bool)((byte)(uVar103 >> 4) & 1);
        auVar146._16_4_ = (float)((uint)bVar14 * auVar138._16_4_ | (uint)!bVar14 * auVar136._16_4_);
        bVar14 = (bool)((byte)(uVar103 >> 5) & 1);
        auVar146._20_4_ = (float)((uint)bVar14 * auVar138._20_4_ | (uint)!bVar14 * auVar136._20_4_);
        bVar14 = (bool)((byte)(uVar103 >> 6) & 1);
        auVar146._24_4_ = (float)((uint)bVar14 * auVar138._24_4_ | (uint)!bVar14 * auVar136._24_4_);
        bVar14 = SUB81(uVar103 >> 7,0);
        auVar146._28_4_ = (uint)bVar14 * auVar138._28_4_ | (uint)!bVar14 * auVar136._28_4_;
        auVar147._0_4_ =
             (uint)(bVar102 & 1) * (int)auVar118._0_4_ | (uint)!(bool)(bVar102 & 1) * auVar126._0_4_
        ;
        bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
        auVar147._4_4_ = (uint)bVar14 * (int)auVar118._4_4_ | (uint)!bVar14 * auVar126._4_4_;
        bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
        auVar147._8_4_ = (uint)bVar14 * (int)auVar118._8_4_ | (uint)!bVar14 * auVar126._8_4_;
        bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
        auVar147._12_4_ = (uint)bVar14 * (int)auVar118._12_4_ | (uint)!bVar14 * auVar126._12_4_;
        auVar147._16_4_ = (uint)!(bool)((byte)(uVar103 >> 4) & 1) * auVar126._16_4_;
        auVar147._20_4_ = (uint)!(bool)((byte)(uVar103 >> 5) & 1) * auVar126._20_4_;
        auVar147._24_4_ = (uint)!(bool)((byte)(uVar103 >> 6) & 1) * auVar126._24_4_;
        auVar147._28_4_ = (uint)!SUB81(uVar103 >> 7,0) * auVar126._28_4_;
        bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar103 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar103 >> 3) & 1);
        auVar148._0_4_ =
             (uint)(bVar102 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar102 & 1) * auVar237._0_4_;
        bVar15 = (bool)((byte)(uVar103 >> 1) & 1);
        auVar148._4_4_ = (uint)bVar15 * auVar128._4_4_ | (uint)!bVar15 * auVar237._4_4_;
        bVar15 = (bool)((byte)(uVar103 >> 2) & 1);
        auVar148._8_4_ = (uint)bVar15 * auVar128._8_4_ | (uint)!bVar15 * auVar237._8_4_;
        bVar15 = (bool)((byte)(uVar103 >> 3) & 1);
        auVar148._12_4_ = (uint)bVar15 * auVar128._12_4_ | (uint)!bVar15 * auVar237._12_4_;
        auVar148._16_4_ = (uint)((byte)(uVar103 >> 4) & 1) * auVar128._16_4_;
        auVar148._20_4_ = (uint)((byte)(uVar103 >> 5) & 1) * auVar128._20_4_;
        auVar148._24_4_ = (uint)((byte)(uVar103 >> 6) & 1) * auVar128._24_4_;
        iVar2 = (uint)(byte)(uVar103 >> 7) * auVar128._28_4_;
        auVar148._28_4_ = iVar2;
        auVar124 = vsubps_avx512vl(auVar147,auVar135);
        auVar138 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar119._12_4_ |
                                                 (uint)!bVar17 * auVar121._12_4_,
                                                 CONCAT48((uint)bVar16 * (int)auVar119._8_4_ |
                                                          (uint)!bVar16 * auVar121._8_4_,
                                                          CONCAT44((uint)bVar14 *
                                                                   (int)auVar119._4_4_ |
                                                                   (uint)!bVar14 * auVar121._4_4_,
                                                                   (uint)(bVar102 & 1) *
                                                                   (int)auVar119._0_4_ |
                                                                   (uint)!(bool)(bVar102 & 1) *
                                                                   auVar121._0_4_)))),auVar134);
        auVar136 = vsubps_avx(auVar148,auVar143);
        auVar126 = vsubps_avx(auVar135,auVar144);
        auVar128 = vsubps_avx(auVar134,auVar145);
        auVar129 = vsubps_avx(auVar143,auVar146);
        auVar54._4_4_ = auVar136._4_4_ * fVar193;
        auVar54._0_4_ = auVar136._0_4_ * fVar112;
        auVar54._8_4_ = auVar136._8_4_ * fVar166;
        auVar54._12_4_ = auVar136._12_4_ * fVar169;
        auVar54._16_4_ = auVar136._16_4_ * 0.0;
        auVar54._20_4_ = auVar136._20_4_ * 0.0;
        auVar54._24_4_ = auVar136._24_4_ * 0.0;
        auVar54._28_4_ = iVar2;
        auVar116 = vfmsub231ps_fma(auVar54,auVar143,auVar124);
        auVar55._4_4_ = fVar165 * auVar124._4_4_;
        auVar55._0_4_ = fVar113 * auVar124._0_4_;
        auVar55._8_4_ = fVar167 * auVar124._8_4_;
        auVar55._12_4_ = fVar170 * auVar124._12_4_;
        auVar55._16_4_ = auVar124._16_4_ * 0.0;
        auVar55._20_4_ = auVar124._20_4_ * 0.0;
        auVar55._24_4_ = auVar124._24_4_ * 0.0;
        auVar55._28_4_ = auVar137._28_4_;
        auVar114 = vfmsub231ps_fma(auVar55,auVar135,auVar138);
        auVar137 = vfmadd231ps_avx512vl(ZEXT1632(auVar114),auVar122,ZEXT1632(auVar116));
        auVar208._0_4_ = auVar138._0_4_ * auVar143._0_4_;
        auVar208._4_4_ = auVar138._4_4_ * auVar143._4_4_;
        auVar208._8_4_ = auVar138._8_4_ * auVar143._8_4_;
        auVar208._12_4_ = auVar138._12_4_ * auVar143._12_4_;
        auVar208._16_4_ = auVar138._16_4_ * fVar201;
        auVar208._20_4_ = auVar138._20_4_ * fVar212;
        auVar208._24_4_ = auVar138._24_4_ * fVar173;
        auVar208._28_4_ = 0;
        auVar116 = vfmsub231ps_fma(auVar208,auVar134,auVar136);
        auVar130 = vfmadd231ps_avx512vl(auVar137,auVar122,ZEXT1632(auVar116));
        auVar137 = vmulps_avx512vl(auVar129,auVar144);
        auVar137 = vfmsub231ps_avx512vl(auVar137,auVar126,auVar146);
        auVar56._4_4_ = auVar128._4_4_ * auVar146._4_4_;
        auVar56._0_4_ = auVar128._0_4_ * auVar146._0_4_;
        auVar56._8_4_ = auVar128._8_4_ * auVar146._8_4_;
        auVar56._12_4_ = auVar128._12_4_ * auVar146._12_4_;
        auVar56._16_4_ = auVar128._16_4_ * auVar146._16_4_;
        auVar56._20_4_ = auVar128._20_4_ * auVar146._20_4_;
        auVar56._24_4_ = auVar128._24_4_ * auVar146._24_4_;
        auVar56._28_4_ = auVar146._28_4_;
        auVar116 = vfmsub231ps_fma(auVar56,auVar145,auVar129);
        auVar209._0_4_ = auVar145._0_4_ * auVar126._0_4_;
        auVar209._4_4_ = auVar145._4_4_ * auVar126._4_4_;
        auVar209._8_4_ = auVar145._8_4_ * auVar126._8_4_;
        auVar209._12_4_ = auVar145._12_4_ * auVar126._12_4_;
        auVar209._16_4_ = fVar200 * auVar126._16_4_;
        auVar209._20_4_ = fVar194 * auVar126._20_4_;
        auVar209._24_4_ = fVar213 * auVar126._24_4_;
        auVar209._28_4_ = 0;
        auVar114 = vfmsub231ps_fma(auVar209,auVar128,auVar144);
        auVar137 = vfmadd231ps_avx512vl(ZEXT1632(auVar114),auVar122,auVar137);
        auVar131 = vfmadd231ps_avx512vl(auVar137,auVar122,ZEXT1632(auVar116));
        auVar137 = vmaxps_avx(auVar130,auVar131);
        uVar175 = vcmpps_avx512vl(auVar137,auVar122,2);
        bVar111 = bVar111 & (byte)uVar175;
        in_ZMM20 = ZEXT3264(local_840);
        in_ZMM21 = ZEXT3264(local_860);
        auVar236 = ZEXT3264(local_760);
        auVar234 = ZEXT3264(local_900);
        if (bVar111 == 0) {
          bVar111 = 0;
          auVar220 = ZEXT3264(auVar125);
          auVar199 = ZEXT3264(auVar127);
        }
        else {
          auVar57._4_4_ = auVar129._4_4_ * auVar138._4_4_;
          auVar57._0_4_ = auVar129._0_4_ * auVar138._0_4_;
          auVar57._8_4_ = auVar129._8_4_ * auVar138._8_4_;
          auVar57._12_4_ = auVar129._12_4_ * auVar138._12_4_;
          auVar57._16_4_ = auVar129._16_4_ * auVar138._16_4_;
          auVar57._20_4_ = auVar129._20_4_ * auVar138._20_4_;
          auVar57._24_4_ = auVar129._24_4_ * auVar138._24_4_;
          auVar57._28_4_ = auVar137._28_4_;
          auVar121 = vfmsub231ps_fma(auVar57,auVar128,auVar136);
          auVar58._4_4_ = auVar136._4_4_ * auVar126._4_4_;
          auVar58._0_4_ = auVar136._0_4_ * auVar126._0_4_;
          auVar58._8_4_ = auVar136._8_4_ * auVar126._8_4_;
          auVar58._12_4_ = auVar136._12_4_ * auVar126._12_4_;
          auVar58._16_4_ = auVar136._16_4_ * auVar126._16_4_;
          auVar58._20_4_ = auVar136._20_4_ * auVar126._20_4_;
          auVar58._24_4_ = auVar136._24_4_ * auVar126._24_4_;
          auVar58._28_4_ = auVar136._28_4_;
          auVar114 = vfmsub231ps_fma(auVar58,auVar124,auVar129);
          auVar59._4_4_ = auVar128._4_4_ * auVar124._4_4_;
          auVar59._0_4_ = auVar128._0_4_ * auVar124._0_4_;
          auVar59._8_4_ = auVar128._8_4_ * auVar124._8_4_;
          auVar59._12_4_ = auVar128._12_4_ * auVar124._12_4_;
          auVar59._16_4_ = auVar128._16_4_ * auVar124._16_4_;
          auVar59._20_4_ = auVar128._20_4_ * auVar124._20_4_;
          auVar59._24_4_ = auVar128._24_4_ * auVar124._24_4_;
          auVar59._28_4_ = auVar128._28_4_;
          auVar237 = vfmsub231ps_fma(auVar59,auVar126,auVar138);
          auVar116 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar114),ZEXT1632(auVar237));
          auVar137 = vfmadd231ps_avx512vl(ZEXT1632(auVar116),ZEXT1632(auVar121),auVar122);
          auVar138 = vrcp14ps_avx512vl(auVar137);
          auVar35._8_4_ = 0x3f800000;
          auVar35._0_8_ = &DAT_3f8000003f800000;
          auVar35._12_4_ = 0x3f800000;
          auVar35._16_4_ = 0x3f800000;
          auVar35._20_4_ = 0x3f800000;
          auVar35._24_4_ = 0x3f800000;
          auVar35._28_4_ = 0x3f800000;
          auVar136 = vfnmadd213ps_avx512vl(auVar138,auVar137,auVar35);
          auVar116 = vfmadd132ps_fma(auVar136,auVar138,auVar138);
          auVar60._4_4_ = auVar237._4_4_ * auVar143._4_4_;
          auVar60._0_4_ = auVar237._0_4_ * auVar143._0_4_;
          auVar60._8_4_ = auVar237._8_4_ * auVar143._8_4_;
          auVar60._12_4_ = auVar237._12_4_ * auVar143._12_4_;
          auVar60._16_4_ = fVar201 * 0.0;
          auVar60._20_4_ = fVar212 * 0.0;
          auVar60._24_4_ = fVar173 * 0.0;
          auVar60._28_4_ = iVar1;
          auVar114 = vfmadd231ps_fma(auVar60,auVar134,ZEXT1632(auVar114));
          auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar135,ZEXT1632(auVar121));
          fVar201 = auVar116._0_4_;
          fVar173 = auVar116._4_4_;
          fVar212 = auVar116._8_4_;
          fVar213 = auVar116._12_4_;
          auVar138 = ZEXT1632(CONCAT412(auVar114._12_4_ * fVar213,
                                        CONCAT48(auVar114._8_4_ * fVar212,
                                                 CONCAT44(auVar114._4_4_ * fVar173,
                                                          auVar114._0_4_ * fVar201))));
          auVar222._4_4_ = uVar224;
          auVar222._0_4_ = uVar224;
          auVar222._8_4_ = uVar224;
          auVar222._12_4_ = uVar224;
          auVar222._16_4_ = uVar224;
          auVar222._20_4_ = uVar224;
          auVar222._24_4_ = uVar224;
          auVar222._28_4_ = uVar224;
          uVar175 = vcmpps_avx512vl(auVar222,auVar138,2);
          uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar36._4_4_ = uVar174;
          auVar36._0_4_ = uVar174;
          auVar36._8_4_ = uVar174;
          auVar36._12_4_ = uVar174;
          auVar36._16_4_ = uVar174;
          auVar36._20_4_ = uVar174;
          auVar36._24_4_ = uVar174;
          auVar36._28_4_ = uVar174;
          uVar29 = vcmpps_avx512vl(auVar138,auVar36,2);
          bVar111 = (byte)uVar175 & (byte)uVar29 & bVar111;
          if (bVar111 == 0) {
            bVar111 = 0;
            auVar220 = ZEXT3264(auVar125);
            auVar199 = ZEXT3264(auVar127);
          }
          else {
            uVar175 = vcmpps_avx512vl(auVar137,auVar122,4);
            if ((bVar111 & (byte)uVar175) == 0) {
              bVar111 = 0;
              auVar220 = ZEXT3264(auVar125);
              auVar199 = ZEXT3264(auVar127);
            }
            else {
              bVar111 = bVar111 & (byte)uVar175;
              fVar194 = auVar130._0_4_ * fVar201;
              fVar200 = auVar130._4_4_ * fVar173;
              auVar61._4_4_ = fVar200;
              auVar61._0_4_ = fVar194;
              fVar112 = auVar130._8_4_ * fVar212;
              auVar61._8_4_ = fVar112;
              fVar113 = auVar130._12_4_ * fVar213;
              auVar61._12_4_ = fVar113;
              fVar193 = auVar130._16_4_ * 0.0;
              auVar61._16_4_ = fVar193;
              fVar165 = auVar130._20_4_ * 0.0;
              auVar61._20_4_ = fVar165;
              fVar166 = auVar130._24_4_ * 0.0;
              auVar61._24_4_ = fVar166;
              auVar61._28_4_ = auVar130._28_4_;
              fVar201 = auVar131._0_4_ * fVar201;
              fVar173 = auVar131._4_4_ * fVar173;
              auVar62._4_4_ = fVar173;
              auVar62._0_4_ = fVar201;
              fVar212 = auVar131._8_4_ * fVar212;
              auVar62._8_4_ = fVar212;
              fVar213 = auVar131._12_4_ * fVar213;
              auVar62._12_4_ = fVar213;
              fVar167 = auVar131._16_4_ * 0.0;
              auVar62._16_4_ = fVar167;
              fVar169 = auVar131._20_4_ * 0.0;
              auVar62._20_4_ = fVar169;
              fVar170 = auVar131._24_4_ * 0.0;
              auVar62._24_4_ = fVar170;
              auVar62._28_4_ = auVar131._28_4_;
              auVar216._8_4_ = 0x3f800000;
              auVar216._0_8_ = &DAT_3f8000003f800000;
              auVar216._12_4_ = 0x3f800000;
              auVar216._16_4_ = 0x3f800000;
              auVar216._20_4_ = 0x3f800000;
              auVar216._24_4_ = 0x3f800000;
              auVar216._28_4_ = 0x3f800000;
              auVar127 = vsubps_avx(auVar216,auVar61);
              bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar103 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar103 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar103 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar103 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar103 >> 6) & 1);
              bVar20 = SUB81(uVar103 >> 7,0);
              auVar220 = ZEXT3264(CONCAT428((uint)bVar20 * auVar130._28_4_ |
                                            (uint)!bVar20 * auVar127._28_4_,
                                            CONCAT424((uint)bVar19 * (int)fVar166 |
                                                      (uint)!bVar19 * auVar127._24_4_,
                                                      CONCAT420((uint)bVar18 * (int)fVar165 |
                                                                (uint)!bVar18 * auVar127._20_4_,
                                                                CONCAT416((uint)bVar17 *
                                                                          (int)fVar193 |
                                                                          (uint)!bVar17 *
                                                                          auVar127._16_4_,
                                                                          CONCAT412((uint)bVar16 *
                                                                                    (int)fVar113 |
                                                                                    (uint)!bVar16 *
                                                                                    auVar127._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar15 * (int)fVar112 |
                                                  (uint)!bVar15 * auVar127._8_4_,
                                                  CONCAT44((uint)bVar14 * (int)fVar200 |
                                                           (uint)!bVar14 * auVar127._4_4_,
                                                           (uint)(bVar102 & 1) * (int)fVar194 |
                                                           (uint)!(bool)(bVar102 & 1) *
                                                           auVar127._0_4_))))))));
              auVar127 = vsubps_avx(auVar216,auVar62);
              local_5a0._0_4_ =
                   (uint)(bVar102 & 1) * (int)fVar201 | (uint)!(bool)(bVar102 & 1) * auVar127._0_4_;
              bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
              local_5a0._4_4_ = (uint)bVar14 * (int)fVar173 | (uint)!bVar14 * auVar127._4_4_;
              bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
              local_5a0._8_4_ = (uint)bVar14 * (int)fVar212 | (uint)!bVar14 * auVar127._8_4_;
              bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
              local_5a0._12_4_ = (uint)bVar14 * (int)fVar213 | (uint)!bVar14 * auVar127._12_4_;
              bVar14 = (bool)((byte)(uVar103 >> 4) & 1);
              local_5a0._16_4_ = (uint)bVar14 * (int)fVar167 | (uint)!bVar14 * auVar127._16_4_;
              bVar14 = (bool)((byte)(uVar103 >> 5) & 1);
              local_5a0._20_4_ = (uint)bVar14 * (int)fVar169 | (uint)!bVar14 * auVar127._20_4_;
              bVar14 = (bool)((byte)(uVar103 >> 6) & 1);
              local_5a0._24_4_ = (uint)bVar14 * (int)fVar170 | (uint)!bVar14 * auVar127._24_4_;
              bVar14 = SUB81(uVar103 >> 7,0);
              local_5a0._28_4_ = (uint)bVar14 * auVar131._28_4_ | (uint)!bVar14 * auVar127._28_4_;
              auVar199 = ZEXT3264(auVar138);
            }
          }
        }
        auVar239 = ZEXT3264(local_8a0);
        auVar187 = ZEXT3264(local_880);
        if (bVar111 != 0) {
          auVar127 = vsubps_avx(ZEXT1632(auVar115),auVar123);
          auVar137 = auVar220._0_32_;
          auVar116 = vfmadd213ps_fma(auVar127,auVar137,auVar123);
          uVar174 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
          auVar37._4_4_ = uVar174;
          auVar37._0_4_ = uVar174;
          auVar37._8_4_ = uVar174;
          auVar37._12_4_ = uVar174;
          auVar37._16_4_ = uVar174;
          auVar37._20_4_ = uVar174;
          auVar37._24_4_ = uVar174;
          auVar37._28_4_ = uVar174;
          auVar127 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar116._12_4_ + auVar116._12_4_,
                                                        CONCAT48(auVar116._8_4_ + auVar116._8_4_,
                                                                 CONCAT44(auVar116._4_4_ +
                                                                          auVar116._4_4_,
                                                                          auVar116._0_4_ +
                                                                          auVar116._0_4_)))),auVar37
                                    );
          auVar125 = auVar199._0_32_;
          uVar175 = vcmpps_avx512vl(auVar125,auVar127,6);
          bVar111 = bVar111 & (byte)uVar175;
          if (bVar111 != 0) {
            auVar180._8_4_ = 0xbf800000;
            auVar180._0_8_ = 0xbf800000bf800000;
            auVar180._12_4_ = 0xbf800000;
            auVar180._16_4_ = 0xbf800000;
            auVar180._20_4_ = 0xbf800000;
            auVar180._24_4_ = 0xbf800000;
            auVar180._28_4_ = 0xbf800000;
            auVar38._8_4_ = 0x40000000;
            auVar38._0_8_ = 0x4000000040000000;
            auVar38._12_4_ = 0x40000000;
            auVar38._16_4_ = 0x40000000;
            auVar38._20_4_ = 0x40000000;
            auVar38._24_4_ = 0x40000000;
            auVar38._28_4_ = 0x40000000;
            local_700 = vfmadd132ps_avx512vl(local_5a0,auVar180,auVar38);
            local_5a0 = local_700;
            auVar127 = local_5a0;
            local_6c0 = 0;
            local_6a0 = local_8b0._0_8_;
            uStack_698 = local_8b0._8_8_;
            local_690 = local_8c0._0_8_;
            uStack_688 = local_8c0._8_8_;
            local_680 = local_8d0;
            uStack_678 = uStack_8c8;
            local_5a0 = auVar127;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
              fVar201 = 1.0 / auVar228._0_4_;
              local_660[0] = fVar201 * (auVar220._0_4_ + 0.0);
              local_660[1] = fVar201 * (auVar220._4_4_ + 1.0);
              local_660[2] = fVar201 * (auVar220._8_4_ + 2.0);
              local_660[3] = fVar201 * (auVar220._12_4_ + 3.0);
              fStack_650 = fVar201 * (auVar220._16_4_ + 4.0);
              fStack_64c = fVar201 * (auVar220._20_4_ + 5.0);
              fStack_648 = fVar201 * (auVar220._24_4_ + 6.0);
              fStack_644 = auVar220._28_4_ + 7.0;
              local_5a0._0_8_ = local_700._0_8_;
              local_5a0._8_8_ = local_700._8_8_;
              local_5a0._16_8_ = local_700._16_8_;
              local_5a0._24_8_ = local_700._24_8_;
              local_640 = local_5a0._0_8_;
              uStack_638 = local_5a0._8_8_;
              uStack_630 = local_5a0._16_8_;
              uStack_628 = local_5a0._24_8_;
              local_620 = auVar125;
              auVar181._8_4_ = 0x7f800000;
              auVar181._0_8_ = 0x7f8000007f800000;
              auVar181._12_4_ = 0x7f800000;
              auVar181._16_4_ = 0x7f800000;
              auVar181._20_4_ = 0x7f800000;
              auVar181._24_4_ = 0x7f800000;
              auVar181._28_4_ = 0x7f800000;
              auVar127 = vblendmps_avx512vl(auVar181,auVar125);
              auVar149._0_4_ =
                   (uint)(bVar111 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar111 & 1) * 0x7f800000;
              bVar14 = (bool)(bVar111 >> 1 & 1);
              auVar149._4_4_ = (uint)bVar14 * auVar127._4_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar111 >> 2 & 1);
              auVar149._8_4_ = (uint)bVar14 * auVar127._8_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar111 >> 3 & 1);
              auVar149._12_4_ = (uint)bVar14 * auVar127._12_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar111 >> 4 & 1);
              auVar149._16_4_ = (uint)bVar14 * auVar127._16_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar111 >> 5 & 1);
              auVar149._20_4_ = (uint)bVar14 * auVar127._20_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar111 >> 6 & 1);
              auVar149._24_4_ = (uint)bVar14 * auVar127._24_4_ | (uint)!bVar14 * 0x7f800000;
              auVar149._28_4_ =
                   (uint)(bVar111 >> 7) * auVar127._28_4_ | (uint)!(bool)(bVar111 >> 7) * 0x7f800000
              ;
              auVar127 = vshufps_avx(auVar149,auVar149,0xb1);
              auVar127 = vminps_avx(auVar149,auVar127);
              auVar138 = vshufpd_avx(auVar127,auVar127,5);
              auVar127 = vminps_avx(auVar127,auVar138);
              auVar138 = vpermpd_avx2(auVar127,0x4e);
              auVar127 = vminps_avx(auVar127,auVar138);
              uVar175 = vcmpps_avx512vl(auVar149,auVar127,0);
              bVar101 = (byte)uVar175 & bVar111;
              bVar102 = bVar111;
              if (bVar101 != 0) {
                bVar102 = bVar101;
              }
              uVar105 = 0;
              for (uVar104 = (uint)bVar102; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x80000000)
              {
                uVar105 = uVar105 + 1;
              }
              uVar103 = (ulong)uVar105;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar201 = local_660[uVar103];
                uVar174 = *(undefined4 *)((long)&local_640 + uVar103 * 4);
                fVar173 = 1.0 - fVar201;
                auVar31._8_4_ = 0x80000000;
                auVar31._0_8_ = 0x8000000080000000;
                auVar31._12_4_ = 0x80000000;
                auVar121 = vxorps_avx512vl(ZEXT416((uint)fVar173),auVar31);
                auVar116 = ZEXT416((uint)(fVar201 * fVar173 * 4.0));
                auVar114 = vfnmsub213ss_fma(ZEXT416((uint)fVar201),ZEXT416((uint)fVar201),auVar116);
                auVar116 = vfmadd213ss_fma(ZEXT416((uint)fVar173),ZEXT416((uint)fVar173),auVar116);
                fVar173 = fVar173 * auVar121._0_4_ * 0.5;
                fVar212 = auVar114._0_4_ * 0.5;
                fVar213 = auVar116._0_4_ * 0.5;
                fVar194 = fVar201 * fVar201 * 0.5;
                auVar202._0_4_ = fVar194 * (float)local_8d0._0_4_;
                auVar202._4_4_ = fVar194 * (float)local_8d0._4_4_;
                auVar202._8_4_ = fVar194 * (float)uStack_8c8;
                auVar202._12_4_ = fVar194 * uStack_8c8._4_4_;
                auVar189._4_4_ = fVar213;
                auVar189._0_4_ = fVar213;
                auVar189._8_4_ = fVar213;
                auVar189._12_4_ = fVar213;
                auVar116 = vfmadd132ps_fma(auVar189,auVar202,local_8c0);
                auVar203._4_4_ = fVar212;
                auVar203._0_4_ = fVar212;
                auVar203._8_4_ = fVar212;
                auVar203._12_4_ = fVar212;
                auVar220 = ZEXT3264(auVar137);
                auVar116 = vfmadd132ps_fma(auVar203,auVar116,local_8b0);
                auVar190._4_4_ = fVar173;
                auVar190._0_4_ = fVar173;
                auVar190._8_4_ = fVar173;
                auVar190._12_4_ = fVar173;
                auVar116 = vfmadd213ps_fma(auVar190,auVar28,auVar116);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar103 * 4);
                auVar199 = ZEXT3264(auVar125);
                *(int *)(ray + k * 4 + 0x300) = auVar116._0_4_;
                uVar10 = vextractps_avx(auVar116,1);
                *(undefined4 *)(ray + k * 4 + 0x340) = uVar10;
                uVar10 = vextractps_avx(auVar116,2);
                *(undefined4 *)(ray + k * 4 + 0x380) = uVar10;
                *(float *)(ray + k * 4 + 0x3c0) = fVar201;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar174;
                *(undefined4 *)(ray + k * 4 + 0x440) = uVar3;
                *(uint *)(ray + k * 4 + 0x480) = uVar109;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
              }
              else {
                auVar199 = vpbroadcastd_avx512f();
                local_4c0 = vmovdqa64_avx512f(auVar199);
                auVar199 = vpbroadcastd_avx512f();
                local_500 = vmovdqa64_avx512f(auVar199);
                local_7f0 = local_8b0._0_4_;
                uStack_7ec = local_8b0._4_4_;
                uStack_7e8 = local_8b0._8_8_;
                local_800 = local_8c0._0_8_;
                uStack_7f8 = local_8c0._8_8_;
                local_810 = (float)local_8d0._0_4_;
                fStack_80c = (float)local_8d0._4_4_;
                fStack_808 = (float)uStack_8c8;
                fStack_804 = uStack_8c8._4_4_;
                local_720 = auVar137;
                local_6e0 = auVar125;
                local_6bc = iVar9;
                local_6b0 = auVar28;
                local_670 = bVar111;
                do {
                  auVar237 = auVar238._0_16_;
                  local_740._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_660[uVar103]));
                  local_1c0 = vbroadcastss_avx512f
                                        (ZEXT416(*(uint *)((long)&local_640 + uVar103 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar103 * 4);
                  local_940.context = context->user;
                  fVar213 = local_200._0_4_;
                  fVar201 = 1.0 - fVar213;
                  auVar34._8_4_ = 0x80000000;
                  auVar34._0_8_ = 0x8000000080000000;
                  auVar34._12_4_ = 0x80000000;
                  auVar121 = vxorps_avx512vl(ZEXT416((uint)fVar201),auVar34);
                  auVar116 = ZEXT416((uint)(fVar213 * fVar201 * 4.0));
                  auVar114 = vfnmsub213ss_fma(local_200._0_16_,local_200._0_16_,auVar116);
                  auVar116 = vfmadd213ss_fma(ZEXT416((uint)fVar201),ZEXT416((uint)fVar201),auVar116)
                  ;
                  fVar201 = fVar201 * auVar121._0_4_ * 0.5;
                  fVar173 = auVar114._0_4_ * 0.5;
                  fVar212 = auVar116._0_4_ * 0.5;
                  fVar213 = fVar213 * fVar213 * 0.5;
                  auVar215._0_4_ = fVar213 * local_810;
                  auVar215._4_4_ = fVar213 * fStack_80c;
                  auVar215._8_4_ = fVar213 * fStack_808;
                  auVar215._12_4_ = fVar213 * fStack_804;
                  auVar178._4_4_ = fVar212;
                  auVar178._0_4_ = fVar212;
                  auVar178._8_4_ = fVar212;
                  auVar178._12_4_ = fVar212;
                  auVar98._8_8_ = uStack_7f8;
                  auVar98._0_8_ = local_800;
                  auVar116 = vfmadd132ps_fma(auVar178,auVar215,auVar98);
                  auVar207._4_4_ = fVar173;
                  auVar207._0_4_ = fVar173;
                  auVar207._8_4_ = fVar173;
                  auVar207._12_4_ = fVar173;
                  auVar99._4_4_ = uStack_7ec;
                  auVar99._0_4_ = local_7f0;
                  auVar99._8_8_ = uStack_7e8;
                  auVar116 = vfmadd132ps_fma(auVar207,auVar116,auVar99);
                  auVar179._4_4_ = fVar201;
                  auVar179._0_4_ = fVar201;
                  auVar179._8_4_ = fVar201;
                  auVar179._12_4_ = fVar201;
                  auVar116 = vfmadd213ps_fma(auVar179,auVar28,auVar116);
                  auVar199 = vbroadcastss_avx512f(auVar116);
                  auVar220 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar220,ZEXT1664(auVar116));
                  auVar220 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar220,ZEXT1664(auVar116));
                  local_2c0[0] = (RTCHitN)auVar199[0];
                  local_2c0[1] = (RTCHitN)auVar199[1];
                  local_2c0[2] = (RTCHitN)auVar199[2];
                  local_2c0[3] = (RTCHitN)auVar199[3];
                  local_2c0[4] = (RTCHitN)auVar199[4];
                  local_2c0[5] = (RTCHitN)auVar199[5];
                  local_2c0[6] = (RTCHitN)auVar199[6];
                  local_2c0[7] = (RTCHitN)auVar199[7];
                  local_2c0[8] = (RTCHitN)auVar199[8];
                  local_2c0[9] = (RTCHitN)auVar199[9];
                  local_2c0[10] = (RTCHitN)auVar199[10];
                  local_2c0[0xb] = (RTCHitN)auVar199[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar199[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar199[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar199[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar199[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar199[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar199[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar199[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar199[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar199[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar199[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar199[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar199[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar199[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar199[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar199[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar199[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar199[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar199[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar199[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar199[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar199[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar199[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar199[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar199[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar199[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar199[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar199[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar199[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar199[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar199[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar199[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar199[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar199[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar199[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar199[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar199[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar199[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar199[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar199[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar199[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar199[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar199[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar199[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar199[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar199[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar199[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar199[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar199[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar199[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar199[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar199[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar199[0x3f];
                  local_180 = local_500._0_8_;
                  uStack_178 = local_500._8_8_;
                  uStack_170 = local_500._16_8_;
                  uStack_168 = local_500._24_8_;
                  uStack_160 = local_500._32_8_;
                  uStack_158 = local_500._40_8_;
                  uStack_150 = local_500._48_8_;
                  uStack_148 = local_500._56_8_;
                  auVar199 = vmovdqa64_avx512f(local_4c0);
                  local_140 = vmovdqa64_avx512f(auVar199);
                  auVar127 = vpcmpeqd_avx2(auVar199._0_32_,auVar199._0_32_);
                  local_908[3] = auVar127;
                  local_908[2] = auVar127;
                  local_908[1] = auVar127;
                  *local_908 = auVar127;
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_940.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_940.context)->instPrimID[0]));
                  local_600 = local_300;
                  local_940.valid = (int *)local_600;
                  local_940.geometryUserPtr = *(void **)(CONCAT44(uStack_7bc,local_7c0) + 0x18);
                  local_940.hit = local_2c0;
                  local_940.N = 0x10;
                  pcVar13 = *(code **)(CONCAT44(uStack_7bc,local_7c0) + 0x40);
                  local_7a0._0_8_ = uVar103;
                  local_940.ray = (RTCRayN *)ray;
                  if (pcVar13 != (code *)0x0) {
                    (*pcVar13)(&local_940);
                    auVar239 = ZEXT3264(local_8a0);
                    auVar187 = ZEXT3264(local_880);
                    auVar234 = ZEXT3264(local_900);
                    auVar235 = ZEXT3264(local_780);
                    auVar236 = ZEXT3264(local_760);
                    in_ZMM21 = ZEXT3264(local_860);
                    in_ZMM20 = ZEXT3264(local_840);
                    auVar116 = vxorps_avx512vl(auVar237,auVar237);
                    auVar238 = ZEXT1664(auVar116);
                    uVar103 = local_7a0._0_8_;
                    uVar224 = local_7e0._0_4_;
                  }
                  auVar116 = auVar238._0_16_;
                  auVar199 = vmovdqa64_avx512f(local_600);
                  uVar175 = vptestmd_avx512f(auVar199,auVar199);
                  if ((short)uVar175 == 0) {
LAB_01d5be3b:
                    *(undefined4 *)(ray + k * 4 + 0x200) = local_740._0_4_;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(uStack_7bc,local_7c0) + 0x3e) & 0x40) != 0)))) {
                      (*p_Var12)(&local_940);
                      auVar239 = ZEXT3264(local_8a0);
                      auVar187 = ZEXT3264(local_880);
                      auVar234 = ZEXT3264(local_900);
                      auVar235 = ZEXT3264(local_780);
                      auVar236 = ZEXT3264(local_760);
                      in_ZMM21 = ZEXT3264(local_860);
                      in_ZMM20 = ZEXT3264(local_840);
                      auVar116 = vxorps_avx512vl(auVar116,auVar116);
                      auVar238 = ZEXT1664(auVar116);
                      uVar103 = local_7a0._0_8_;
                      uVar224 = local_7e0._0_4_;
                    }
                    auVar199 = vmovdqa64_avx512f(local_600);
                    uVar107 = vptestmd_avx512f(auVar199,auVar199);
                    if ((short)uVar107 == 0) goto LAB_01d5be3b;
                    iVar1 = *(int *)(local_940.hit + 4);
                    iVar2 = *(int *)(local_940.hit + 8);
                    iVar83 = *(int *)(local_940.hit + 0xc);
                    iVar84 = *(int *)(local_940.hit + 0x10);
                    iVar85 = *(int *)(local_940.hit + 0x14);
                    iVar86 = *(int *)(local_940.hit + 0x18);
                    iVar87 = *(int *)(local_940.hit + 0x1c);
                    iVar88 = *(int *)(local_940.hit + 0x20);
                    iVar89 = *(int *)(local_940.hit + 0x24);
                    iVar90 = *(int *)(local_940.hit + 0x28);
                    iVar91 = *(int *)(local_940.hit + 0x2c);
                    iVar92 = *(int *)(local_940.hit + 0x30);
                    iVar93 = *(int *)(local_940.hit + 0x34);
                    iVar94 = *(int *)(local_940.hit + 0x38);
                    iVar95 = *(int *)(local_940.hit + 0x3c);
                    bVar102 = (byte)uVar107;
                    bVar14 = (bool)((byte)(uVar107 >> 1) & 1);
                    bVar15 = (bool)((byte)(uVar107 >> 2) & 1);
                    bVar16 = (bool)((byte)(uVar107 >> 3) & 1);
                    bVar17 = (bool)((byte)(uVar107 >> 4) & 1);
                    bVar18 = (bool)((byte)(uVar107 >> 5) & 1);
                    bVar19 = (bool)((byte)(uVar107 >> 6) & 1);
                    bVar20 = (bool)((byte)(uVar107 >> 7) & 1);
                    bVar101 = (byte)(uVar107 >> 8);
                    bVar21 = (bool)((byte)(uVar107 >> 9) & 1);
                    bVar22 = (bool)((byte)(uVar107 >> 10) & 1);
                    bVar23 = (bool)((byte)(uVar107 >> 0xb) & 1);
                    bVar24 = (bool)((byte)(uVar107 >> 0xc) & 1);
                    bVar25 = (bool)((byte)(uVar107 >> 0xd) & 1);
                    bVar26 = (bool)((byte)(uVar107 >> 0xe) & 1);
                    bVar27 = SUB81(uVar107 >> 0xf,0);
                    *(uint *)(local_940.ray + 0x300) =
                         (uint)(bVar102 & 1) * *(int *)local_940.hit |
                         (uint)!(bool)(bVar102 & 1) * *(int *)(local_940.ray + 0x300);
                    *(uint *)(local_940.ray + 0x304) =
                         (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_940.ray + 0x304);
                    *(uint *)(local_940.ray + 0x308) =
                         (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_940.ray + 0x308);
                    *(uint *)(local_940.ray + 0x30c) =
                         (uint)bVar16 * iVar83 | (uint)!bVar16 * *(int *)(local_940.ray + 0x30c);
                    *(uint *)(local_940.ray + 0x310) =
                         (uint)bVar17 * iVar84 | (uint)!bVar17 * *(int *)(local_940.ray + 0x310);
                    *(uint *)(local_940.ray + 0x314) =
                         (uint)bVar18 * iVar85 | (uint)!bVar18 * *(int *)(local_940.ray + 0x314);
                    *(uint *)(local_940.ray + 0x318) =
                         (uint)bVar19 * iVar86 | (uint)!bVar19 * *(int *)(local_940.ray + 0x318);
                    *(uint *)(local_940.ray + 0x31c) =
                         (uint)bVar20 * iVar87 | (uint)!bVar20 * *(int *)(local_940.ray + 0x31c);
                    *(uint *)(local_940.ray + 800) =
                         (uint)(bVar101 & 1) * iVar88 |
                         (uint)!(bool)(bVar101 & 1) * *(int *)(local_940.ray + 800);
                    *(uint *)(local_940.ray + 0x324) =
                         (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_940.ray + 0x324);
                    *(uint *)(local_940.ray + 0x328) =
                         (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_940.ray + 0x328);
                    *(uint *)(local_940.ray + 0x32c) =
                         (uint)bVar23 * iVar91 | (uint)!bVar23 * *(int *)(local_940.ray + 0x32c);
                    *(uint *)(local_940.ray + 0x330) =
                         (uint)bVar24 * iVar92 | (uint)!bVar24 * *(int *)(local_940.ray + 0x330);
                    *(uint *)(local_940.ray + 0x334) =
                         (uint)bVar25 * iVar93 | (uint)!bVar25 * *(int *)(local_940.ray + 0x334);
                    *(uint *)(local_940.ray + 0x338) =
                         (uint)bVar26 * iVar94 | (uint)!bVar26 * *(int *)(local_940.ray + 0x338);
                    *(uint *)(local_940.ray + 0x33c) =
                         (uint)bVar27 * iVar95 | (uint)!bVar27 * *(int *)(local_940.ray + 0x33c);
                    iVar1 = *(int *)(local_940.hit + 0x44);
                    iVar2 = *(int *)(local_940.hit + 0x48);
                    iVar83 = *(int *)(local_940.hit + 0x4c);
                    iVar84 = *(int *)(local_940.hit + 0x50);
                    iVar85 = *(int *)(local_940.hit + 0x54);
                    iVar86 = *(int *)(local_940.hit + 0x58);
                    iVar87 = *(int *)(local_940.hit + 0x5c);
                    iVar88 = *(int *)(local_940.hit + 0x60);
                    iVar89 = *(int *)(local_940.hit + 100);
                    iVar90 = *(int *)(local_940.hit + 0x68);
                    iVar91 = *(int *)(local_940.hit + 0x6c);
                    iVar92 = *(int *)(local_940.hit + 0x70);
                    iVar93 = *(int *)(local_940.hit + 0x74);
                    iVar94 = *(int *)(local_940.hit + 0x78);
                    iVar95 = *(int *)(local_940.hit + 0x7c);
                    bVar14 = (bool)((byte)(uVar107 >> 1) & 1);
                    bVar15 = (bool)((byte)(uVar107 >> 2) & 1);
                    bVar16 = (bool)((byte)(uVar107 >> 3) & 1);
                    bVar17 = (bool)((byte)(uVar107 >> 4) & 1);
                    bVar18 = (bool)((byte)(uVar107 >> 5) & 1);
                    bVar19 = (bool)((byte)(uVar107 >> 6) & 1);
                    bVar20 = (bool)((byte)(uVar107 >> 7) & 1);
                    bVar21 = (bool)((byte)(uVar107 >> 9) & 1);
                    bVar22 = (bool)((byte)(uVar107 >> 10) & 1);
                    bVar23 = (bool)((byte)(uVar107 >> 0xb) & 1);
                    bVar24 = (bool)((byte)(uVar107 >> 0xc) & 1);
                    bVar25 = (bool)((byte)(uVar107 >> 0xd) & 1);
                    bVar26 = (bool)((byte)(uVar107 >> 0xe) & 1);
                    bVar27 = SUB81(uVar107 >> 0xf,0);
                    *(uint *)(local_940.ray + 0x340) =
                         (uint)(bVar102 & 1) * *(int *)(local_940.hit + 0x40) |
                         (uint)!(bool)(bVar102 & 1) * *(int *)(local_940.ray + 0x340);
                    *(uint *)(local_940.ray + 0x344) =
                         (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_940.ray + 0x344);
                    *(uint *)(local_940.ray + 0x348) =
                         (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_940.ray + 0x348);
                    *(uint *)(local_940.ray + 0x34c) =
                         (uint)bVar16 * iVar83 | (uint)!bVar16 * *(int *)(local_940.ray + 0x34c);
                    *(uint *)(local_940.ray + 0x350) =
                         (uint)bVar17 * iVar84 | (uint)!bVar17 * *(int *)(local_940.ray + 0x350);
                    *(uint *)(local_940.ray + 0x354) =
                         (uint)bVar18 * iVar85 | (uint)!bVar18 * *(int *)(local_940.ray + 0x354);
                    *(uint *)(local_940.ray + 0x358) =
                         (uint)bVar19 * iVar86 | (uint)!bVar19 * *(int *)(local_940.ray + 0x358);
                    *(uint *)(local_940.ray + 0x35c) =
                         (uint)bVar20 * iVar87 | (uint)!bVar20 * *(int *)(local_940.ray + 0x35c);
                    *(uint *)(local_940.ray + 0x360) =
                         (uint)(bVar101 & 1) * iVar88 |
                         (uint)!(bool)(bVar101 & 1) * *(int *)(local_940.ray + 0x360);
                    *(uint *)(local_940.ray + 0x364) =
                         (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_940.ray + 0x364);
                    *(uint *)(local_940.ray + 0x368) =
                         (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_940.ray + 0x368);
                    *(uint *)(local_940.ray + 0x36c) =
                         (uint)bVar23 * iVar91 | (uint)!bVar23 * *(int *)(local_940.ray + 0x36c);
                    *(uint *)(local_940.ray + 0x370) =
                         (uint)bVar24 * iVar92 | (uint)!bVar24 * *(int *)(local_940.ray + 0x370);
                    *(uint *)(local_940.ray + 0x374) =
                         (uint)bVar25 * iVar93 | (uint)!bVar25 * *(int *)(local_940.ray + 0x374);
                    *(uint *)(local_940.ray + 0x378) =
                         (uint)bVar26 * iVar94 | (uint)!bVar26 * *(int *)(local_940.ray + 0x378);
                    *(uint *)(local_940.ray + 0x37c) =
                         (uint)bVar27 * iVar95 | (uint)!bVar27 * *(int *)(local_940.ray + 0x37c);
                    iVar1 = *(int *)(local_940.hit + 0x84);
                    iVar2 = *(int *)(local_940.hit + 0x88);
                    iVar83 = *(int *)(local_940.hit + 0x8c);
                    iVar84 = *(int *)(local_940.hit + 0x90);
                    iVar85 = *(int *)(local_940.hit + 0x94);
                    iVar86 = *(int *)(local_940.hit + 0x98);
                    iVar87 = *(int *)(local_940.hit + 0x9c);
                    iVar88 = *(int *)(local_940.hit + 0xa0);
                    iVar89 = *(int *)(local_940.hit + 0xa4);
                    iVar90 = *(int *)(local_940.hit + 0xa8);
                    iVar91 = *(int *)(local_940.hit + 0xac);
                    iVar92 = *(int *)(local_940.hit + 0xb0);
                    iVar93 = *(int *)(local_940.hit + 0xb4);
                    iVar94 = *(int *)(local_940.hit + 0xb8);
                    iVar95 = *(int *)(local_940.hit + 0xbc);
                    bVar14 = (bool)((byte)(uVar107 >> 1) & 1);
                    bVar15 = (bool)((byte)(uVar107 >> 2) & 1);
                    bVar16 = (bool)((byte)(uVar107 >> 3) & 1);
                    bVar17 = (bool)((byte)(uVar107 >> 4) & 1);
                    bVar18 = (bool)((byte)(uVar107 >> 5) & 1);
                    bVar19 = (bool)((byte)(uVar107 >> 6) & 1);
                    bVar20 = (bool)((byte)(uVar107 >> 7) & 1);
                    bVar21 = (bool)((byte)(uVar107 >> 9) & 1);
                    bVar22 = (bool)((byte)(uVar107 >> 10) & 1);
                    bVar23 = (bool)((byte)(uVar107 >> 0xb) & 1);
                    bVar24 = (bool)((byte)(uVar107 >> 0xc) & 1);
                    bVar25 = (bool)((byte)(uVar107 >> 0xd) & 1);
                    bVar26 = (bool)((byte)(uVar107 >> 0xe) & 1);
                    bVar27 = SUB81(uVar107 >> 0xf,0);
                    *(uint *)(local_940.ray + 0x380) =
                         (uint)(bVar102 & 1) * *(int *)(local_940.hit + 0x80) |
                         (uint)!(bool)(bVar102 & 1) * *(int *)(local_940.ray + 0x380);
                    *(uint *)(local_940.ray + 900) =
                         (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_940.ray + 900);
                    *(uint *)(local_940.ray + 0x388) =
                         (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_940.ray + 0x388);
                    *(uint *)(local_940.ray + 0x38c) =
                         (uint)bVar16 * iVar83 | (uint)!bVar16 * *(int *)(local_940.ray + 0x38c);
                    *(uint *)(local_940.ray + 0x390) =
                         (uint)bVar17 * iVar84 | (uint)!bVar17 * *(int *)(local_940.ray + 0x390);
                    *(uint *)(local_940.ray + 0x394) =
                         (uint)bVar18 * iVar85 | (uint)!bVar18 * *(int *)(local_940.ray + 0x394);
                    *(uint *)(local_940.ray + 0x398) =
                         (uint)bVar19 * iVar86 | (uint)!bVar19 * *(int *)(local_940.ray + 0x398);
                    *(uint *)(local_940.ray + 0x39c) =
                         (uint)bVar20 * iVar87 | (uint)!bVar20 * *(int *)(local_940.ray + 0x39c);
                    *(uint *)(local_940.ray + 0x3a0) =
                         (uint)(bVar101 & 1) * iVar88 |
                         (uint)!(bool)(bVar101 & 1) * *(int *)(local_940.ray + 0x3a0);
                    *(uint *)(local_940.ray + 0x3a4) =
                         (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_940.ray + 0x3a4);
                    *(uint *)(local_940.ray + 0x3a8) =
                         (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_940.ray + 0x3a8);
                    *(uint *)(local_940.ray + 0x3ac) =
                         (uint)bVar23 * iVar91 | (uint)!bVar23 * *(int *)(local_940.ray + 0x3ac);
                    *(uint *)(local_940.ray + 0x3b0) =
                         (uint)bVar24 * iVar92 | (uint)!bVar24 * *(int *)(local_940.ray + 0x3b0);
                    *(uint *)(local_940.ray + 0x3b4) =
                         (uint)bVar25 * iVar93 | (uint)!bVar25 * *(int *)(local_940.ray + 0x3b4);
                    *(uint *)(local_940.ray + 0x3b8) =
                         (uint)bVar26 * iVar94 | (uint)!bVar26 * *(int *)(local_940.ray + 0x3b8);
                    *(uint *)(local_940.ray + 0x3bc) =
                         (uint)bVar27 * iVar95 | (uint)!bVar27 * *(int *)(local_940.ray + 0x3bc);
                    iVar1 = *(int *)(local_940.hit + 0xc4);
                    iVar2 = *(int *)(local_940.hit + 200);
                    iVar83 = *(int *)(local_940.hit + 0xcc);
                    iVar84 = *(int *)(local_940.hit + 0xd0);
                    iVar85 = *(int *)(local_940.hit + 0xd4);
                    iVar86 = *(int *)(local_940.hit + 0xd8);
                    iVar87 = *(int *)(local_940.hit + 0xdc);
                    iVar88 = *(int *)(local_940.hit + 0xe0);
                    iVar89 = *(int *)(local_940.hit + 0xe4);
                    iVar90 = *(int *)(local_940.hit + 0xe8);
                    iVar91 = *(int *)(local_940.hit + 0xec);
                    iVar92 = *(int *)(local_940.hit + 0xf0);
                    iVar93 = *(int *)(local_940.hit + 0xf4);
                    iVar94 = *(int *)(local_940.hit + 0xf8);
                    iVar95 = *(int *)(local_940.hit + 0xfc);
                    bVar14 = (bool)((byte)(uVar107 >> 1) & 1);
                    bVar15 = (bool)((byte)(uVar107 >> 2) & 1);
                    bVar16 = (bool)((byte)(uVar107 >> 3) & 1);
                    bVar17 = (bool)((byte)(uVar107 >> 4) & 1);
                    bVar18 = (bool)((byte)(uVar107 >> 5) & 1);
                    bVar19 = (bool)((byte)(uVar107 >> 6) & 1);
                    bVar20 = (bool)((byte)(uVar107 >> 7) & 1);
                    bVar21 = (bool)((byte)(uVar107 >> 9) & 1);
                    bVar22 = (bool)((byte)(uVar107 >> 10) & 1);
                    bVar23 = (bool)((byte)(uVar107 >> 0xb) & 1);
                    bVar24 = (bool)((byte)(uVar107 >> 0xc) & 1);
                    bVar25 = (bool)((byte)(uVar107 >> 0xd) & 1);
                    bVar26 = (bool)((byte)(uVar107 >> 0xe) & 1);
                    bVar27 = SUB81(uVar107 >> 0xf,0);
                    *(uint *)(local_940.ray + 0x3c0) =
                         (uint)(bVar102 & 1) * *(int *)(local_940.hit + 0xc0) |
                         (uint)!(bool)(bVar102 & 1) * *(int *)(local_940.ray + 0x3c0);
                    *(uint *)(local_940.ray + 0x3c4) =
                         (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_940.ray + 0x3c4);
                    *(uint *)(local_940.ray + 0x3c8) =
                         (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_940.ray + 0x3c8);
                    *(uint *)(local_940.ray + 0x3cc) =
                         (uint)bVar16 * iVar83 | (uint)!bVar16 * *(int *)(local_940.ray + 0x3cc);
                    *(uint *)(local_940.ray + 0x3d0) =
                         (uint)bVar17 * iVar84 | (uint)!bVar17 * *(int *)(local_940.ray + 0x3d0);
                    *(uint *)(local_940.ray + 0x3d4) =
                         (uint)bVar18 * iVar85 | (uint)!bVar18 * *(int *)(local_940.ray + 0x3d4);
                    *(uint *)(local_940.ray + 0x3d8) =
                         (uint)bVar19 * iVar86 | (uint)!bVar19 * *(int *)(local_940.ray + 0x3d8);
                    *(uint *)(local_940.ray + 0x3dc) =
                         (uint)bVar20 * iVar87 | (uint)!bVar20 * *(int *)(local_940.ray + 0x3dc);
                    *(uint *)(local_940.ray + 0x3e0) =
                         (uint)(bVar101 & 1) * iVar88 |
                         (uint)!(bool)(bVar101 & 1) * *(int *)(local_940.ray + 0x3e0);
                    *(uint *)(local_940.ray + 0x3e4) =
                         (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_940.ray + 0x3e4);
                    *(uint *)(local_940.ray + 1000) =
                         (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_940.ray + 1000);
                    *(uint *)(local_940.ray + 0x3ec) =
                         (uint)bVar23 * iVar91 | (uint)!bVar23 * *(int *)(local_940.ray + 0x3ec);
                    *(uint *)(local_940.ray + 0x3f0) =
                         (uint)bVar24 * iVar92 | (uint)!bVar24 * *(int *)(local_940.ray + 0x3f0);
                    *(uint *)(local_940.ray + 0x3f4) =
                         (uint)bVar25 * iVar93 | (uint)!bVar25 * *(int *)(local_940.ray + 0x3f4);
                    *(uint *)(local_940.ray + 0x3f8) =
                         (uint)bVar26 * iVar94 | (uint)!bVar26 * *(int *)(local_940.ray + 0x3f8);
                    *(uint *)(local_940.ray + 0x3fc) =
                         (uint)bVar27 * iVar95 | (uint)!bVar27 * *(int *)(local_940.ray + 0x3fc);
                    iVar1 = *(int *)(local_940.hit + 0x104);
                    iVar2 = *(int *)(local_940.hit + 0x108);
                    iVar83 = *(int *)(local_940.hit + 0x10c);
                    iVar84 = *(int *)(local_940.hit + 0x110);
                    iVar85 = *(int *)(local_940.hit + 0x114);
                    iVar86 = *(int *)(local_940.hit + 0x118);
                    iVar87 = *(int *)(local_940.hit + 0x11c);
                    iVar88 = *(int *)(local_940.hit + 0x120);
                    iVar89 = *(int *)(local_940.hit + 0x124);
                    iVar90 = *(int *)(local_940.hit + 0x128);
                    iVar91 = *(int *)(local_940.hit + 300);
                    iVar92 = *(int *)(local_940.hit + 0x130);
                    iVar93 = *(int *)(local_940.hit + 0x134);
                    iVar94 = *(int *)(local_940.hit + 0x138);
                    iVar95 = *(int *)(local_940.hit + 0x13c);
                    bVar14 = (bool)((byte)(uVar107 >> 1) & 1);
                    bVar15 = (bool)((byte)(uVar107 >> 2) & 1);
                    bVar16 = (bool)((byte)(uVar107 >> 3) & 1);
                    bVar17 = (bool)((byte)(uVar107 >> 4) & 1);
                    bVar18 = (bool)((byte)(uVar107 >> 5) & 1);
                    bVar19 = (bool)((byte)(uVar107 >> 6) & 1);
                    bVar20 = (bool)((byte)(uVar107 >> 7) & 1);
                    bVar21 = (bool)((byte)(uVar107 >> 9) & 1);
                    bVar22 = (bool)((byte)(uVar107 >> 10) & 1);
                    bVar23 = (bool)((byte)(uVar107 >> 0xb) & 1);
                    bVar24 = (bool)((byte)(uVar107 >> 0xc) & 1);
                    bVar25 = (bool)((byte)(uVar107 >> 0xd) & 1);
                    bVar26 = (bool)((byte)(uVar107 >> 0xe) & 1);
                    bVar27 = SUB81(uVar107 >> 0xf,0);
                    *(uint *)(local_940.ray + 0x400) =
                         (uint)(bVar102 & 1) * *(int *)(local_940.hit + 0x100) |
                         (uint)!(bool)(bVar102 & 1) * *(int *)(local_940.ray + 0x400);
                    *(uint *)(local_940.ray + 0x404) =
                         (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_940.ray + 0x404);
                    *(uint *)(local_940.ray + 0x408) =
                         (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_940.ray + 0x408);
                    *(uint *)(local_940.ray + 0x40c) =
                         (uint)bVar16 * iVar83 | (uint)!bVar16 * *(int *)(local_940.ray + 0x40c);
                    *(uint *)(local_940.ray + 0x410) =
                         (uint)bVar17 * iVar84 | (uint)!bVar17 * *(int *)(local_940.ray + 0x410);
                    *(uint *)(local_940.ray + 0x414) =
                         (uint)bVar18 * iVar85 | (uint)!bVar18 * *(int *)(local_940.ray + 0x414);
                    *(uint *)(local_940.ray + 0x418) =
                         (uint)bVar19 * iVar86 | (uint)!bVar19 * *(int *)(local_940.ray + 0x418);
                    *(uint *)(local_940.ray + 0x41c) =
                         (uint)bVar20 * iVar87 | (uint)!bVar20 * *(int *)(local_940.ray + 0x41c);
                    *(uint *)(local_940.ray + 0x420) =
                         (uint)(bVar101 & 1) * iVar88 |
                         (uint)!(bool)(bVar101 & 1) * *(int *)(local_940.ray + 0x420);
                    *(uint *)(local_940.ray + 0x424) =
                         (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_940.ray + 0x424);
                    *(uint *)(local_940.ray + 0x428) =
                         (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_940.ray + 0x428);
                    *(uint *)(local_940.ray + 0x42c) =
                         (uint)bVar23 * iVar91 | (uint)!bVar23 * *(int *)(local_940.ray + 0x42c);
                    *(uint *)(local_940.ray + 0x430) =
                         (uint)bVar24 * iVar92 | (uint)!bVar24 * *(int *)(local_940.ray + 0x430);
                    *(uint *)(local_940.ray + 0x434) =
                         (uint)bVar25 * iVar93 | (uint)!bVar25 * *(int *)(local_940.ray + 0x434);
                    *(uint *)(local_940.ray + 0x438) =
                         (uint)bVar26 * iVar94 | (uint)!bVar26 * *(int *)(local_940.ray + 0x438);
                    *(uint *)(local_940.ray + 0x43c) =
                         (uint)bVar27 * iVar95 | (uint)!bVar27 * *(int *)(local_940.ray + 0x43c);
                    auVar199 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_940.hit + 0x140));
                    auVar199 = vmovdqu32_avx512f(auVar199);
                    *(undefined1 (*) [64])(local_940.ray + 0x440) = auVar199;
                    auVar199 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_940.hit + 0x180));
                    auVar199 = vmovdqu32_avx512f(auVar199);
                    *(undefined1 (*) [64])(local_940.ray + 0x480) = auVar199;
                    auVar199 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_940.hit + 0x1c0));
                    auVar199 = vmovdqa32_avx512f(auVar199);
                    *(undefined1 (*) [64])(local_940.ray + 0x4c0) = auVar199;
                    auVar199 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_940.hit + 0x200));
                    auVar199 = vmovdqa32_avx512f(auVar199);
                    *(undefined1 (*) [64])(local_940.ray + 0x500) = auVar199;
                  }
                  auVar220 = ZEXT3264(auVar137);
                  auVar199 = ZEXT3264(auVar125);
                  bVar102 = ~(byte)(1 << ((uint)uVar103 & 0x1f)) & bVar111;
                  uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
                  auVar45._4_4_ = uVar174;
                  auVar45._0_4_ = uVar174;
                  auVar45._8_4_ = uVar174;
                  auVar45._12_4_ = uVar174;
                  auVar45._16_4_ = uVar174;
                  auVar45._20_4_ = uVar174;
                  auVar45._24_4_ = uVar174;
                  auVar45._28_4_ = uVar174;
                  uVar175 = vcmpps_avx512vl(auVar125,auVar45,2);
                  bVar111 = bVar102 & (byte)uVar175;
                  if ((bVar102 & (byte)uVar175) != 0) {
                    auVar186._8_4_ = 0x7f800000;
                    auVar186._0_8_ = 0x7f8000007f800000;
                    auVar186._12_4_ = 0x7f800000;
                    auVar186._16_4_ = 0x7f800000;
                    auVar186._20_4_ = 0x7f800000;
                    auVar186._24_4_ = 0x7f800000;
                    auVar186._28_4_ = 0x7f800000;
                    auVar127 = vblendmps_avx512vl(auVar186,auVar125);
                    auVar163._0_4_ =
                         (uint)(bVar111 & 1) * auVar127._0_4_ |
                         (uint)!(bool)(bVar111 & 1) * 0x7f800000;
                    bVar14 = (bool)(bVar111 >> 1 & 1);
                    auVar163._4_4_ = (uint)bVar14 * auVar127._4_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar111 >> 2 & 1);
                    auVar163._8_4_ = (uint)bVar14 * auVar127._8_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar111 >> 3 & 1);
                    auVar163._12_4_ = (uint)bVar14 * auVar127._12_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar111 >> 4 & 1);
                    auVar163._16_4_ = (uint)bVar14 * auVar127._16_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar111 >> 5 & 1);
                    auVar163._20_4_ = (uint)bVar14 * auVar127._20_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar111 >> 6 & 1);
                    auVar163._24_4_ = (uint)bVar14 * auVar127._24_4_ | (uint)!bVar14 * 0x7f800000;
                    auVar163._28_4_ =
                         (uint)(bVar111 >> 7) * auVar127._28_4_ |
                         (uint)!(bool)(bVar111 >> 7) * 0x7f800000;
                    auVar127 = vshufps_avx(auVar163,auVar163,0xb1);
                    auVar127 = vminps_avx(auVar163,auVar127);
                    auVar138 = vshufpd_avx(auVar127,auVar127,5);
                    auVar127 = vminps_avx(auVar127,auVar138);
                    auVar138 = vpermpd_avx2(auVar127,0x4e);
                    auVar127 = vminps_avx(auVar127,auVar138);
                    uVar175 = vcmpps_avx512vl(auVar163,auVar127,0);
                    bVar101 = (byte)uVar175 & bVar111;
                    bVar102 = bVar111;
                    if (bVar101 != 0) {
                      bVar102 = bVar101;
                    }
                    uVar105 = 0;
                    for (uVar104 = (uint)bVar102; (uVar104 & 1) == 0;
                        uVar104 = uVar104 >> 1 | 0x80000000) {
                      uVar105 = uVar105 + 1;
                    }
                    uVar103 = (ulong)uVar105;
                  }
                } while (bVar111 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar9) {
        local_7a0 = vpbroadcastd_avx512vl();
        local_740 = vbroadcastss_avx512vl(auVar117);
        fStack_7d0 = 1.0 / (float)local_540._0_4_;
        local_7e0._4_4_ = fStack_7d0;
        local_7e0._0_4_ = fStack_7d0;
        fStack_7d8 = fStack_7d0;
        fStack_7d4 = fStack_7d0;
        auVar164 = vpbroadcastd_avx512f();
        local_540 = vmovdqa64_avx512f(auVar164);
        auVar164 = vpbroadcastd_avx512f();
        local_4c0 = vmovdqa64_avx512f(auVar164);
        lVar108 = 8;
        auVar125 = auVar220._0_32_;
        auVar127 = auVar199._0_32_;
        fStack_7cc = fStack_7d0;
        fStack_7c8 = fStack_7d0;
        fStack_7c4 = fStack_7d0;
        local_7c0 = uVar224;
        uStack_7bc = uVar224;
        uStack_7b8 = uVar224;
        uStack_7b4 = uVar224;
        uStack_7b0 = uVar224;
        uStack_7ac = uVar224;
        uStack_7a8 = uVar224;
        uStack_7a4 = uVar224;
        do {
          auVar137 = vpbroadcastd_avx512vl();
          auVar128 = vpor_avx2(auVar137,_DAT_0205a920);
          uVar29 = vpcmpd_avx512vl(auVar128,local_7a0,1);
          auVar137 = *(undefined1 (*) [32])(bspline_basis0 + lVar108 * 4 + lVar30);
          auVar138 = *(undefined1 (*) [32])(lVar30 + 0x222bfac + lVar108 * 4);
          auVar136 = *(undefined1 (*) [32])(lVar30 + 0x222c430 + lVar108 * 4);
          auVar126 = *(undefined1 (*) [32])(lVar30 + 0x222c8b4 + lVar108 * 4);
          local_880 = auVar187._0_32_;
          auVar129 = vmulps_avx512vl(local_880,auVar126);
          local_8a0 = auVar239._0_32_;
          auVar135 = vmulps_avx512vl(local_8a0,auVar126);
          auVar63._4_4_ = auVar126._4_4_ * (float)local_3e0._4_4_;
          auVar63._0_4_ = auVar126._0_4_ * (float)local_3e0._0_4_;
          auVar63._8_4_ = auVar126._8_4_ * fStack_3d8;
          auVar63._12_4_ = auVar126._12_4_ * fStack_3d4;
          auVar63._16_4_ = auVar126._16_4_ * fStack_3d0;
          auVar63._20_4_ = auVar126._20_4_ * fStack_3cc;
          auVar63._24_4_ = auVar126._24_4_ * fStack_3c8;
          auVar63._28_4_ = auVar128._28_4_;
          auVar128 = vfmadd231ps_avx512vl(auVar129,auVar136,local_340);
          auVar129 = vfmadd231ps_avx512vl(auVar135,auVar136,local_360);
          auVar135 = vfmadd231ps_avx512vl(auVar63,auVar136,local_3c0);
          auVar218 = auVar234._0_32_;
          auVar128 = vfmadd231ps_avx512vl(auVar128,auVar138,auVar218);
          auVar129 = vfmadd231ps_avx512vl(auVar129,auVar138,local_580);
          auVar117 = vfmadd231ps_fma(auVar135,auVar138,local_3a0);
          auVar221 = auVar236._0_32_;
          auVar131 = vfmadd231ps_avx512vl(auVar128,auVar137,auVar221);
          auVar219 = auVar235._0_32_;
          auVar122 = vfmadd231ps_avx512vl(auVar129,auVar137,auVar219);
          auVar128 = *(undefined1 (*) [32])(bspline_basis1 + lVar108 * 4 + lVar30);
          auVar129 = *(undefined1 (*) [32])(lVar30 + 0x222e3cc + lVar108 * 4);
          auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar137,local_380);
          auVar135 = *(undefined1 (*) [32])(lVar30 + 0x222e850 + lVar108 * 4);
          auVar134 = *(undefined1 (*) [32])(lVar30 + 0x222ecd4 + lVar108 * 4);
          auVar124 = vmulps_avx512vl(local_880,auVar134);
          auVar130 = vmulps_avx512vl(local_8a0,auVar134);
          auVar64._4_4_ = auVar134._4_4_ * (float)local_3e0._4_4_;
          auVar64._0_4_ = auVar134._0_4_ * (float)local_3e0._0_4_;
          auVar64._8_4_ = auVar134._8_4_ * fStack_3d8;
          auVar64._12_4_ = auVar134._12_4_ * fStack_3d4;
          auVar64._16_4_ = auVar134._16_4_ * fStack_3d0;
          auVar64._20_4_ = auVar134._20_4_ * fStack_3cc;
          auVar64._24_4_ = auVar134._24_4_ * fStack_3c8;
          auVar64._28_4_ = uStack_3c4;
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar135,local_340);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar135,local_360);
          auVar123 = vfmadd231ps_avx512vl(auVar64,auVar135,local_3c0);
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar129,auVar218);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar129,local_580);
          auVar116 = vfmadd231ps_fma(auVar123,auVar129,local_3a0);
          auVar123 = vfmadd231ps_avx512vl(auVar124,auVar128,auVar221);
          auVar132 = vfmadd231ps_avx512vl(auVar130,auVar128,auVar219);
          auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar128,local_380);
          auVar133 = vmaxps_avx512vl(ZEXT1632(auVar117),ZEXT1632(auVar116));
          auVar124 = vsubps_avx(auVar123,auVar131);
          auVar130 = vsubps_avx(auVar132,auVar122);
          auVar150 = vmulps_avx512vl(auVar122,auVar124);
          auVar151 = vmulps_avx512vl(auVar131,auVar130);
          auVar150 = vsubps_avx512vl(auVar150,auVar151);
          auVar151 = vmulps_avx512vl(auVar130,auVar130);
          auVar151 = vfmadd231ps_avx512vl(auVar151,auVar124,auVar124);
          auVar133 = vmulps_avx512vl(auVar133,auVar133);
          auVar133 = vmulps_avx512vl(auVar133,auVar151);
          auVar150 = vmulps_avx512vl(auVar150,auVar150);
          uVar175 = vcmpps_avx512vl(auVar150,auVar133,2);
          local_670 = (byte)uVar29 & (byte)uVar175;
          if (local_670 == 0) {
            auVar164 = ZEXT3264(auVar219);
            auVar234 = ZEXT3264(auVar218);
          }
          else {
            auVar134 = vmulps_avx512vl(local_460,auVar134);
            auVar135 = vfmadd213ps_avx512vl(auVar135,local_440,auVar134);
            auVar129 = vfmadd213ps_avx512vl(auVar129,local_420,auVar135);
            auVar128 = vfmadd213ps_avx512vl(auVar128,local_400,auVar129);
            auVar126 = vmulps_avx512vl(local_460,auVar126);
            auVar136 = vfmadd213ps_avx512vl(auVar136,local_440,auVar126);
            auVar138 = vfmadd213ps_avx512vl(auVar138,local_420,auVar136);
            auVar129 = vfmadd213ps_avx512vl(auVar137,local_400,auVar138);
            auVar137 = *(undefined1 (*) [32])(lVar30 + 0x222cd38 + lVar108 * 4);
            auVar138 = *(undefined1 (*) [32])(lVar30 + 0x222d1bc + lVar108 * 4);
            auVar136 = *(undefined1 (*) [32])(lVar30 + 0x222d640 + lVar108 * 4);
            auVar126 = *(undefined1 (*) [32])(lVar30 + 0x222dac4 + lVar108 * 4);
            auVar135 = vmulps_avx512vl(local_880,auVar126);
            auVar134 = vmulps_avx512vl(local_8a0,auVar126);
            auVar126 = vmulps_avx512vl(local_460,auVar126);
            auVar135 = vfmadd231ps_avx512vl(auVar135,auVar136,local_340);
            auVar134 = vfmadd231ps_avx512vl(auVar134,auVar136,local_360);
            auVar136 = vfmadd231ps_avx512vl(auVar126,local_440,auVar136);
            auVar126 = vfmadd231ps_avx512vl(auVar135,auVar138,auVar218);
            auVar135 = vfmadd231ps_avx512vl(auVar134,auVar138,local_580);
            auVar138 = vfmadd231ps_avx512vl(auVar136,local_420,auVar138);
            auVar126 = vfmadd231ps_avx512vl(auVar126,auVar137,auVar221);
            auVar135 = vfmadd231ps_avx512vl(auVar135,auVar137,auVar219);
            auVar134 = vfmadd231ps_avx512vl(auVar138,local_400,auVar137);
            auVar137 = *(undefined1 (*) [32])(lVar30 + 0x222f158 + lVar108 * 4);
            auVar138 = *(undefined1 (*) [32])(lVar30 + 0x222fa60 + lVar108 * 4);
            auVar136 = *(undefined1 (*) [32])(lVar30 + 0x222fee4 + lVar108 * 4);
            auVar133 = vmulps_avx512vl(local_880,auVar136);
            auVar150 = vmulps_avx512vl(local_8a0,auVar136);
            auVar136 = vmulps_avx512vl(local_460,auVar136);
            auVar133 = vfmadd231ps_avx512vl(auVar133,auVar138,local_340);
            auVar150 = vfmadd231ps_avx512vl(auVar150,auVar138,local_360);
            auVar136 = vfmadd231ps_avx512vl(auVar136,local_440,auVar138);
            auVar138 = *(undefined1 (*) [32])(lVar30 + 0x222f5dc + lVar108 * 4);
            auVar133 = vfmadd231ps_avx512vl(auVar133,auVar138,auVar218);
            auVar114 = vfmadd231ps_fma(auVar150,auVar138,local_580);
            auVar138 = vfmadd231ps_avx512vl(auVar136,local_420,auVar138);
            auVar136 = vfmadd231ps_avx512vl(auVar133,auVar137,auVar221);
            auVar133 = vfmadd231ps_avx512vl(ZEXT1632(auVar114),auVar137,auVar219);
            auVar138 = vfmadd231ps_avx512vl(auVar138,local_400,auVar137);
            auVar150 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar126,auVar150);
            vandps_avx512vl(auVar135,auVar150);
            auVar137 = vmaxps_avx(auVar150,auVar150);
            vandps_avx512vl(auVar134,auVar150);
            auVar137 = vmaxps_avx(auVar137,auVar150);
            uVar103 = vcmpps_avx512vl(auVar137,local_740,1);
            bVar14 = (bool)((byte)uVar103 & 1);
            auVar152._0_4_ = (float)((uint)bVar14 * auVar124._0_4_ | (uint)!bVar14 * auVar126._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
            auVar152._4_4_ = (float)((uint)bVar14 * auVar124._4_4_ | (uint)!bVar14 * auVar126._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
            auVar152._8_4_ = (float)((uint)bVar14 * auVar124._8_4_ | (uint)!bVar14 * auVar126._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
            auVar152._12_4_ =
                 (float)((uint)bVar14 * auVar124._12_4_ | (uint)!bVar14 * auVar126._12_4_);
            bVar14 = (bool)((byte)(uVar103 >> 4) & 1);
            auVar152._16_4_ =
                 (float)((uint)bVar14 * auVar124._16_4_ | (uint)!bVar14 * auVar126._16_4_);
            bVar14 = (bool)((byte)(uVar103 >> 5) & 1);
            auVar152._20_4_ =
                 (float)((uint)bVar14 * auVar124._20_4_ | (uint)!bVar14 * auVar126._20_4_);
            bVar14 = (bool)((byte)(uVar103 >> 6) & 1);
            auVar152._24_4_ =
                 (float)((uint)bVar14 * auVar124._24_4_ | (uint)!bVar14 * auVar126._24_4_);
            bVar14 = SUB81(uVar103 >> 7,0);
            auVar152._28_4_ = (uint)bVar14 * auVar124._28_4_ | (uint)!bVar14 * auVar126._28_4_;
            bVar14 = (bool)((byte)uVar103 & 1);
            auVar153._0_4_ = (float)((uint)bVar14 * auVar130._0_4_ | (uint)!bVar14 * auVar135._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
            auVar153._4_4_ = (float)((uint)bVar14 * auVar130._4_4_ | (uint)!bVar14 * auVar135._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
            auVar153._8_4_ = (float)((uint)bVar14 * auVar130._8_4_ | (uint)!bVar14 * auVar135._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
            auVar153._12_4_ =
                 (float)((uint)bVar14 * auVar130._12_4_ | (uint)!bVar14 * auVar135._12_4_);
            bVar14 = (bool)((byte)(uVar103 >> 4) & 1);
            auVar153._16_4_ =
                 (float)((uint)bVar14 * auVar130._16_4_ | (uint)!bVar14 * auVar135._16_4_);
            bVar14 = (bool)((byte)(uVar103 >> 5) & 1);
            auVar153._20_4_ =
                 (float)((uint)bVar14 * auVar130._20_4_ | (uint)!bVar14 * auVar135._20_4_);
            bVar14 = (bool)((byte)(uVar103 >> 6) & 1);
            auVar153._24_4_ =
                 (float)((uint)bVar14 * auVar130._24_4_ | (uint)!bVar14 * auVar135._24_4_);
            bVar14 = SUB81(uVar103 >> 7,0);
            auVar153._28_4_ = (uint)bVar14 * auVar130._28_4_ | (uint)!bVar14 * auVar135._28_4_;
            vandps_avx512vl(auVar136,auVar150);
            vandps_avx512vl(auVar133,auVar150);
            auVar137 = vmaxps_avx(auVar153,auVar153);
            vandps_avx512vl(auVar138,auVar150);
            auVar137 = vmaxps_avx(auVar137,auVar153);
            uVar103 = vcmpps_avx512vl(auVar137,local_740,1);
            bVar14 = (bool)((byte)uVar103 & 1);
            auVar154._0_4_ = (uint)bVar14 * auVar124._0_4_ | (uint)!bVar14 * auVar136._0_4_;
            bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
            auVar154._4_4_ = (uint)bVar14 * auVar124._4_4_ | (uint)!bVar14 * auVar136._4_4_;
            bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
            auVar154._8_4_ = (uint)bVar14 * auVar124._8_4_ | (uint)!bVar14 * auVar136._8_4_;
            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
            auVar154._12_4_ = (uint)bVar14 * auVar124._12_4_ | (uint)!bVar14 * auVar136._12_4_;
            bVar14 = (bool)((byte)(uVar103 >> 4) & 1);
            auVar154._16_4_ = (uint)bVar14 * auVar124._16_4_ | (uint)!bVar14 * auVar136._16_4_;
            bVar14 = (bool)((byte)(uVar103 >> 5) & 1);
            auVar154._20_4_ = (uint)bVar14 * auVar124._20_4_ | (uint)!bVar14 * auVar136._20_4_;
            bVar14 = (bool)((byte)(uVar103 >> 6) & 1);
            auVar154._24_4_ = (uint)bVar14 * auVar124._24_4_ | (uint)!bVar14 * auVar136._24_4_;
            bVar14 = SUB81(uVar103 >> 7,0);
            auVar154._28_4_ = (uint)bVar14 * auVar124._28_4_ | (uint)!bVar14 * auVar136._28_4_;
            bVar14 = (bool)((byte)uVar103 & 1);
            auVar155._0_4_ = (float)((uint)bVar14 * auVar130._0_4_ | (uint)!bVar14 * auVar133._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
            auVar155._4_4_ = (float)((uint)bVar14 * auVar130._4_4_ | (uint)!bVar14 * auVar133._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
            auVar155._8_4_ = (float)((uint)bVar14 * auVar130._8_4_ | (uint)!bVar14 * auVar133._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
            auVar155._12_4_ =
                 (float)((uint)bVar14 * auVar130._12_4_ | (uint)!bVar14 * auVar133._12_4_);
            bVar14 = (bool)((byte)(uVar103 >> 4) & 1);
            auVar155._16_4_ =
                 (float)((uint)bVar14 * auVar130._16_4_ | (uint)!bVar14 * auVar133._16_4_);
            bVar14 = (bool)((byte)(uVar103 >> 5) & 1);
            auVar155._20_4_ =
                 (float)((uint)bVar14 * auVar130._20_4_ | (uint)!bVar14 * auVar133._20_4_);
            bVar14 = (bool)((byte)(uVar103 >> 6) & 1);
            auVar155._24_4_ =
                 (float)((uint)bVar14 * auVar130._24_4_ | (uint)!bVar14 * auVar133._24_4_);
            bVar14 = SUB81(uVar103 >> 7,0);
            auVar155._28_4_ = (uint)bVar14 * auVar130._28_4_ | (uint)!bVar14 * auVar133._28_4_;
            auVar225._8_4_ = 0x80000000;
            auVar225._0_8_ = 0x8000000080000000;
            auVar225._12_4_ = 0x80000000;
            auVar225._16_4_ = 0x80000000;
            auVar225._20_4_ = 0x80000000;
            auVar225._24_4_ = 0x80000000;
            auVar225._28_4_ = 0x80000000;
            auVar137 = vxorps_avx512vl(auVar154,auVar225);
            auVar133 = auVar238._0_32_;
            auVar138 = vfmadd213ps_avx512vl(auVar152,auVar152,auVar133);
            auVar114 = vfmadd231ps_fma(auVar138,auVar153,auVar153);
            auVar138 = vrsqrt14ps_avx512vl(ZEXT1632(auVar114));
            auVar233._8_4_ = 0xbf000000;
            auVar233._0_8_ = 0xbf000000bf000000;
            auVar233._12_4_ = 0xbf000000;
            auVar233._16_4_ = 0xbf000000;
            auVar233._20_4_ = 0xbf000000;
            auVar233._24_4_ = 0xbf000000;
            auVar233._28_4_ = 0xbf000000;
            fVar201 = auVar138._0_4_;
            fVar173 = auVar138._4_4_;
            fVar212 = auVar138._8_4_;
            fVar213 = auVar138._12_4_;
            fVar194 = auVar138._16_4_;
            fVar200 = auVar138._20_4_;
            fVar112 = auVar138._24_4_;
            auVar65._4_4_ = fVar173 * fVar173 * fVar173 * auVar114._4_4_ * -0.5;
            auVar65._0_4_ = fVar201 * fVar201 * fVar201 * auVar114._0_4_ * -0.5;
            auVar65._8_4_ = fVar212 * fVar212 * fVar212 * auVar114._8_4_ * -0.5;
            auVar65._12_4_ = fVar213 * fVar213 * fVar213 * auVar114._12_4_ * -0.5;
            auVar65._16_4_ = fVar194 * fVar194 * fVar194 * -0.0;
            auVar65._20_4_ = fVar200 * fVar200 * fVar200 * -0.0;
            auVar65._24_4_ = fVar112 * fVar112 * fVar112 * -0.0;
            auVar65._28_4_ = auVar153._28_4_;
            auVar136 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar138 = vfmadd231ps_avx512vl(auVar65,auVar136,auVar138);
            auVar66._4_4_ = auVar153._4_4_ * auVar138._4_4_;
            auVar66._0_4_ = auVar153._0_4_ * auVar138._0_4_;
            auVar66._8_4_ = auVar153._8_4_ * auVar138._8_4_;
            auVar66._12_4_ = auVar153._12_4_ * auVar138._12_4_;
            auVar66._16_4_ = auVar153._16_4_ * auVar138._16_4_;
            auVar66._20_4_ = auVar153._20_4_ * auVar138._20_4_;
            auVar66._24_4_ = auVar153._24_4_ * auVar138._24_4_;
            auVar66._28_4_ = 0;
            auVar67._4_4_ = auVar138._4_4_ * -auVar152._4_4_;
            auVar67._0_4_ = auVar138._0_4_ * -auVar152._0_4_;
            auVar67._8_4_ = auVar138._8_4_ * -auVar152._8_4_;
            auVar67._12_4_ = auVar138._12_4_ * -auVar152._12_4_;
            auVar67._16_4_ = auVar138._16_4_ * -auVar152._16_4_;
            auVar67._20_4_ = auVar138._20_4_ * -auVar152._20_4_;
            auVar67._24_4_ = auVar138._24_4_ * -auVar152._24_4_;
            auVar67._28_4_ = auVar153._28_4_;
            auVar126 = vmulps_avx512vl(auVar138,auVar133);
            auVar138 = vfmadd213ps_avx512vl(auVar154,auVar154,auVar133);
            auVar138 = vfmadd231ps_avx512vl(auVar138,auVar155,auVar155);
            auVar135 = vrsqrt14ps_avx512vl(auVar138);
            auVar138 = vmulps_avx512vl(auVar138,auVar233);
            fVar201 = auVar135._0_4_;
            fVar173 = auVar135._4_4_;
            fVar212 = auVar135._8_4_;
            fVar213 = auVar135._12_4_;
            fVar194 = auVar135._16_4_;
            fVar200 = auVar135._20_4_;
            fVar112 = auVar135._24_4_;
            auVar68._4_4_ = fVar173 * fVar173 * fVar173 * auVar138._4_4_;
            auVar68._0_4_ = fVar201 * fVar201 * fVar201 * auVar138._0_4_;
            auVar68._8_4_ = fVar212 * fVar212 * fVar212 * auVar138._8_4_;
            auVar68._12_4_ = fVar213 * fVar213 * fVar213 * auVar138._12_4_;
            auVar68._16_4_ = fVar194 * fVar194 * fVar194 * auVar138._16_4_;
            auVar68._20_4_ = fVar200 * fVar200 * fVar200 * auVar138._20_4_;
            auVar68._24_4_ = fVar112 * fVar112 * fVar112 * auVar138._24_4_;
            auVar68._28_4_ = auVar138._28_4_;
            auVar138 = vfmadd231ps_avx512vl(auVar68,auVar136,auVar135);
            auVar69._4_4_ = auVar155._4_4_ * auVar138._4_4_;
            auVar69._0_4_ = auVar155._0_4_ * auVar138._0_4_;
            auVar69._8_4_ = auVar155._8_4_ * auVar138._8_4_;
            auVar69._12_4_ = auVar155._12_4_ * auVar138._12_4_;
            auVar69._16_4_ = auVar155._16_4_ * auVar138._16_4_;
            auVar69._20_4_ = auVar155._20_4_ * auVar138._20_4_;
            auVar69._24_4_ = auVar155._24_4_ * auVar138._24_4_;
            auVar69._28_4_ = auVar135._28_4_;
            auVar70._4_4_ = auVar138._4_4_ * auVar137._4_4_;
            auVar70._0_4_ = auVar138._0_4_ * auVar137._0_4_;
            auVar70._8_4_ = auVar138._8_4_ * auVar137._8_4_;
            auVar70._12_4_ = auVar138._12_4_ * auVar137._12_4_;
            auVar70._16_4_ = auVar138._16_4_ * auVar137._16_4_;
            auVar70._20_4_ = auVar138._20_4_ * auVar137._20_4_;
            auVar70._24_4_ = auVar138._24_4_ * auVar137._24_4_;
            auVar70._28_4_ = auVar137._28_4_;
            auVar137 = vmulps_avx512vl(auVar138,auVar133);
            auVar114 = vfmadd213ps_fma(auVar66,ZEXT1632(auVar117),auVar131);
            auVar138 = ZEXT1632(auVar117);
            auVar121 = vfmadd213ps_fma(auVar67,auVar138,auVar122);
            auVar136 = vfmadd213ps_avx512vl(auVar126,auVar138,auVar129);
            auVar135 = vfmadd213ps_avx512vl(auVar69,ZEXT1632(auVar116),auVar123);
            auVar118 = vfnmadd213ps_fma(auVar66,auVar138,auVar131);
            auVar134 = ZEXT1632(auVar116);
            auVar237 = vfmadd213ps_fma(auVar70,auVar134,auVar132);
            auVar119 = vfnmadd213ps_fma(auVar67,auVar138,auVar122);
            auVar6 = vfmadd213ps_fma(auVar137,auVar134,auVar128);
            auVar122 = ZEXT1632(auVar117);
            auVar223 = vfnmadd231ps_fma(auVar129,auVar122,auVar126);
            auVar195 = vfnmadd213ps_fma(auVar69,auVar134,auVar123);
            auVar196 = vfnmadd213ps_fma(auVar70,auVar134,auVar132);
            auVar120 = vfnmadd231ps_fma(auVar128,ZEXT1632(auVar116),auVar137);
            auVar128 = vsubps_avx512vl(auVar135,ZEXT1632(auVar118));
            auVar137 = vsubps_avx(ZEXT1632(auVar237),ZEXT1632(auVar119));
            auVar138 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar223));
            auVar71._4_4_ = auVar137._4_4_ * auVar223._4_4_;
            auVar71._0_4_ = auVar137._0_4_ * auVar223._0_4_;
            auVar71._8_4_ = auVar137._8_4_ * auVar223._8_4_;
            auVar71._12_4_ = auVar137._12_4_ * auVar223._12_4_;
            auVar71._16_4_ = auVar137._16_4_ * 0.0;
            auVar71._20_4_ = auVar137._20_4_ * 0.0;
            auVar71._24_4_ = auVar137._24_4_ * 0.0;
            auVar71._28_4_ = auVar126._28_4_;
            auVar117 = vfmsub231ps_fma(auVar71,ZEXT1632(auVar119),auVar138);
            auVar72._4_4_ = auVar138._4_4_ * auVar118._4_4_;
            auVar72._0_4_ = auVar138._0_4_ * auVar118._0_4_;
            auVar72._8_4_ = auVar138._8_4_ * auVar118._8_4_;
            auVar72._12_4_ = auVar138._12_4_ * auVar118._12_4_;
            auVar72._16_4_ = auVar138._16_4_ * 0.0;
            auVar72._20_4_ = auVar138._20_4_ * 0.0;
            auVar72._24_4_ = auVar138._24_4_ * 0.0;
            auVar72._28_4_ = auVar138._28_4_;
            auVar7 = vfmsub231ps_fma(auVar72,ZEXT1632(auVar223),auVar128);
            auVar73._4_4_ = auVar119._4_4_ * auVar128._4_4_;
            auVar73._0_4_ = auVar119._0_4_ * auVar128._0_4_;
            auVar73._8_4_ = auVar119._8_4_ * auVar128._8_4_;
            auVar73._12_4_ = auVar119._12_4_ * auVar128._12_4_;
            auVar73._16_4_ = auVar128._16_4_ * 0.0;
            auVar73._20_4_ = auVar128._20_4_ * 0.0;
            auVar73._24_4_ = auVar128._24_4_ * 0.0;
            auVar73._28_4_ = auVar128._28_4_;
            auVar115 = vfmsub231ps_fma(auVar73,ZEXT1632(auVar118),auVar137);
            auVar137 = vfmadd231ps_avx512vl(ZEXT1632(auVar115),auVar133,ZEXT1632(auVar7));
            auVar137 = vfmadd231ps_avx512vl(auVar137,auVar133,ZEXT1632(auVar117));
            uVar103 = vcmpps_avx512vl(auVar137,auVar133,2);
            bVar111 = (byte)uVar103;
            fVar165 = (float)((uint)(bVar111 & 1) * auVar114._0_4_ |
                             (uint)!(bool)(bVar111 & 1) * auVar195._0_4_);
            bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
            fVar167 = (float)((uint)bVar14 * auVar114._4_4_ | (uint)!bVar14 * auVar195._4_4_);
            bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
            fVar170 = (float)((uint)bVar14 * auVar114._8_4_ | (uint)!bVar14 * auVar195._8_4_);
            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
            fVar171 = (float)((uint)bVar14 * auVar114._12_4_ | (uint)!bVar14 * auVar195._12_4_);
            auVar134 = ZEXT1632(CONCAT412(fVar171,CONCAT48(fVar170,CONCAT44(fVar167,fVar165))));
            fVar166 = (float)((uint)(bVar111 & 1) * auVar121._0_4_ |
                             (uint)!(bool)(bVar111 & 1) * auVar196._0_4_);
            bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
            fVar169 = (float)((uint)bVar14 * auVar121._4_4_ | (uint)!bVar14 * auVar196._4_4_);
            bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
            fVar168 = (float)((uint)bVar14 * auVar121._8_4_ | (uint)!bVar14 * auVar196._8_4_);
            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
            fVar172 = (float)((uint)bVar14 * auVar121._12_4_ | (uint)!bVar14 * auVar196._12_4_);
            auVar124 = ZEXT1632(CONCAT412(fVar172,CONCAT48(fVar168,CONCAT44(fVar169,fVar166))));
            auVar156._0_4_ =
                 (float)((uint)(bVar111 & 1) * auVar136._0_4_ |
                        (uint)!(bool)(bVar111 & 1) * auVar120._0_4_);
            bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
            auVar156._4_4_ = (float)((uint)bVar14 * auVar136._4_4_ | (uint)!bVar14 * auVar120._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
            auVar156._8_4_ = (float)((uint)bVar14 * auVar136._8_4_ | (uint)!bVar14 * auVar120._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
            auVar156._12_4_ =
                 (float)((uint)bVar14 * auVar136._12_4_ | (uint)!bVar14 * auVar120._12_4_);
            fVar201 = (float)((uint)((byte)(uVar103 >> 4) & 1) * auVar136._16_4_);
            auVar156._16_4_ = fVar201;
            fVar173 = (float)((uint)((byte)(uVar103 >> 5) & 1) * auVar136._20_4_);
            auVar156._20_4_ = fVar173;
            fVar212 = (float)((uint)((byte)(uVar103 >> 6) & 1) * auVar136._24_4_);
            auVar156._24_4_ = fVar212;
            iVar1 = (uint)(byte)(uVar103 >> 7) * auVar136._28_4_;
            auVar156._28_4_ = iVar1;
            auVar137 = vblendmps_avx512vl(ZEXT1632(auVar118),auVar135);
            auVar157._0_4_ =
                 (uint)(bVar111 & 1) * auVar137._0_4_ | (uint)!(bool)(bVar111 & 1) * auVar117._0_4_;
            bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
            auVar157._4_4_ = (uint)bVar14 * auVar137._4_4_ | (uint)!bVar14 * auVar117._4_4_;
            bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
            auVar157._8_4_ = (uint)bVar14 * auVar137._8_4_ | (uint)!bVar14 * auVar117._8_4_;
            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
            auVar157._12_4_ = (uint)bVar14 * auVar137._12_4_ | (uint)!bVar14 * auVar117._12_4_;
            auVar157._16_4_ = (uint)((byte)(uVar103 >> 4) & 1) * auVar137._16_4_;
            auVar157._20_4_ = (uint)((byte)(uVar103 >> 5) & 1) * auVar137._20_4_;
            auVar157._24_4_ = (uint)((byte)(uVar103 >> 6) & 1) * auVar137._24_4_;
            auVar157._28_4_ = (uint)(byte)(uVar103 >> 7) * auVar137._28_4_;
            auVar137 = vblendmps_avx512vl(ZEXT1632(auVar119),ZEXT1632(auVar237));
            auVar158._0_4_ =
                 (float)((uint)(bVar111 & 1) * auVar137._0_4_ |
                        (uint)!(bool)(bVar111 & 1) * auVar114._0_4_);
            bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
            auVar158._4_4_ = (float)((uint)bVar14 * auVar137._4_4_ | (uint)!bVar14 * auVar114._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
            auVar158._8_4_ = (float)((uint)bVar14 * auVar137._8_4_ | (uint)!bVar14 * auVar114._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
            auVar158._12_4_ =
                 (float)((uint)bVar14 * auVar137._12_4_ | (uint)!bVar14 * auVar114._12_4_);
            fVar194 = (float)((uint)((byte)(uVar103 >> 4) & 1) * auVar137._16_4_);
            auVar158._16_4_ = fVar194;
            fVar200 = (float)((uint)((byte)(uVar103 >> 5) & 1) * auVar137._20_4_);
            auVar158._20_4_ = fVar200;
            fVar213 = (float)((uint)((byte)(uVar103 >> 6) & 1) * auVar137._24_4_);
            auVar158._24_4_ = fVar213;
            auVar158._28_4_ = (uint)(byte)(uVar103 >> 7) * auVar137._28_4_;
            auVar137 = vblendmps_avx512vl(ZEXT1632(auVar223),ZEXT1632(auVar6));
            auVar159._0_4_ =
                 (float)((uint)(bVar111 & 1) * auVar137._0_4_ |
                        (uint)!(bool)(bVar111 & 1) * auVar121._0_4_);
            bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
            auVar159._4_4_ = (float)((uint)bVar14 * auVar137._4_4_ | (uint)!bVar14 * auVar121._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
            auVar159._8_4_ = (float)((uint)bVar14 * auVar137._8_4_ | (uint)!bVar14 * auVar121._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
            auVar159._12_4_ =
                 (float)((uint)bVar14 * auVar137._12_4_ | (uint)!bVar14 * auVar121._12_4_);
            fVar193 = (float)((uint)((byte)(uVar103 >> 4) & 1) * auVar137._16_4_);
            auVar159._16_4_ = fVar193;
            fVar112 = (float)((uint)((byte)(uVar103 >> 5) & 1) * auVar137._20_4_);
            auVar159._20_4_ = fVar112;
            fVar113 = (float)((uint)((byte)(uVar103 >> 6) & 1) * auVar137._24_4_);
            auVar159._24_4_ = fVar113;
            iVar2 = (uint)(byte)(uVar103 >> 7) * auVar137._28_4_;
            auVar159._28_4_ = iVar2;
            auVar160._0_4_ =
                 (uint)(bVar111 & 1) * (int)auVar118._0_4_ |
                 (uint)!(bool)(bVar111 & 1) * auVar135._0_4_;
            bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
            auVar160._4_4_ = (uint)bVar14 * (int)auVar118._4_4_ | (uint)!bVar14 * auVar135._4_4_;
            bVar14 = (bool)((byte)(uVar103 >> 2) & 1);
            auVar160._8_4_ = (uint)bVar14 * (int)auVar118._8_4_ | (uint)!bVar14 * auVar135._8_4_;
            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
            auVar160._12_4_ = (uint)bVar14 * (int)auVar118._12_4_ | (uint)!bVar14 * auVar135._12_4_;
            auVar160._16_4_ = (uint)!(bool)((byte)(uVar103 >> 4) & 1) * auVar135._16_4_;
            auVar160._20_4_ = (uint)!(bool)((byte)(uVar103 >> 5) & 1) * auVar135._20_4_;
            auVar160._24_4_ = (uint)!(bool)((byte)(uVar103 >> 6) & 1) * auVar135._24_4_;
            auVar160._28_4_ = (uint)!SUB81(uVar103 >> 7,0) * auVar135._28_4_;
            bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar103 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar103 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar103 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar103 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar103 >> 3) & 1);
            auVar135 = vsubps_avx512vl(auVar160,auVar134);
            auVar138 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar119._12_4_ |
                                                     (uint)!bVar18 * auVar237._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar119._8_4_ |
                                                              (uint)!bVar16 * auVar237._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar119._4_4_ |
                                                                       (uint)!bVar14 *
                                                                       auVar237._4_4_,
                                                                       (uint)(bVar111 & 1) *
                                                                       (int)auVar119._0_4_ |
                                                                       (uint)!(bool)(bVar111 & 1) *
                                                                       auVar237._0_4_)))),auVar124);
            auVar136 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar223._12_4_ |
                                                     (uint)!bVar19 * auVar6._12_4_,
                                                     CONCAT48((uint)bVar17 * (int)auVar223._8_4_ |
                                                              (uint)!bVar17 * auVar6._8_4_,
                                                              CONCAT44((uint)bVar15 *
                                                                       (int)auVar223._4_4_ |
                                                                       (uint)!bVar15 * auVar6._4_4_,
                                                                       (uint)(bVar111 & 1) *
                                                                       (int)auVar223._0_4_ |
                                                                       (uint)!(bool)(bVar111 & 1) *
                                                                       auVar6._0_4_)))),auVar156);
            auVar126 = vsubps_avx(auVar134,auVar157);
            auVar128 = vsubps_avx(auVar124,auVar158);
            auVar129 = vsubps_avx(auVar156,auVar159);
            auVar74._4_4_ = auVar136._4_4_ * fVar167;
            auVar74._0_4_ = auVar136._0_4_ * fVar165;
            auVar74._8_4_ = auVar136._8_4_ * fVar170;
            auVar74._12_4_ = auVar136._12_4_ * fVar171;
            auVar74._16_4_ = auVar136._16_4_ * 0.0;
            auVar74._20_4_ = auVar136._20_4_ * 0.0;
            auVar74._24_4_ = auVar136._24_4_ * 0.0;
            auVar74._28_4_ = 0;
            auVar117 = vfmsub231ps_fma(auVar74,auVar156,auVar135);
            auVar198._0_4_ = fVar166 * auVar135._0_4_;
            auVar198._4_4_ = fVar169 * auVar135._4_4_;
            auVar198._8_4_ = fVar168 * auVar135._8_4_;
            auVar198._12_4_ = fVar172 * auVar135._12_4_;
            auVar198._16_4_ = auVar135._16_4_ * 0.0;
            auVar198._20_4_ = auVar135._20_4_ * 0.0;
            auVar198._24_4_ = auVar135._24_4_ * 0.0;
            auVar198._28_4_ = 0;
            auVar114 = vfmsub231ps_fma(auVar198,auVar134,auVar138);
            auVar137 = vfmadd231ps_avx512vl(ZEXT1632(auVar114),auVar133,ZEXT1632(auVar117));
            auVar210._0_4_ = auVar138._0_4_ * auVar156._0_4_;
            auVar210._4_4_ = auVar138._4_4_ * auVar156._4_4_;
            auVar210._8_4_ = auVar138._8_4_ * auVar156._8_4_;
            auVar210._12_4_ = auVar138._12_4_ * auVar156._12_4_;
            auVar210._16_4_ = auVar138._16_4_ * fVar201;
            auVar210._20_4_ = auVar138._20_4_ * fVar173;
            auVar210._24_4_ = auVar138._24_4_ * fVar212;
            auVar210._28_4_ = 0;
            auVar117 = vfmsub231ps_fma(auVar210,auVar124,auVar136);
            auVar130 = vfmadd231ps_avx512vl(auVar137,auVar133,ZEXT1632(auVar117));
            auVar137 = vmulps_avx512vl(auVar129,auVar157);
            auVar137 = vfmsub231ps_avx512vl(auVar137,auVar126,auVar159);
            auVar75._4_4_ = auVar128._4_4_ * auVar159._4_4_;
            auVar75._0_4_ = auVar128._0_4_ * auVar159._0_4_;
            auVar75._8_4_ = auVar128._8_4_ * auVar159._8_4_;
            auVar75._12_4_ = auVar128._12_4_ * auVar159._12_4_;
            auVar75._16_4_ = auVar128._16_4_ * fVar193;
            auVar75._20_4_ = auVar128._20_4_ * fVar112;
            auVar75._24_4_ = auVar128._24_4_ * fVar113;
            auVar75._28_4_ = iVar2;
            auVar117 = vfmsub231ps_fma(auVar75,auVar158,auVar129);
            auVar211._0_4_ = auVar158._0_4_ * auVar126._0_4_;
            auVar211._4_4_ = auVar158._4_4_ * auVar126._4_4_;
            auVar211._8_4_ = auVar158._8_4_ * auVar126._8_4_;
            auVar211._12_4_ = auVar158._12_4_ * auVar126._12_4_;
            auVar211._16_4_ = fVar194 * auVar126._16_4_;
            auVar211._20_4_ = fVar200 * auVar126._20_4_;
            auVar211._24_4_ = fVar213 * auVar126._24_4_;
            auVar211._28_4_ = 0;
            auVar114 = vfmsub231ps_fma(auVar211,auVar128,auVar157);
            auVar137 = vfmadd231ps_avx512vl(ZEXT1632(auVar114),auVar133,auVar137);
            auVar131 = vfmadd231ps_avx512vl(auVar137,auVar133,ZEXT1632(auVar117));
            auVar137 = vmaxps_avx(auVar130,auVar131);
            uVar175 = vcmpps_avx512vl(auVar137,auVar133,2);
            local_670 = local_670 & (byte)uVar175;
            auVar164 = ZEXT3264(auVar219);
            if (local_670 == 0) {
LAB_01d5b46a:
              local_670 = 0;
            }
            else {
              auVar76._4_4_ = auVar129._4_4_ * auVar138._4_4_;
              auVar76._0_4_ = auVar129._0_4_ * auVar138._0_4_;
              auVar76._8_4_ = auVar129._8_4_ * auVar138._8_4_;
              auVar76._12_4_ = auVar129._12_4_ * auVar138._12_4_;
              auVar76._16_4_ = auVar129._16_4_ * auVar138._16_4_;
              auVar76._20_4_ = auVar129._20_4_ * auVar138._20_4_;
              auVar76._24_4_ = auVar129._24_4_ * auVar138._24_4_;
              auVar76._28_4_ = auVar137._28_4_;
              auVar121 = vfmsub231ps_fma(auVar76,auVar128,auVar136);
              auVar77._4_4_ = auVar136._4_4_ * auVar126._4_4_;
              auVar77._0_4_ = auVar136._0_4_ * auVar126._0_4_;
              auVar77._8_4_ = auVar136._8_4_ * auVar126._8_4_;
              auVar77._12_4_ = auVar136._12_4_ * auVar126._12_4_;
              auVar77._16_4_ = auVar136._16_4_ * auVar126._16_4_;
              auVar77._20_4_ = auVar136._20_4_ * auVar126._20_4_;
              auVar77._24_4_ = auVar136._24_4_ * auVar126._24_4_;
              auVar77._28_4_ = auVar136._28_4_;
              auVar114 = vfmsub231ps_fma(auVar77,auVar135,auVar129);
              auVar78._4_4_ = auVar128._4_4_ * auVar135._4_4_;
              auVar78._0_4_ = auVar128._0_4_ * auVar135._0_4_;
              auVar78._8_4_ = auVar128._8_4_ * auVar135._8_4_;
              auVar78._12_4_ = auVar128._12_4_ * auVar135._12_4_;
              auVar78._16_4_ = auVar128._16_4_ * auVar135._16_4_;
              auVar78._20_4_ = auVar128._20_4_ * auVar135._20_4_;
              auVar78._24_4_ = auVar128._24_4_ * auVar135._24_4_;
              auVar78._28_4_ = auVar128._28_4_;
              auVar237 = vfmsub231ps_fma(auVar78,auVar126,auVar138);
              auVar117 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar114),ZEXT1632(auVar237));
              auVar137 = vfmadd231ps_avx512vl(ZEXT1632(auVar117),ZEXT1632(auVar121),auVar133);
              auVar138 = vrcp14ps_avx512vl(auVar137);
              auVar40._8_4_ = 0x3f800000;
              auVar40._0_8_ = &DAT_3f8000003f800000;
              auVar40._12_4_ = 0x3f800000;
              auVar40._16_4_ = 0x3f800000;
              auVar40._20_4_ = 0x3f800000;
              auVar40._24_4_ = 0x3f800000;
              auVar40._28_4_ = 0x3f800000;
              auVar136 = vfnmadd213ps_avx512vl(auVar138,auVar137,auVar40);
              auVar117 = vfmadd132ps_fma(auVar136,auVar138,auVar138);
              auVar79._4_4_ = auVar237._4_4_ * auVar156._4_4_;
              auVar79._0_4_ = auVar237._0_4_ * auVar156._0_4_;
              auVar79._8_4_ = auVar237._8_4_ * auVar156._8_4_;
              auVar79._12_4_ = auVar237._12_4_ * auVar156._12_4_;
              auVar79._16_4_ = fVar201 * 0.0;
              auVar79._20_4_ = fVar173 * 0.0;
              auVar79._24_4_ = fVar212 * 0.0;
              auVar79._28_4_ = iVar1;
              auVar114 = vfmadd231ps_fma(auVar79,auVar124,ZEXT1632(auVar114));
              auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar134,ZEXT1632(auVar121));
              fVar201 = auVar117._0_4_;
              fVar173 = auVar117._4_4_;
              fVar212 = auVar117._8_4_;
              fVar213 = auVar117._12_4_;
              auVar138 = ZEXT1632(CONCAT412(auVar114._12_4_ * fVar213,
                                            CONCAT48(auVar114._8_4_ * fVar212,
                                                     CONCAT44(auVar114._4_4_ * fVar173,
                                                              auVar114._0_4_ * fVar201))));
              auVar100._4_4_ = uStack_7bc;
              auVar100._0_4_ = local_7c0;
              auVar100._8_4_ = uStack_7b8;
              auVar100._12_4_ = uStack_7b4;
              auVar100._16_4_ = uStack_7b0;
              auVar100._20_4_ = uStack_7ac;
              auVar100._24_4_ = uStack_7a8;
              auVar100._28_4_ = uStack_7a4;
              uVar175 = vcmpps_avx512vl(auVar138,auVar100,0xd);
              uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar41._4_4_ = uVar174;
              auVar41._0_4_ = uVar174;
              auVar41._8_4_ = uVar174;
              auVar41._12_4_ = uVar174;
              auVar41._16_4_ = uVar174;
              auVar41._20_4_ = uVar174;
              auVar41._24_4_ = uVar174;
              auVar41._28_4_ = uVar174;
              uVar29 = vcmpps_avx512vl(auVar138,auVar41,2);
              local_670 = (byte)uVar175 & (byte)uVar29 & local_670;
              if (local_670 == 0) goto LAB_01d5b46a;
              uVar175 = vcmpps_avx512vl(auVar137,auVar133,4);
              if ((local_670 & (byte)uVar175) == 0) {
                local_670 = 0;
              }
              else {
                local_670 = local_670 & (byte)uVar175;
                fVar194 = auVar130._0_4_ * fVar201;
                fVar200 = auVar130._4_4_ * fVar173;
                auVar80._4_4_ = fVar200;
                auVar80._0_4_ = fVar194;
                fVar112 = auVar130._8_4_ * fVar212;
                auVar80._8_4_ = fVar112;
                fVar113 = auVar130._12_4_ * fVar213;
                auVar80._12_4_ = fVar113;
                fVar193 = auVar130._16_4_ * 0.0;
                auVar80._16_4_ = fVar193;
                fVar165 = auVar130._20_4_ * 0.0;
                auVar80._20_4_ = fVar165;
                fVar166 = auVar130._24_4_ * 0.0;
                auVar80._24_4_ = fVar166;
                auVar80._28_4_ = auVar130._28_4_;
                fVar201 = auVar131._0_4_ * fVar201;
                fVar173 = auVar131._4_4_ * fVar173;
                auVar81._4_4_ = fVar173;
                auVar81._0_4_ = fVar201;
                fVar212 = auVar131._8_4_ * fVar212;
                auVar81._8_4_ = fVar212;
                fVar213 = auVar131._12_4_ * fVar213;
                auVar81._12_4_ = fVar213;
                fVar167 = auVar131._16_4_ * 0.0;
                auVar81._16_4_ = fVar167;
                fVar169 = auVar131._20_4_ * 0.0;
                auVar81._20_4_ = fVar169;
                fVar170 = auVar131._24_4_ * 0.0;
                auVar81._24_4_ = fVar170;
                auVar81._28_4_ = auVar131._28_4_;
                auVar217._8_4_ = 0x3f800000;
                auVar217._0_8_ = &DAT_3f8000003f800000;
                auVar217._12_4_ = 0x3f800000;
                auVar217._16_4_ = 0x3f800000;
                auVar217._20_4_ = 0x3f800000;
                auVar217._24_4_ = 0x3f800000;
                auVar217._28_4_ = 0x3f800000;
                auVar137 = vsubps_avx512vl(auVar217,auVar80);
                bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar103 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar103 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar103 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar103 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar103 >> 6) & 1);
                bVar20 = SUB81(uVar103 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar20 * auVar130._28_4_ |
                                              (uint)!bVar20 * auVar137._28_4_,
                                              CONCAT424((uint)bVar19 * (int)fVar166 |
                                                        (uint)!bVar19 * auVar137._24_4_,
                                                        CONCAT420((uint)bVar18 * (int)fVar165 |
                                                                  (uint)!bVar18 * auVar137._20_4_,
                                                                  CONCAT416((uint)bVar17 *
                                                                            (int)fVar193 |
                                                                            (uint)!bVar17 *
                                                                            auVar137._16_4_,
                                                                            CONCAT412((uint)bVar16 *
                                                                                      (int)fVar113 |
                                                                                      (uint)!bVar16
                                                                                      * auVar137.
                                                  _12_4_,CONCAT48((uint)bVar15 * (int)fVar112 |
                                                                  (uint)!bVar15 * auVar137._8_4_,
                                                                  CONCAT44((uint)bVar14 *
                                                                           (int)fVar200 |
                                                                           (uint)!bVar14 *
                                                                           auVar137._4_4_,
                                                                           (uint)(bVar111 & 1) *
                                                                           (int)fVar194 |
                                                                           (uint)!(bool)(bVar111 & 1
                                                                                        ) *
                                                                           auVar137._0_4_))))))));
                auVar137 = vsubps_avx(auVar217,auVar81);
                bVar14 = (bool)((byte)(uVar103 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar103 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar103 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar103 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar103 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar103 >> 6) & 1);
                bVar20 = SUB81(uVar103 >> 7,0);
                local_5c0._4_4_ = (uint)bVar14 * (int)fVar173 | (uint)!bVar14 * auVar137._4_4_;
                local_5c0._0_4_ =
                     (uint)(bVar111 & 1) * (int)fVar201 |
                     (uint)!(bool)(bVar111 & 1) * auVar137._0_4_;
                local_5c0._8_4_ = (uint)bVar15 * (int)fVar212 | (uint)!bVar15 * auVar137._8_4_;
                local_5c0._12_4_ = (uint)bVar16 * (int)fVar213 | (uint)!bVar16 * auVar137._12_4_;
                local_5c0._16_4_ = (uint)bVar17 * (int)fVar167 | (uint)!bVar17 * auVar137._16_4_;
                local_5c0._20_4_ = (uint)bVar18 * (int)fVar169 | (uint)!bVar18 * auVar137._20_4_;
                local_5c0._24_4_ = (uint)bVar19 * (int)fVar170 | (uint)!bVar19 * auVar137._24_4_;
                local_5c0._28_4_ = (uint)bVar20 * auVar131._28_4_ | (uint)!bVar20 * auVar137._28_4_;
                in_ZMM21 = ZEXT3264(auVar138);
              }
            }
            auVar234 = ZEXT3264(local_900);
            if (local_670 != 0) {
              auVar137 = vsubps_avx(ZEXT1632(auVar116),auVar122);
              local_840 = in_ZMM20._0_32_;
              auVar137 = vfmadd213ps_avx512vl(auVar137,local_840,auVar122);
              auVar182._0_4_ = auVar137._0_4_ + auVar137._0_4_;
              auVar182._4_4_ = auVar137._4_4_ + auVar137._4_4_;
              auVar182._8_4_ = auVar137._8_4_ + auVar137._8_4_;
              auVar182._12_4_ = auVar137._12_4_ + auVar137._12_4_;
              auVar182._16_4_ = auVar137._16_4_ + auVar137._16_4_;
              auVar182._20_4_ = auVar137._20_4_ + auVar137._20_4_;
              auVar182._24_4_ = auVar137._24_4_ + auVar137._24_4_;
              auVar182._28_4_ = auVar137._28_4_ + auVar137._28_4_;
              uVar174 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar42._4_4_ = uVar174;
              auVar42._0_4_ = uVar174;
              auVar42._8_4_ = uVar174;
              auVar42._12_4_ = uVar174;
              auVar42._16_4_ = uVar174;
              auVar42._20_4_ = uVar174;
              auVar42._24_4_ = uVar174;
              auVar42._28_4_ = uVar174;
              auVar137 = vmulps_avx512vl(auVar182,auVar42);
              local_860 = in_ZMM21._0_32_;
              uVar175 = vcmpps_avx512vl(local_860,auVar137,6);
              local_670 = local_670 & (byte)uVar175;
              if (local_670 != 0) {
                auVar183._8_4_ = 0xbf800000;
                auVar183._0_8_ = 0xbf800000bf800000;
                auVar183._12_4_ = 0xbf800000;
                auVar183._16_4_ = 0xbf800000;
                auVar183._20_4_ = 0xbf800000;
                auVar183._24_4_ = 0xbf800000;
                auVar183._28_4_ = 0xbf800000;
                auVar43._8_4_ = 0x40000000;
                auVar43._0_8_ = 0x4000000040000000;
                auVar43._12_4_ = 0x40000000;
                auVar43._16_4_ = 0x40000000;
                auVar43._20_4_ = 0x40000000;
                auVar43._24_4_ = 0x40000000;
                auVar43._28_4_ = 0x40000000;
                local_700 = vfmadd132ps_avx512vl(local_5c0,auVar183,auVar43);
                local_5c0 = local_700;
                auVar137 = local_5c0;
                local_6c0 = (undefined4)lVar108;
                local_6a0 = local_8b0._0_8_;
                uStack_698 = local_8b0._8_8_;
                local_690 = local_8c0._0_8_;
                uStack_688 = local_8c0._8_8_;
                local_680 = local_8d0;
                uStack_678 = uStack_8c8;
                pGVar11 = (context->scene->geometries).items[uVar109].ptr;
                local_5c0 = auVar137;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  auVar137 = vaddps_avx512vl(local_840,_DAT_02020f40);
                  auVar117 = vcvtsi2ss_avx512f(auVar235._0_16_,local_6c0);
                  fVar201 = auVar117._0_4_;
                  local_660[0] = (fVar201 + auVar137._0_4_) * (float)local_7e0._0_4_;
                  local_660[1] = (fVar201 + auVar137._4_4_) * (float)local_7e0._4_4_;
                  local_660[2] = (fVar201 + auVar137._8_4_) * fStack_7d8;
                  local_660[3] = (fVar201 + auVar137._12_4_) * fStack_7d4;
                  fStack_650 = (fVar201 + auVar137._16_4_) * fStack_7d0;
                  fStack_64c = (fVar201 + auVar137._20_4_) * fStack_7cc;
                  fStack_648 = (fVar201 + auVar137._24_4_) * fStack_7c8;
                  fStack_644 = fVar201 + auVar137._28_4_;
                  local_5c0._0_8_ = local_700._0_8_;
                  local_5c0._8_8_ = local_700._8_8_;
                  local_5c0._16_8_ = local_700._16_8_;
                  local_5c0._24_8_ = local_700._24_8_;
                  local_640 = local_5c0._0_8_;
                  uStack_638 = local_5c0._8_8_;
                  uStack_630 = local_5c0._16_8_;
                  uStack_628 = local_5c0._24_8_;
                  local_620 = local_860;
                  auVar184._8_4_ = 0x7f800000;
                  auVar184._0_8_ = 0x7f8000007f800000;
                  auVar184._12_4_ = 0x7f800000;
                  auVar184._16_4_ = 0x7f800000;
                  auVar184._20_4_ = 0x7f800000;
                  auVar184._24_4_ = 0x7f800000;
                  auVar184._28_4_ = 0x7f800000;
                  auVar137 = vblendmps_avx512vl(auVar184,local_860);
                  auVar161._0_4_ =
                       (uint)(local_670 & 1) * auVar137._0_4_ |
                       (uint)!(bool)(local_670 & 1) * 0x7f800000;
                  bVar14 = (bool)(local_670 >> 1 & 1);
                  auVar161._4_4_ = (uint)bVar14 * auVar137._4_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_670 >> 2 & 1);
                  auVar161._8_4_ = (uint)bVar14 * auVar137._8_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_670 >> 3 & 1);
                  auVar161._12_4_ = (uint)bVar14 * auVar137._12_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_670 >> 4 & 1);
                  auVar161._16_4_ = (uint)bVar14 * auVar137._16_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_670 >> 5 & 1);
                  auVar161._20_4_ = (uint)bVar14 * auVar137._20_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_670 >> 6 & 1);
                  auVar161._24_4_ = (uint)bVar14 * auVar137._24_4_ | (uint)!bVar14 * 0x7f800000;
                  auVar161._28_4_ =
                       (uint)(local_670 >> 7) * auVar137._28_4_ |
                       (uint)!(bool)(local_670 >> 7) * 0x7f800000;
                  auVar137 = vshufps_avx(auVar161,auVar161,0xb1);
                  auVar137 = vminps_avx(auVar161,auVar137);
                  auVar138 = vshufpd_avx(auVar137,auVar137,5);
                  auVar137 = vminps_avx(auVar137,auVar138);
                  auVar138 = vpermpd_avx2(auVar137,0x4e);
                  auVar137 = vminps_avx(auVar137,auVar138);
                  uVar175 = vcmpps_avx512vl(auVar161,auVar137,0);
                  bVar102 = (byte)uVar175 & local_670;
                  bVar111 = local_670;
                  if (bVar102 != 0) {
                    bVar111 = bVar102;
                  }
                  uVar224 = 0;
                  for (uVar105 = (uint)bVar111; (uVar105 & 1) == 0;
                      uVar105 = uVar105 >> 1 | 0x80000000) {
                    uVar224 = uVar224 + 1;
                  }
                  uVar103 = (ulong)uVar224;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar201 = local_660[uVar103];
                    uVar174 = *(undefined4 *)((long)&local_640 + uVar103 * 4);
                    fVar173 = 1.0 - fVar201;
                    auVar32._8_4_ = 0x80000000;
                    auVar32._0_8_ = 0x8000000080000000;
                    auVar32._12_4_ = 0x80000000;
                    auVar114 = vxorps_avx512vl(ZEXT416((uint)fVar173),auVar32);
                    auVar117 = ZEXT416((uint)(fVar201 * fVar173 * 4.0));
                    auVar116 = vfnmsub213ss_fma(ZEXT416((uint)fVar201),ZEXT416((uint)fVar201),
                                                auVar117);
                    auVar117 = vfmadd213ss_fma(ZEXT416((uint)fVar173),ZEXT416((uint)fVar173),
                                               auVar117);
                    fVar173 = fVar173 * auVar114._0_4_ * 0.5;
                    fVar212 = auVar116._0_4_ * 0.5;
                    fVar213 = auVar117._0_4_ * 0.5;
                    fVar194 = fVar201 * fVar201 * 0.5;
                    auVar204._0_4_ = fVar194 * (float)local_8d0._0_4_;
                    auVar204._4_4_ = fVar194 * (float)local_8d0._4_4_;
                    auVar204._8_4_ = fVar194 * (float)uStack_8c8;
                    auVar204._12_4_ = fVar194 * uStack_8c8._4_4_;
                    auVar191._4_4_ = fVar213;
                    auVar191._0_4_ = fVar213;
                    auVar191._8_4_ = fVar213;
                    auVar191._12_4_ = fVar213;
                    auVar117 = vfmadd132ps_fma(auVar191,auVar204,local_8c0);
                    auVar205._4_4_ = fVar212;
                    auVar205._0_4_ = fVar212;
                    auVar205._8_4_ = fVar212;
                    auVar205._12_4_ = fVar212;
                    auVar117 = vfmadd132ps_fma(auVar205,auVar117,local_8b0);
                    auVar192._4_4_ = fVar173;
                    auVar192._0_4_ = fVar173;
                    auVar192._8_4_ = fVar173;
                    auVar192._12_4_ = fVar173;
                    auVar117 = vfmadd213ps_fma(auVar192,auVar28,auVar117);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar103 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar117._0_4_;
                    uVar10 = vextractps_avx(auVar117,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar10;
                    uVar10 = vextractps_avx(auVar117,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar10;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar201;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar174;
                    *(undefined4 *)(ray + k * 4 + 0x440) = uVar3;
                    *(uint *)(ray + k * 4 + 0x480) = uVar109;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                  else {
                    local_800 = local_8b0._0_8_;
                    uStack_7f8 = local_8b0._8_8_;
                    local_810 = local_8c0._0_4_;
                    fStack_80c = local_8c0._4_4_;
                    fStack_808 = local_8c0._8_4_;
                    fStack_804 = local_8c0._12_4_;
                    local_550 = local_8d0;
                    uStack_548 = uStack_8c8;
                    local_910 = lVar108;
                    local_720 = local_840;
                    local_6e0 = local_860;
                    local_6bc = iVar9;
                    local_6b0 = auVar28;
                    bVar111 = local_670;
                    do {
                      auVar199 = local_500;
                      local_500._1_3_ = 0;
                      local_500[0] = bVar111;
                      auVar121 = auVar238._0_16_;
                      local_500._4_60_ = auVar199._4_60_;
                      local_7f0 = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_660[uVar103]));
                      local_1c0 = vbroadcastss_avx512f
                                            (ZEXT416(*(uint *)((long)&local_640 + uVar103 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) =
                           *(undefined4 *)(local_620 + uVar103 * 4);
                      local_940.context = context->user;
                      fVar213 = local_200._0_4_;
                      fVar201 = 1.0 - fVar213;
                      auVar33._8_4_ = 0x80000000;
                      auVar33._0_8_ = 0x8000000080000000;
                      auVar33._12_4_ = 0x80000000;
                      auVar114 = vxorps_avx512vl(ZEXT416((uint)fVar201),auVar33);
                      auVar117 = ZEXT416((uint)(fVar213 * fVar201 * 4.0));
                      auVar116 = vfnmsub213ss_fma(local_200._0_16_,local_200._0_16_,auVar117);
                      auVar117 = vfmadd213ss_fma(ZEXT416((uint)fVar201),ZEXT416((uint)fVar201),
                                                 auVar117);
                      fVar201 = fVar201 * auVar114._0_4_ * 0.5;
                      fVar173 = auVar116._0_4_ * 0.5;
                      fVar212 = auVar117._0_4_ * 0.5;
                      fVar213 = fVar213 * fVar213 * 0.5;
                      auVar214._0_4_ = fVar213 * (float)local_550;
                      auVar214._4_4_ = fVar213 * local_550._4_4_;
                      auVar214._8_4_ = fVar213 * (float)uStack_548;
                      auVar214._12_4_ = fVar213 * uStack_548._4_4_;
                      auVar176._4_4_ = fVar212;
                      auVar176._0_4_ = fVar212;
                      auVar176._8_4_ = fVar212;
                      auVar176._12_4_ = fVar212;
                      auVar96._4_4_ = fStack_80c;
                      auVar96._0_4_ = local_810;
                      auVar96._8_4_ = fStack_808;
                      auVar96._12_4_ = fStack_804;
                      auVar117 = vfmadd132ps_fma(auVar176,auVar214,auVar96);
                      auVar206._4_4_ = fVar173;
                      auVar206._0_4_ = fVar173;
                      auVar206._8_4_ = fVar173;
                      auVar206._12_4_ = fVar173;
                      auVar97._8_8_ = uStack_7f8;
                      auVar97._0_8_ = local_800;
                      auVar117 = vfmadd132ps_fma(auVar206,auVar117,auVar97);
                      auVar177._4_4_ = fVar201;
                      auVar177._0_4_ = fVar201;
                      auVar177._8_4_ = fVar201;
                      auVar177._12_4_ = fVar201;
                      auVar117 = vfmadd213ps_fma(auVar177,auVar28,auVar117);
                      auVar199 = vbroadcastss_avx512f(auVar117);
                      auVar220 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar220,ZEXT1664(auVar117));
                      auVar220 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar220,ZEXT1664(auVar117));
                      local_2c0[0] = (RTCHitN)auVar199[0];
                      local_2c0[1] = (RTCHitN)auVar199[1];
                      local_2c0[2] = (RTCHitN)auVar199[2];
                      local_2c0[3] = (RTCHitN)auVar199[3];
                      local_2c0[4] = (RTCHitN)auVar199[4];
                      local_2c0[5] = (RTCHitN)auVar199[5];
                      local_2c0[6] = (RTCHitN)auVar199[6];
                      local_2c0[7] = (RTCHitN)auVar199[7];
                      local_2c0[8] = (RTCHitN)auVar199[8];
                      local_2c0[9] = (RTCHitN)auVar199[9];
                      local_2c0[10] = (RTCHitN)auVar199[10];
                      local_2c0[0xb] = (RTCHitN)auVar199[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar199[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar199[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar199[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar199[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar199[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar199[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar199[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar199[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar199[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar199[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar199[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar199[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar199[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar199[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar199[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar199[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar199[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar199[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar199[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar199[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar199[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar199[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar199[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar199[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar199[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar199[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar199[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar199[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar199[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar199[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar199[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar199[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar199[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar199[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar199[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar199[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar199[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar199[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar199[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar199[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar199[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar199[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar199[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar199[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar199[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar199[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar199[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar199[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar199[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar199[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar199[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar199[0x3f];
                      local_180 = local_4c0._0_8_;
                      uStack_178 = local_4c0._8_8_;
                      uStack_170 = local_4c0._16_8_;
                      uStack_168 = local_4c0._24_8_;
                      uStack_160 = local_4c0._32_8_;
                      uStack_158 = local_4c0._40_8_;
                      uStack_150 = local_4c0._48_8_;
                      uStack_148 = local_4c0._56_8_;
                      auVar199 = vmovdqa64_avx512f(local_540);
                      local_140 = vmovdqa64_avx512f(auVar199);
                      auVar137 = vpcmpeqd_avx2(auVar199._0_32_,auVar199._0_32_);
                      local_908[3] = auVar137;
                      local_908[2] = auVar137;
                      local_908[1] = auVar137;
                      *local_908 = auVar137;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_940.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_940.context)->instPrimID[0]));
                      local_600 = local_300;
                      local_940.valid = (int *)local_600;
                      local_940.geometryUserPtr = pGVar11->userPtr;
                      local_940.hit = local_2c0;
                      local_940.N = 0x10;
                      local_940.ray = (RTCRayN *)ray;
                      if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar11->intersectionFilterN)(&local_940);
                        auVar239 = ZEXT3264(local_8a0);
                        auVar187 = ZEXT3264(local_880);
                        auVar234 = ZEXT3264(local_900);
                        auVar164 = ZEXT3264(local_780);
                        auVar236 = ZEXT3264(local_760);
                        in_ZMM21 = ZEXT3264(local_860);
                        in_ZMM20 = ZEXT3264(local_840);
                        auVar117 = vxorps_avx512vl(auVar121,auVar121);
                        auVar238 = ZEXT1664(auVar117);
                        lVar108 = local_910;
                      }
                      auVar117 = auVar238._0_16_;
                      auVar199 = vmovdqa64_avx512f(local_600);
                      uVar175 = vptestmd_avx512f(auVar199,auVar199);
                      if ((short)uVar175 == 0) {
LAB_01d5b8bc:
                        *(undefined4 *)(ray + k * 4 + 0x200) = local_7f0;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var12)(&local_940);
                          auVar239 = ZEXT3264(local_8a0);
                          auVar187 = ZEXT3264(local_880);
                          auVar234 = ZEXT3264(local_900);
                          auVar164 = ZEXT3264(local_780);
                          auVar236 = ZEXT3264(local_760);
                          in_ZMM21 = ZEXT3264(local_860);
                          in_ZMM20 = ZEXT3264(local_840);
                          auVar117 = vxorps_avx512vl(auVar117,auVar117);
                          auVar238 = ZEXT1664(auVar117);
                          lVar108 = local_910;
                        }
                        auVar199 = vmovdqa64_avx512f(local_600);
                        uVar107 = vptestmd_avx512f(auVar199,auVar199);
                        if ((short)uVar107 == 0) goto LAB_01d5b8bc;
                        iVar1 = *(int *)(local_940.hit + 4);
                        iVar2 = *(int *)(local_940.hit + 8);
                        iVar83 = *(int *)(local_940.hit + 0xc);
                        iVar84 = *(int *)(local_940.hit + 0x10);
                        iVar85 = *(int *)(local_940.hit + 0x14);
                        iVar86 = *(int *)(local_940.hit + 0x18);
                        iVar87 = *(int *)(local_940.hit + 0x1c);
                        iVar88 = *(int *)(local_940.hit + 0x20);
                        iVar89 = *(int *)(local_940.hit + 0x24);
                        iVar90 = *(int *)(local_940.hit + 0x28);
                        iVar91 = *(int *)(local_940.hit + 0x2c);
                        iVar92 = *(int *)(local_940.hit + 0x30);
                        iVar93 = *(int *)(local_940.hit + 0x34);
                        iVar94 = *(int *)(local_940.hit + 0x38);
                        iVar95 = *(int *)(local_940.hit + 0x3c);
                        bVar111 = (byte)uVar107;
                        bVar14 = (bool)((byte)(uVar107 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar107 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar107 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar107 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar107 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar107 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar107 >> 7) & 1);
                        bVar102 = (byte)(uVar107 >> 8);
                        bVar21 = (bool)((byte)(uVar107 >> 9) & 1);
                        bVar22 = (bool)((byte)(uVar107 >> 10) & 1);
                        bVar23 = (bool)((byte)(uVar107 >> 0xb) & 1);
                        bVar24 = (bool)((byte)(uVar107 >> 0xc) & 1);
                        bVar25 = (bool)((byte)(uVar107 >> 0xd) & 1);
                        bVar26 = (bool)((byte)(uVar107 >> 0xe) & 1);
                        bVar27 = SUB81(uVar107 >> 0xf,0);
                        *(uint *)(local_940.ray + 0x300) =
                             (uint)(bVar111 & 1) * *(int *)local_940.hit |
                             (uint)!(bool)(bVar111 & 1) * *(int *)(local_940.ray + 0x300);
                        *(uint *)(local_940.ray + 0x304) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_940.ray + 0x304);
                        *(uint *)(local_940.ray + 0x308) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_940.ray + 0x308);
                        *(uint *)(local_940.ray + 0x30c) =
                             (uint)bVar16 * iVar83 | (uint)!bVar16 * *(int *)(local_940.ray + 0x30c)
                        ;
                        *(uint *)(local_940.ray + 0x310) =
                             (uint)bVar17 * iVar84 | (uint)!bVar17 * *(int *)(local_940.ray + 0x310)
                        ;
                        *(uint *)(local_940.ray + 0x314) =
                             (uint)bVar18 * iVar85 | (uint)!bVar18 * *(int *)(local_940.ray + 0x314)
                        ;
                        *(uint *)(local_940.ray + 0x318) =
                             (uint)bVar19 * iVar86 | (uint)!bVar19 * *(int *)(local_940.ray + 0x318)
                        ;
                        *(uint *)(local_940.ray + 0x31c) =
                             (uint)bVar20 * iVar87 | (uint)!bVar20 * *(int *)(local_940.ray + 0x31c)
                        ;
                        *(uint *)(local_940.ray + 800) =
                             (uint)(bVar102 & 1) * iVar88 |
                             (uint)!(bool)(bVar102 & 1) * *(int *)(local_940.ray + 800);
                        *(uint *)(local_940.ray + 0x324) =
                             (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_940.ray + 0x324)
                        ;
                        *(uint *)(local_940.ray + 0x328) =
                             (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_940.ray + 0x328)
                        ;
                        *(uint *)(local_940.ray + 0x32c) =
                             (uint)bVar23 * iVar91 | (uint)!bVar23 * *(int *)(local_940.ray + 0x32c)
                        ;
                        *(uint *)(local_940.ray + 0x330) =
                             (uint)bVar24 * iVar92 | (uint)!bVar24 * *(int *)(local_940.ray + 0x330)
                        ;
                        *(uint *)(local_940.ray + 0x334) =
                             (uint)bVar25 * iVar93 | (uint)!bVar25 * *(int *)(local_940.ray + 0x334)
                        ;
                        *(uint *)(local_940.ray + 0x338) =
                             (uint)bVar26 * iVar94 | (uint)!bVar26 * *(int *)(local_940.ray + 0x338)
                        ;
                        *(uint *)(local_940.ray + 0x33c) =
                             (uint)bVar27 * iVar95 | (uint)!bVar27 * *(int *)(local_940.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_940.hit + 0x44);
                        iVar2 = *(int *)(local_940.hit + 0x48);
                        iVar83 = *(int *)(local_940.hit + 0x4c);
                        iVar84 = *(int *)(local_940.hit + 0x50);
                        iVar85 = *(int *)(local_940.hit + 0x54);
                        iVar86 = *(int *)(local_940.hit + 0x58);
                        iVar87 = *(int *)(local_940.hit + 0x5c);
                        iVar88 = *(int *)(local_940.hit + 0x60);
                        iVar89 = *(int *)(local_940.hit + 100);
                        iVar90 = *(int *)(local_940.hit + 0x68);
                        iVar91 = *(int *)(local_940.hit + 0x6c);
                        iVar92 = *(int *)(local_940.hit + 0x70);
                        iVar93 = *(int *)(local_940.hit + 0x74);
                        iVar94 = *(int *)(local_940.hit + 0x78);
                        iVar95 = *(int *)(local_940.hit + 0x7c);
                        bVar14 = (bool)((byte)(uVar107 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar107 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar107 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar107 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar107 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar107 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar107 >> 7) & 1);
                        bVar21 = (bool)((byte)(uVar107 >> 9) & 1);
                        bVar22 = (bool)((byte)(uVar107 >> 10) & 1);
                        bVar23 = (bool)((byte)(uVar107 >> 0xb) & 1);
                        bVar24 = (bool)((byte)(uVar107 >> 0xc) & 1);
                        bVar25 = (bool)((byte)(uVar107 >> 0xd) & 1);
                        bVar26 = (bool)((byte)(uVar107 >> 0xe) & 1);
                        bVar27 = SUB81(uVar107 >> 0xf,0);
                        *(uint *)(local_940.ray + 0x340) =
                             (uint)(bVar111 & 1) * *(int *)(local_940.hit + 0x40) |
                             (uint)!(bool)(bVar111 & 1) * *(int *)(local_940.ray + 0x340);
                        *(uint *)(local_940.ray + 0x344) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_940.ray + 0x344);
                        *(uint *)(local_940.ray + 0x348) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_940.ray + 0x348);
                        *(uint *)(local_940.ray + 0x34c) =
                             (uint)bVar16 * iVar83 | (uint)!bVar16 * *(int *)(local_940.ray + 0x34c)
                        ;
                        *(uint *)(local_940.ray + 0x350) =
                             (uint)bVar17 * iVar84 | (uint)!bVar17 * *(int *)(local_940.ray + 0x350)
                        ;
                        *(uint *)(local_940.ray + 0x354) =
                             (uint)bVar18 * iVar85 | (uint)!bVar18 * *(int *)(local_940.ray + 0x354)
                        ;
                        *(uint *)(local_940.ray + 0x358) =
                             (uint)bVar19 * iVar86 | (uint)!bVar19 * *(int *)(local_940.ray + 0x358)
                        ;
                        *(uint *)(local_940.ray + 0x35c) =
                             (uint)bVar20 * iVar87 | (uint)!bVar20 * *(int *)(local_940.ray + 0x35c)
                        ;
                        *(uint *)(local_940.ray + 0x360) =
                             (uint)(bVar102 & 1) * iVar88 |
                             (uint)!(bool)(bVar102 & 1) * *(int *)(local_940.ray + 0x360);
                        *(uint *)(local_940.ray + 0x364) =
                             (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_940.ray + 0x364)
                        ;
                        *(uint *)(local_940.ray + 0x368) =
                             (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_940.ray + 0x368)
                        ;
                        *(uint *)(local_940.ray + 0x36c) =
                             (uint)bVar23 * iVar91 | (uint)!bVar23 * *(int *)(local_940.ray + 0x36c)
                        ;
                        *(uint *)(local_940.ray + 0x370) =
                             (uint)bVar24 * iVar92 | (uint)!bVar24 * *(int *)(local_940.ray + 0x370)
                        ;
                        *(uint *)(local_940.ray + 0x374) =
                             (uint)bVar25 * iVar93 | (uint)!bVar25 * *(int *)(local_940.ray + 0x374)
                        ;
                        *(uint *)(local_940.ray + 0x378) =
                             (uint)bVar26 * iVar94 | (uint)!bVar26 * *(int *)(local_940.ray + 0x378)
                        ;
                        *(uint *)(local_940.ray + 0x37c) =
                             (uint)bVar27 * iVar95 | (uint)!bVar27 * *(int *)(local_940.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_940.hit + 0x84);
                        iVar2 = *(int *)(local_940.hit + 0x88);
                        iVar83 = *(int *)(local_940.hit + 0x8c);
                        iVar84 = *(int *)(local_940.hit + 0x90);
                        iVar85 = *(int *)(local_940.hit + 0x94);
                        iVar86 = *(int *)(local_940.hit + 0x98);
                        iVar87 = *(int *)(local_940.hit + 0x9c);
                        iVar88 = *(int *)(local_940.hit + 0xa0);
                        iVar89 = *(int *)(local_940.hit + 0xa4);
                        iVar90 = *(int *)(local_940.hit + 0xa8);
                        iVar91 = *(int *)(local_940.hit + 0xac);
                        iVar92 = *(int *)(local_940.hit + 0xb0);
                        iVar93 = *(int *)(local_940.hit + 0xb4);
                        iVar94 = *(int *)(local_940.hit + 0xb8);
                        iVar95 = *(int *)(local_940.hit + 0xbc);
                        bVar14 = (bool)((byte)(uVar107 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar107 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar107 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar107 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar107 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar107 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar107 >> 7) & 1);
                        bVar21 = (bool)((byte)(uVar107 >> 9) & 1);
                        bVar22 = (bool)((byte)(uVar107 >> 10) & 1);
                        bVar23 = (bool)((byte)(uVar107 >> 0xb) & 1);
                        bVar24 = (bool)((byte)(uVar107 >> 0xc) & 1);
                        bVar25 = (bool)((byte)(uVar107 >> 0xd) & 1);
                        bVar26 = (bool)((byte)(uVar107 >> 0xe) & 1);
                        bVar27 = SUB81(uVar107 >> 0xf,0);
                        *(uint *)(local_940.ray + 0x380) =
                             (uint)(bVar111 & 1) * *(int *)(local_940.hit + 0x80) |
                             (uint)!(bool)(bVar111 & 1) * *(int *)(local_940.ray + 0x380);
                        *(uint *)(local_940.ray + 900) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_940.ray + 900);
                        *(uint *)(local_940.ray + 0x388) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_940.ray + 0x388);
                        *(uint *)(local_940.ray + 0x38c) =
                             (uint)bVar16 * iVar83 | (uint)!bVar16 * *(int *)(local_940.ray + 0x38c)
                        ;
                        *(uint *)(local_940.ray + 0x390) =
                             (uint)bVar17 * iVar84 | (uint)!bVar17 * *(int *)(local_940.ray + 0x390)
                        ;
                        *(uint *)(local_940.ray + 0x394) =
                             (uint)bVar18 * iVar85 | (uint)!bVar18 * *(int *)(local_940.ray + 0x394)
                        ;
                        *(uint *)(local_940.ray + 0x398) =
                             (uint)bVar19 * iVar86 | (uint)!bVar19 * *(int *)(local_940.ray + 0x398)
                        ;
                        *(uint *)(local_940.ray + 0x39c) =
                             (uint)bVar20 * iVar87 | (uint)!bVar20 * *(int *)(local_940.ray + 0x39c)
                        ;
                        *(uint *)(local_940.ray + 0x3a0) =
                             (uint)(bVar102 & 1) * iVar88 |
                             (uint)!(bool)(bVar102 & 1) * *(int *)(local_940.ray + 0x3a0);
                        *(uint *)(local_940.ray + 0x3a4) =
                             (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_940.ray + 0x3a4)
                        ;
                        *(uint *)(local_940.ray + 0x3a8) =
                             (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_940.ray + 0x3a8)
                        ;
                        *(uint *)(local_940.ray + 0x3ac) =
                             (uint)bVar23 * iVar91 | (uint)!bVar23 * *(int *)(local_940.ray + 0x3ac)
                        ;
                        *(uint *)(local_940.ray + 0x3b0) =
                             (uint)bVar24 * iVar92 | (uint)!bVar24 * *(int *)(local_940.ray + 0x3b0)
                        ;
                        *(uint *)(local_940.ray + 0x3b4) =
                             (uint)bVar25 * iVar93 | (uint)!bVar25 * *(int *)(local_940.ray + 0x3b4)
                        ;
                        *(uint *)(local_940.ray + 0x3b8) =
                             (uint)bVar26 * iVar94 | (uint)!bVar26 * *(int *)(local_940.ray + 0x3b8)
                        ;
                        *(uint *)(local_940.ray + 0x3bc) =
                             (uint)bVar27 * iVar95 | (uint)!bVar27 * *(int *)(local_940.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_940.hit + 0xc4);
                        iVar2 = *(int *)(local_940.hit + 200);
                        iVar83 = *(int *)(local_940.hit + 0xcc);
                        iVar84 = *(int *)(local_940.hit + 0xd0);
                        iVar85 = *(int *)(local_940.hit + 0xd4);
                        iVar86 = *(int *)(local_940.hit + 0xd8);
                        iVar87 = *(int *)(local_940.hit + 0xdc);
                        iVar88 = *(int *)(local_940.hit + 0xe0);
                        iVar89 = *(int *)(local_940.hit + 0xe4);
                        iVar90 = *(int *)(local_940.hit + 0xe8);
                        iVar91 = *(int *)(local_940.hit + 0xec);
                        iVar92 = *(int *)(local_940.hit + 0xf0);
                        iVar93 = *(int *)(local_940.hit + 0xf4);
                        iVar94 = *(int *)(local_940.hit + 0xf8);
                        iVar95 = *(int *)(local_940.hit + 0xfc);
                        bVar14 = (bool)((byte)(uVar107 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar107 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar107 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar107 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar107 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar107 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar107 >> 7) & 1);
                        bVar21 = (bool)((byte)(uVar107 >> 9) & 1);
                        bVar22 = (bool)((byte)(uVar107 >> 10) & 1);
                        bVar23 = (bool)((byte)(uVar107 >> 0xb) & 1);
                        bVar24 = (bool)((byte)(uVar107 >> 0xc) & 1);
                        bVar25 = (bool)((byte)(uVar107 >> 0xd) & 1);
                        bVar26 = (bool)((byte)(uVar107 >> 0xe) & 1);
                        bVar27 = SUB81(uVar107 >> 0xf,0);
                        *(uint *)(local_940.ray + 0x3c0) =
                             (uint)(bVar111 & 1) * *(int *)(local_940.hit + 0xc0) |
                             (uint)!(bool)(bVar111 & 1) * *(int *)(local_940.ray + 0x3c0);
                        *(uint *)(local_940.ray + 0x3c4) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_940.ray + 0x3c4);
                        *(uint *)(local_940.ray + 0x3c8) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_940.ray + 0x3c8);
                        *(uint *)(local_940.ray + 0x3cc) =
                             (uint)bVar16 * iVar83 | (uint)!bVar16 * *(int *)(local_940.ray + 0x3cc)
                        ;
                        *(uint *)(local_940.ray + 0x3d0) =
                             (uint)bVar17 * iVar84 | (uint)!bVar17 * *(int *)(local_940.ray + 0x3d0)
                        ;
                        *(uint *)(local_940.ray + 0x3d4) =
                             (uint)bVar18 * iVar85 | (uint)!bVar18 * *(int *)(local_940.ray + 0x3d4)
                        ;
                        *(uint *)(local_940.ray + 0x3d8) =
                             (uint)bVar19 * iVar86 | (uint)!bVar19 * *(int *)(local_940.ray + 0x3d8)
                        ;
                        *(uint *)(local_940.ray + 0x3dc) =
                             (uint)bVar20 * iVar87 | (uint)!bVar20 * *(int *)(local_940.ray + 0x3dc)
                        ;
                        *(uint *)(local_940.ray + 0x3e0) =
                             (uint)(bVar102 & 1) * iVar88 |
                             (uint)!(bool)(bVar102 & 1) * *(int *)(local_940.ray + 0x3e0);
                        *(uint *)(local_940.ray + 0x3e4) =
                             (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_940.ray + 0x3e4)
                        ;
                        *(uint *)(local_940.ray + 1000) =
                             (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_940.ray + 1000);
                        *(uint *)(local_940.ray + 0x3ec) =
                             (uint)bVar23 * iVar91 | (uint)!bVar23 * *(int *)(local_940.ray + 0x3ec)
                        ;
                        *(uint *)(local_940.ray + 0x3f0) =
                             (uint)bVar24 * iVar92 | (uint)!bVar24 * *(int *)(local_940.ray + 0x3f0)
                        ;
                        *(uint *)(local_940.ray + 0x3f4) =
                             (uint)bVar25 * iVar93 | (uint)!bVar25 * *(int *)(local_940.ray + 0x3f4)
                        ;
                        *(uint *)(local_940.ray + 0x3f8) =
                             (uint)bVar26 * iVar94 | (uint)!bVar26 * *(int *)(local_940.ray + 0x3f8)
                        ;
                        *(uint *)(local_940.ray + 0x3fc) =
                             (uint)bVar27 * iVar95 | (uint)!bVar27 * *(int *)(local_940.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_940.hit + 0x104);
                        iVar2 = *(int *)(local_940.hit + 0x108);
                        iVar83 = *(int *)(local_940.hit + 0x10c);
                        iVar84 = *(int *)(local_940.hit + 0x110);
                        iVar85 = *(int *)(local_940.hit + 0x114);
                        iVar86 = *(int *)(local_940.hit + 0x118);
                        iVar87 = *(int *)(local_940.hit + 0x11c);
                        iVar88 = *(int *)(local_940.hit + 0x120);
                        iVar89 = *(int *)(local_940.hit + 0x124);
                        iVar90 = *(int *)(local_940.hit + 0x128);
                        iVar91 = *(int *)(local_940.hit + 300);
                        iVar92 = *(int *)(local_940.hit + 0x130);
                        iVar93 = *(int *)(local_940.hit + 0x134);
                        iVar94 = *(int *)(local_940.hit + 0x138);
                        iVar95 = *(int *)(local_940.hit + 0x13c);
                        bVar14 = (bool)((byte)(uVar107 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar107 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar107 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar107 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar107 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar107 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar107 >> 7) & 1);
                        bVar21 = (bool)((byte)(uVar107 >> 9) & 1);
                        bVar22 = (bool)((byte)(uVar107 >> 10) & 1);
                        bVar23 = (bool)((byte)(uVar107 >> 0xb) & 1);
                        bVar24 = (bool)((byte)(uVar107 >> 0xc) & 1);
                        bVar25 = (bool)((byte)(uVar107 >> 0xd) & 1);
                        bVar26 = (bool)((byte)(uVar107 >> 0xe) & 1);
                        bVar27 = SUB81(uVar107 >> 0xf,0);
                        *(uint *)(local_940.ray + 0x400) =
                             (uint)(bVar111 & 1) * *(int *)(local_940.hit + 0x100) |
                             (uint)!(bool)(bVar111 & 1) * *(int *)(local_940.ray + 0x400);
                        *(uint *)(local_940.ray + 0x404) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_940.ray + 0x404);
                        *(uint *)(local_940.ray + 0x408) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_940.ray + 0x408);
                        *(uint *)(local_940.ray + 0x40c) =
                             (uint)bVar16 * iVar83 | (uint)!bVar16 * *(int *)(local_940.ray + 0x40c)
                        ;
                        *(uint *)(local_940.ray + 0x410) =
                             (uint)bVar17 * iVar84 | (uint)!bVar17 * *(int *)(local_940.ray + 0x410)
                        ;
                        *(uint *)(local_940.ray + 0x414) =
                             (uint)bVar18 * iVar85 | (uint)!bVar18 * *(int *)(local_940.ray + 0x414)
                        ;
                        *(uint *)(local_940.ray + 0x418) =
                             (uint)bVar19 * iVar86 | (uint)!bVar19 * *(int *)(local_940.ray + 0x418)
                        ;
                        *(uint *)(local_940.ray + 0x41c) =
                             (uint)bVar20 * iVar87 | (uint)!bVar20 * *(int *)(local_940.ray + 0x41c)
                        ;
                        *(uint *)(local_940.ray + 0x420) =
                             (uint)(bVar102 & 1) * iVar88 |
                             (uint)!(bool)(bVar102 & 1) * *(int *)(local_940.ray + 0x420);
                        *(uint *)(local_940.ray + 0x424) =
                             (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_940.ray + 0x424)
                        ;
                        *(uint *)(local_940.ray + 0x428) =
                             (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_940.ray + 0x428)
                        ;
                        *(uint *)(local_940.ray + 0x42c) =
                             (uint)bVar23 * iVar91 | (uint)!bVar23 * *(int *)(local_940.ray + 0x42c)
                        ;
                        *(uint *)(local_940.ray + 0x430) =
                             (uint)bVar24 * iVar92 | (uint)!bVar24 * *(int *)(local_940.ray + 0x430)
                        ;
                        *(uint *)(local_940.ray + 0x434) =
                             (uint)bVar25 * iVar93 | (uint)!bVar25 * *(int *)(local_940.ray + 0x434)
                        ;
                        *(uint *)(local_940.ray + 0x438) =
                             (uint)bVar26 * iVar94 | (uint)!bVar26 * *(int *)(local_940.ray + 0x438)
                        ;
                        *(uint *)(local_940.ray + 0x43c) =
                             (uint)bVar27 * iVar95 | (uint)!bVar27 * *(int *)(local_940.ray + 0x43c)
                        ;
                        auVar199 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_940.hit + 0x140));
                        auVar199 = vmovdqu32_avx512f(auVar199);
                        *(undefined1 (*) [64])(local_940.ray + 0x440) = auVar199;
                        auVar199 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_940.hit + 0x180));
                        auVar199 = vmovdqu32_avx512f(auVar199);
                        *(undefined1 (*) [64])(local_940.ray + 0x480) = auVar199;
                        auVar199 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_940.hit + 0x1c0));
                        auVar199 = vmovdqa32_avx512f(auVar199);
                        *(undefined1 (*) [64])(local_940.ray + 0x4c0) = auVar199;
                        auVar199 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_940.hit + 0x200));
                        auVar199 = vmovdqa32_avx512f(auVar199);
                        *(undefined1 (*) [64])(local_940.ray + 0x500) = auVar199;
                      }
                      bVar102 = ~(byte)(1 << ((uint)uVar103 & 0x1f)) & local_500[0];
                      uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
                      auVar44._4_4_ = uVar174;
                      auVar44._0_4_ = uVar174;
                      auVar44._8_4_ = uVar174;
                      auVar44._12_4_ = uVar174;
                      auVar44._16_4_ = uVar174;
                      auVar44._20_4_ = uVar174;
                      auVar44._24_4_ = uVar174;
                      auVar44._28_4_ = uVar174;
                      uVar175 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar44,2);
                      bVar111 = bVar102 & (byte)uVar175;
                      if ((bVar102 & (byte)uVar175) != 0) {
                        auVar185._8_4_ = 0x7f800000;
                        auVar185._0_8_ = 0x7f8000007f800000;
                        auVar185._12_4_ = 0x7f800000;
                        auVar185._16_4_ = 0x7f800000;
                        auVar185._20_4_ = 0x7f800000;
                        auVar185._24_4_ = 0x7f800000;
                        auVar185._28_4_ = 0x7f800000;
                        auVar137 = vblendmps_avx512vl(auVar185,in_ZMM21._0_32_);
                        auVar162._0_4_ =
                             (uint)(bVar111 & 1) * auVar137._0_4_ |
                             (uint)!(bool)(bVar111 & 1) * 0x7f800000;
                        bVar14 = (bool)(bVar111 >> 1 & 1);
                        auVar162._4_4_ = (uint)bVar14 * auVar137._4_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar111 >> 2 & 1);
                        auVar162._8_4_ = (uint)bVar14 * auVar137._8_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar111 >> 3 & 1);
                        auVar162._12_4_ =
                             (uint)bVar14 * auVar137._12_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar111 >> 4 & 1);
                        auVar162._16_4_ =
                             (uint)bVar14 * auVar137._16_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar111 >> 5 & 1);
                        auVar162._20_4_ =
                             (uint)bVar14 * auVar137._20_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar111 >> 6 & 1);
                        auVar162._24_4_ =
                             (uint)bVar14 * auVar137._24_4_ | (uint)!bVar14 * 0x7f800000;
                        auVar162._28_4_ =
                             (uint)(bVar111 >> 7) * auVar137._28_4_ |
                             (uint)!(bool)(bVar111 >> 7) * 0x7f800000;
                        auVar137 = vshufps_avx(auVar162,auVar162,0xb1);
                        auVar137 = vminps_avx(auVar162,auVar137);
                        auVar138 = vshufpd_avx(auVar137,auVar137,5);
                        auVar137 = vminps_avx(auVar137,auVar138);
                        auVar138 = vpermpd_avx2(auVar137,0x4e);
                        auVar137 = vminps_avx(auVar137,auVar138);
                        uVar175 = vcmpps_avx512vl(auVar162,auVar137,0);
                        bVar101 = (byte)uVar175 & bVar111;
                        bVar102 = bVar111;
                        if (bVar101 != 0) {
                          bVar102 = bVar101;
                        }
                        uVar224 = 0;
                        for (uVar105 = (uint)bVar102; (uVar105 & 1) == 0;
                            uVar105 = uVar105 >> 1 | 0x80000000) {
                          uVar224 = uVar224 + 1;
                        }
                        uVar103 = (ulong)uVar224;
                      }
                    } while (bVar111 != 0);
                  }
                }
              }
            }
          }
          auVar220 = ZEXT3264(auVar125);
          auVar199 = ZEXT3264(auVar127);
          lVar108 = lVar108 + 8;
          auVar235 = auVar164;
        } while ((int)lVar108 < iVar9);
      }
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar39._4_4_ = uVar3;
      auVar39._0_4_ = uVar3;
      auVar39._8_4_ = uVar3;
      auVar39._12_4_ = uVar3;
      auVar39._16_4_ = uVar3;
      auVar39._20_4_ = uVar3;
      auVar39._24_4_ = uVar3;
      auVar39._28_4_ = uVar3;
      uVar175 = vcmpps_avx512vl(local_320,auVar39,2);
      uVar109 = (uint)uVar110 & (uint)uVar175;
      uVar110 = (ulong)uVar109;
    } while (uVar109 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }